

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [16];
  undefined4 uVar12;
  undefined8 uVar13;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar14;
  Primitive PVar15;
  uint uVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  uint uVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  bool bVar110;
  bool bVar111;
  bool bVar112;
  bool bVar113;
  bool bVar114;
  bool bVar115;
  bool bVar116;
  bool bVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [28];
  undefined1 auVar130 [28];
  undefined1 auVar131 [24];
  undefined1 auVar132 [28];
  undefined1 auVar133 [12];
  uint uVar134;
  uint uVar135;
  uint uVar136;
  ulong uVar137;
  uint uVar138;
  long lVar139;
  long lVar140;
  undefined1 auVar141 [8];
  ulong uVar142;
  float fVar143;
  float fVar144;
  float fVar160;
  float fVar161;
  vint4 bi_1;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar165;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  float fVar166;
  float fVar185;
  float fVar186;
  vint4 bi;
  undefined1 auVar172 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  float fVar187;
  float fVar188;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar171 [16];
  undefined1 auVar176 [32];
  float fVar189;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar190;
  float fVar202;
  float fVar204;
  vint4 bi_2;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar191;
  float fVar206;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar203;
  float fVar205;
  float fVar207;
  float fVar208;
  undefined1 auVar201 [32];
  float fVar209;
  float fVar210;
  float fVar223;
  float fVar225;
  vint4 ai_1;
  undefined1 auVar211 [16];
  float fVar227;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar218 [32];
  float fVar224;
  float fVar226;
  float fVar228;
  float fVar232;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar245;
  float fVar248;
  vint4 ai_2;
  undefined1 auVar236 [16];
  float fVar250;
  undefined1 auVar237 [16];
  float fVar246;
  undefined1 auVar239 [16];
  float fVar247;
  float fVar249;
  float fVar251;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar252;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar253;
  float fVar262;
  float fVar264;
  undefined1 auVar255 [16];
  float fVar254;
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar269;
  float fVar270;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar268;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar271;
  float fVar278;
  float fVar279;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar280;
  float fVar281;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar282;
  undefined1 auVar277 [32];
  vint4 ai;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [64];
  float fVar293;
  float fVar299;
  float fVar300;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar298 [32];
  float fVar307;
  float fVar312;
  float fVar313;
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar314;
  float fVar324;
  float fVar326;
  undefined1 auVar317 [16];
  float fVar315;
  float fVar316;
  float fVar329;
  undefined1 auVar318 [32];
  float fVar325;
  float fVar327;
  float fVar328;
  undefined1 auVar319 [32];
  float fVar330;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [64];
  float fVar331;
  float fVar334;
  float fVar335;
  undefined1 auVar332 [16];
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar333 [32];
  float fVar342;
  float fVar351;
  undefined1 auVar343 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [64];
  float fVar352;
  float fVar358;
  float fVar360;
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar359;
  float fVar361;
  undefined1 auVar357 [64];
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar366 [32];
  float fVar371;
  float fVar372;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_834;
  ulong local_830;
  ulong local_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_7f0 [8];
  undefined8 uStack_7e8;
  Precalculations *local_7d8;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined8 local_710;
  undefined4 local_708;
  float local_704;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  uint local_6f4;
  uint local_6f0;
  undefined1 local_6e0 [8];
  undefined1 auStack_6d8 [8];
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 auStack_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 auStack_650 [8];
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 auStack_630 [16];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  Primitive *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  uint local_380;
  uint local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 local_340 [16];
  undefined1 local_320 [32];
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_190 [16];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar238 [16];
  undefined1 auVar344 [16];
  undefined1 auVar365 [16];
  undefined1 auVar373 [16];
  
  local_7d8 = pre;
  PVar15 = prim[1];
  uVar137 = (ulong)(byte)PVar15;
  lVar22 = uVar137 * 0x25;
  fVar316 = *(float *)(prim + lVar22 + 0x12);
  auVar172 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar167._0_4_ = fVar316 * auVar172._0_4_;
  auVar167._4_4_ = fVar316 * auVar172._4_4_;
  auVar167._8_4_ = fVar316 * auVar172._8_4_;
  auVar167._12_4_ = fVar316 * auVar172._12_4_;
  auVar283._0_4_ = fVar316 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar283._4_4_ = fVar316 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar283._8_4_ = fVar316 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar283._12_4_ = fVar316 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 4 + 6)));
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 5 + 6)));
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 6 + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0xf + 6)));
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar15 * 0x10 + 6)));
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar15 * 0x10 + uVar137 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1a + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1b + 6)));
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar137 * 0x1c + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vshufps_avx(auVar283,auVar283,0);
  auVar30 = vshufps_avx(auVar283,auVar283,0x55);
  auVar31 = vshufps_avx(auVar283,auVar283,0xaa);
  fVar316 = auVar31._0_4_;
  fVar359 = auVar31._4_4_;
  fVar206 = auVar31._8_4_;
  fVar268 = auVar31._12_4_;
  fVar233 = auVar30._0_4_;
  fVar245 = auVar30._4_4_;
  fVar248 = auVar30._8_4_;
  fVar250 = auVar30._12_4_;
  fVar210 = auVar29._0_4_;
  fVar223 = auVar29._4_4_;
  fVar225 = auVar29._8_4_;
  fVar227 = auVar29._12_4_;
  auVar343._0_4_ = fVar210 * auVar172._0_4_ + fVar233 * auVar197._0_4_ + fVar316 * auVar198._0_4_;
  auVar343._4_4_ = fVar223 * auVar172._4_4_ + fVar245 * auVar197._4_4_ + fVar359 * auVar198._4_4_;
  auVar343._8_4_ = fVar225 * auVar172._8_4_ + fVar248 * auVar197._8_4_ + fVar206 * auVar198._8_4_;
  auVar343._12_4_ =
       fVar227 * auVar172._12_4_ + fVar250 * auVar197._12_4_ + fVar268 * auVar198._12_4_;
  auVar353._0_4_ = fVar210 * auVar215._0_4_ + fVar233 * auVar25._0_4_ + auVar26._0_4_ * fVar316;
  auVar353._4_4_ = fVar223 * auVar215._4_4_ + fVar245 * auVar25._4_4_ + auVar26._4_4_ * fVar359;
  auVar353._8_4_ = fVar225 * auVar215._8_4_ + fVar248 * auVar25._8_4_ + auVar26._8_4_ * fVar206;
  auVar353._12_4_ = fVar227 * auVar215._12_4_ + fVar250 * auVar25._12_4_ + auVar26._12_4_ * fVar268;
  auVar284._0_4_ = fVar210 * auVar27._0_4_ + fVar233 * auVar214._0_4_ + auVar28._0_4_ * fVar316;
  auVar284._4_4_ = fVar223 * auVar27._4_4_ + fVar245 * auVar214._4_4_ + auVar28._4_4_ * fVar359;
  auVar284._8_4_ = fVar225 * auVar27._8_4_ + fVar248 * auVar214._8_4_ + auVar28._8_4_ * fVar206;
  auVar284._12_4_ = fVar227 * auVar27._12_4_ + fVar250 * auVar214._12_4_ + auVar28._12_4_ * fVar268;
  auVar29 = vshufps_avx(auVar167,auVar167,0);
  auVar30 = vshufps_avx(auVar167,auVar167,0x55);
  auVar31 = vshufps_avx(auVar167,auVar167,0xaa);
  fVar316 = auVar31._0_4_;
  fVar359 = auVar31._4_4_;
  fVar206 = auVar31._8_4_;
  fVar268 = auVar31._12_4_;
  fVar233 = auVar30._0_4_;
  fVar245 = auVar30._4_4_;
  fVar248 = auVar30._8_4_;
  fVar250 = auVar30._12_4_;
  fVar210 = auVar29._0_4_;
  fVar223 = auVar29._4_4_;
  fVar225 = auVar29._8_4_;
  fVar227 = auVar29._12_4_;
  auVar168._0_4_ = fVar210 * auVar172._0_4_ + fVar233 * auVar197._0_4_ + fVar316 * auVar198._0_4_;
  auVar168._4_4_ = fVar223 * auVar172._4_4_ + fVar245 * auVar197._4_4_ + fVar359 * auVar198._4_4_;
  auVar168._8_4_ = fVar225 * auVar172._8_4_ + fVar248 * auVar197._8_4_ + fVar206 * auVar198._8_4_;
  auVar168._12_4_ =
       fVar227 * auVar172._12_4_ + fVar250 * auVar197._12_4_ + fVar268 * auVar198._12_4_;
  auVar145._0_4_ = fVar210 * auVar215._0_4_ + auVar26._0_4_ * fVar316 + fVar233 * auVar25._0_4_;
  auVar145._4_4_ = fVar223 * auVar215._4_4_ + auVar26._4_4_ * fVar359 + fVar245 * auVar25._4_4_;
  auVar145._8_4_ = fVar225 * auVar215._8_4_ + auVar26._8_4_ * fVar206 + fVar248 * auVar25._8_4_;
  auVar145._12_4_ = fVar227 * auVar215._12_4_ + auVar26._12_4_ * fVar268 + fVar250 * auVar25._12_4_;
  auVar294._8_4_ = 0x7fffffff;
  auVar294._0_8_ = 0x7fffffff7fffffff;
  auVar294._12_4_ = 0x7fffffff;
  auVar172 = vandps_avx(auVar343,auVar294);
  auVar236._8_4_ = 0x219392ef;
  auVar236._0_8_ = 0x219392ef219392ef;
  auVar236._12_4_ = 0x219392ef;
  auVar172 = vcmpps_avx(auVar172,auVar236,1);
  auVar197 = vblendvps_avx(auVar343,auVar236,auVar172);
  auVar172 = vandps_avx(auVar353,auVar294);
  auVar172 = vcmpps_avx(auVar172,auVar236,1);
  auVar198 = vblendvps_avx(auVar353,auVar236,auVar172);
  auVar172 = vandps_avx(auVar294,auVar284);
  auVar172 = vcmpps_avx(auVar172,auVar236,1);
  auVar172 = vblendvps_avx(auVar284,auVar236,auVar172);
  auVar192._0_4_ = fVar210 * auVar27._0_4_ + fVar233 * auVar214._0_4_ + auVar28._0_4_ * fVar316;
  auVar192._4_4_ = fVar223 * auVar27._4_4_ + fVar245 * auVar214._4_4_ + auVar28._4_4_ * fVar359;
  auVar192._8_4_ = fVar225 * auVar27._8_4_ + fVar248 * auVar214._8_4_ + auVar28._8_4_ * fVar206;
  auVar192._12_4_ = fVar227 * auVar27._12_4_ + fVar250 * auVar214._12_4_ + auVar28._12_4_ * fVar268;
  auVar215 = vrcpps_avx(auVar197);
  fVar210 = auVar215._0_4_;
  auVar211._0_4_ = fVar210 * auVar197._0_4_;
  fVar223 = auVar215._4_4_;
  auVar211._4_4_ = fVar223 * auVar197._4_4_;
  fVar225 = auVar215._8_4_;
  auVar211._8_4_ = fVar225 * auVar197._8_4_;
  fVar227 = auVar215._12_4_;
  auVar211._12_4_ = fVar227 * auVar197._12_4_;
  auVar272._8_4_ = 0x3f800000;
  auVar272._0_8_ = &DAT_3f8000003f800000;
  auVar272._12_4_ = 0x3f800000;
  auVar197 = vsubps_avx(auVar272,auVar211);
  fVar210 = fVar210 + fVar210 * auVar197._0_4_;
  fVar223 = fVar223 + fVar223 * auVar197._4_4_;
  fVar225 = fVar225 + fVar225 * auVar197._8_4_;
  fVar227 = fVar227 + fVar227 * auVar197._12_4_;
  auVar197 = vrcpps_avx(auVar198);
  fVar233 = auVar197._0_4_;
  auVar255._0_4_ = fVar233 * auVar198._0_4_;
  fVar245 = auVar197._4_4_;
  auVar255._4_4_ = fVar245 * auVar198._4_4_;
  fVar248 = auVar197._8_4_;
  auVar255._8_4_ = fVar248 * auVar198._8_4_;
  fVar250 = auVar197._12_4_;
  auVar255._12_4_ = fVar250 * auVar198._12_4_;
  auVar197 = vsubps_avx(auVar272,auVar255);
  fVar233 = fVar233 + fVar233 * auVar197._0_4_;
  fVar245 = fVar245 + fVar245 * auVar197._4_4_;
  fVar248 = fVar248 + fVar248 * auVar197._8_4_;
  fVar250 = fVar250 + fVar250 * auVar197._12_4_;
  auVar197 = vrcpps_avx(auVar172);
  fVar253 = auVar197._0_4_;
  auVar285._0_4_ = fVar253 * auVar172._0_4_;
  fVar262 = auVar197._4_4_;
  auVar285._4_4_ = fVar262 * auVar172._4_4_;
  fVar264 = auVar197._8_4_;
  auVar285._8_4_ = fVar264 * auVar172._8_4_;
  fVar266 = auVar197._12_4_;
  auVar285._12_4_ = fVar266 * auVar172._12_4_;
  auVar172 = vsubps_avx(auVar272,auVar285);
  fVar253 = fVar253 + fVar253 * auVar172._0_4_;
  fVar262 = fVar262 + fVar262 * auVar172._4_4_;
  fVar264 = fVar264 + fVar264 * auVar172._8_4_;
  fVar266 = fVar266 + fVar266 * auVar172._12_4_;
  auVar172 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar22 + 0x16)) * *(float *)(prim + lVar22 + 0x1a)));
  auVar198 = vshufps_avx(auVar172,auVar172,0);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar137 * 7 + 6);
  auVar172 = vpmovsxwd_avx(auVar172);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar137 * 0xb + 6);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar215 = vsubps_avx(auVar197,auVar172);
  fVar316 = auVar198._0_4_;
  fVar359 = auVar198._4_4_;
  fVar206 = auVar198._8_4_;
  fVar268 = auVar198._12_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar137 * 9 + 6);
  auVar197 = vpmovsxwd_avx(auVar198);
  auVar286._0_4_ = auVar215._0_4_ * fVar316 + auVar172._0_4_;
  auVar286._4_4_ = auVar215._4_4_ * fVar359 + auVar172._4_4_;
  auVar286._8_4_ = auVar215._8_4_ * fVar206 + auVar172._8_4_;
  auVar286._12_4_ = auVar215._12_4_ * fVar268 + auVar172._12_4_;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar137 * 0xd + 6);
  auVar198 = vpmovsxwd_avx(auVar215);
  auVar172 = vcvtdq2ps_avx(auVar197);
  auVar197 = vcvtdq2ps_avx(auVar198);
  auVar197 = vsubps_avx(auVar197,auVar172);
  auVar295._0_4_ = auVar197._0_4_ * fVar316 + auVar172._0_4_;
  auVar295._4_4_ = auVar197._4_4_ * fVar359 + auVar172._4_4_;
  auVar295._8_4_ = auVar197._8_4_ * fVar206 + auVar172._8_4_;
  auVar295._12_4_ = auVar197._12_4_ * fVar268 + auVar172._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar137 * 0x12 + 6);
  auVar172 = vpmovsxwd_avx(auVar25);
  uVar142 = (ulong)(uint)((int)(uVar137 * 5) << 2);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar137 * 2 + uVar142 + 6);
  auVar197 = vpmovsxwd_avx(auVar26);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar172);
  auVar308._0_4_ = auVar197._0_4_ * fVar316 + auVar172._0_4_;
  auVar308._4_4_ = auVar197._4_4_ * fVar359 + auVar172._4_4_;
  auVar308._8_4_ = auVar197._8_4_ * fVar206 + auVar172._8_4_;
  auVar308._12_4_ = auVar197._12_4_ * fVar268 + auVar172._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar142 + 6);
  auVar172 = vpmovsxwd_avx(auVar27);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar137 * 0x18 + 6);
  auVar197 = vpmovsxwd_avx(auVar214);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar198 = vsubps_avx(auVar197,auVar172);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar137 * 0x1d + 6);
  auVar197 = vpmovsxwd_avx(auVar28);
  auVar317._0_4_ = auVar198._0_4_ * fVar316 + auVar172._0_4_;
  auVar317._4_4_ = auVar198._4_4_ * fVar359 + auVar172._4_4_;
  auVar317._8_4_ = auVar198._8_4_ * fVar206 + auVar172._8_4_;
  auVar317._12_4_ = auVar198._12_4_ * fVar268 + auVar172._12_4_;
  auVar172 = vcvtdq2ps_avx(auVar197);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar137 + (ulong)(byte)PVar15 * 0x20 + 6);
  auVar197 = vpmovsxwd_avx(auVar29);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar172);
  auVar332._0_4_ = auVar197._0_4_ * fVar316 + auVar172._0_4_;
  auVar332._4_4_ = auVar197._4_4_ * fVar359 + auVar172._4_4_;
  auVar332._8_4_ = auVar197._8_4_ * fVar206 + auVar172._8_4_;
  auVar332._12_4_ = auVar197._12_4_ * fVar268 + auVar172._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar15 * 0x20 - uVar137) + 6);
  auVar172 = vpmovsxwd_avx(auVar30);
  auVar172 = vcvtdq2ps_avx(auVar172);
  local_4c8 = prim;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar137 * 0x23 + 6);
  auVar197 = vpmovsxwd_avx(auVar31);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar172);
  auVar273._0_4_ = auVar172._0_4_ + auVar197._0_4_ * fVar316;
  auVar273._4_4_ = auVar172._4_4_ + auVar197._4_4_ * fVar359;
  auVar273._8_4_ = auVar172._8_4_ + auVar197._8_4_ * fVar206;
  auVar273._12_4_ = auVar172._12_4_ + auVar197._12_4_ * fVar268;
  auVar172 = vsubps_avx(auVar286,auVar168);
  auVar287._0_4_ = fVar210 * auVar172._0_4_;
  auVar287._4_4_ = fVar223 * auVar172._4_4_;
  auVar287._8_4_ = fVar225 * auVar172._8_4_;
  auVar287._12_4_ = fVar227 * auVar172._12_4_;
  auVar172 = vsubps_avx(auVar295,auVar168);
  auVar169._0_4_ = fVar210 * auVar172._0_4_;
  auVar169._4_4_ = fVar223 * auVar172._4_4_;
  auVar169._8_4_ = fVar225 * auVar172._8_4_;
  auVar169._12_4_ = fVar227 * auVar172._12_4_;
  auVar172 = vsubps_avx(auVar308,auVar145);
  auVar212._0_4_ = fVar233 * auVar172._0_4_;
  auVar212._4_4_ = fVar245 * auVar172._4_4_;
  auVar212._8_4_ = fVar248 * auVar172._8_4_;
  auVar212._12_4_ = fVar250 * auVar172._12_4_;
  auVar172 = vsubps_avx(auVar317,auVar145);
  auVar146._0_4_ = fVar233 * auVar172._0_4_;
  auVar146._4_4_ = fVar245 * auVar172._4_4_;
  auVar146._8_4_ = fVar248 * auVar172._8_4_;
  auVar146._12_4_ = fVar250 * auVar172._12_4_;
  auVar172 = vsubps_avx(auVar332,auVar192);
  auVar237._0_4_ = fVar253 * auVar172._0_4_;
  auVar237._4_4_ = fVar262 * auVar172._4_4_;
  auVar237._8_4_ = fVar264 * auVar172._8_4_;
  auVar237._12_4_ = fVar266 * auVar172._12_4_;
  auVar172 = vsubps_avx(auVar273,auVar192);
  auVar193._0_4_ = fVar253 * auVar172._0_4_;
  auVar193._4_4_ = fVar262 * auVar172._4_4_;
  auVar193._8_4_ = fVar264 * auVar172._8_4_;
  auVar193._12_4_ = fVar266 * auVar172._12_4_;
  auVar172 = vpminsd_avx(auVar287,auVar169);
  auVar197 = vpminsd_avx(auVar212,auVar146);
  auVar172 = vmaxps_avx(auVar172,auVar197);
  auVar197 = vpminsd_avx(auVar237,auVar193);
  uVar12 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar296._4_4_ = uVar12;
  auVar296._0_4_ = uVar12;
  auVar296._8_4_ = uVar12;
  auVar296._12_4_ = uVar12;
  auVar197 = vmaxps_avx(auVar197,auVar296);
  auVar172 = vmaxps_avx(auVar172,auVar197);
  local_190._0_4_ = auVar172._0_4_ * 0.99999964;
  local_190._4_4_ = auVar172._4_4_ * 0.99999964;
  local_190._8_4_ = auVar172._8_4_ * 0.99999964;
  local_190._12_4_ = auVar172._12_4_ * 0.99999964;
  auVar172 = vpmaxsd_avx(auVar287,auVar169);
  auVar197 = vpmaxsd_avx(auVar212,auVar146);
  auVar172 = vminps_avx(auVar172,auVar197);
  auVar197 = vpmaxsd_avx(auVar237,auVar193);
  fVar316 = (ray->super_RayK<1>).tfar;
  auVar194._4_4_ = fVar316;
  auVar194._0_4_ = fVar316;
  auVar194._8_4_ = fVar316;
  auVar194._12_4_ = fVar316;
  auVar197 = vminps_avx(auVar197,auVar194);
  auVar172 = vminps_avx(auVar172,auVar197);
  auVar147._0_4_ = auVar172._0_4_ * 1.0000004;
  auVar147._4_4_ = auVar172._4_4_ * 1.0000004;
  auVar147._8_4_ = auVar172._8_4_ * 1.0000004;
  auVar147._12_4_ = auVar172._12_4_ * 1.0000004;
  auVar172 = vpshufd_avx(ZEXT116((byte)PVar15),0);
  auVar197 = vpcmpgtd_avx(auVar172,_DAT_01ff0cf0);
  auVar172 = vcmpps_avx(local_190,auVar147,2);
  auVar172 = vandps_avx(auVar172,auVar197);
  uVar134 = vmovmskps_avx(auVar172);
  if (uVar134 != 0) {
    uVar134 = uVar134 & 0xff;
    local_4c0 = mm_lookupmask_ps._16_8_;
    uStack_4b8 = mm_lookupmask_ps._24_8_;
    uStack_4b0 = mm_lookupmask_ps._16_8_;
    uStack_4a8 = mm_lookupmask_ps._24_8_;
    do {
      lVar22 = 0;
      if (uVar134 != 0) {
        for (; (uVar134 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      uVar138 = *(uint *)(local_4c8 + 2);
      uVar136 = *(uint *)(local_4c8 + lVar22 * 4 + 6);
      local_830 = (ulong)uVar138;
      pGVar17 = (context->scene->geometries).items[uVar138].ptr;
      local_828 = (ulong)uVar136;
      uVar137 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                                (ulong)uVar136 *
                                pGVar17[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar316 = (pGVar17->time_range).lower;
      fVar316 = pGVar17->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar316) /
                ((pGVar17->time_range).upper - fVar316));
      auVar172 = vroundss_avx(ZEXT416((uint)fVar316),ZEXT416((uint)fVar316),9);
      auVar172 = vminss_avx(auVar172,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
      auVar172 = vmaxss_avx(ZEXT816(0) << 0x20,auVar172);
      fVar316 = fVar316 - auVar172._0_4_;
      _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar140 = (long)(int)auVar172._0_4_ * 0x38;
      lVar22 = *(long *)(_Var18 + 0x10 + lVar140);
      lVar139 = *(long *)(_Var18 + 0x38 + lVar140);
      lVar19 = *(long *)(_Var18 + 0x48 + lVar140);
      auVar172 = vshufps_avx(ZEXT416((uint)fVar316),ZEXT416((uint)fVar316),0);
      pfVar1 = (float *)(lVar139 + uVar137 * lVar19);
      fVar359 = auVar172._0_4_;
      fVar206 = auVar172._4_4_;
      fVar268 = auVar172._8_4_;
      fVar210 = auVar172._12_4_;
      pfVar2 = (float *)(lVar139 + (uVar137 + 1) * lVar19);
      pfVar3 = (float *)(lVar139 + (uVar137 + 2) * lVar19);
      pfVar4 = (float *)(lVar139 + lVar19 * (uVar137 + 3));
      lVar139 = *(long *)(_Var18 + lVar140);
      auVar172 = vshufps_avx(ZEXT416((uint)(1.0 - fVar316)),ZEXT416((uint)(1.0 - fVar316)),0);
      pfVar5 = (float *)(lVar139 + lVar22 * uVar137);
      fVar316 = auVar172._0_4_;
      fVar223 = auVar172._4_4_;
      fVar225 = auVar172._8_4_;
      fVar227 = auVar172._12_4_;
      pfVar6 = (float *)(lVar139 + lVar22 * (uVar137 + 1));
      pfVar7 = (float *)(lVar139 + lVar22 * (uVar137 + 2));
      pfVar8 = (float *)(lVar139 + lVar22 * (uVar137 + 3));
      uVar16 = (uint)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar22 = (long)(int)uVar16 * 0x44;
      fVar234 = fVar359 * *pfVar1 + fVar316 * *pfVar5;
      fVar246 = fVar206 * pfVar1[1] + fVar223 * pfVar5[1];
      auVar238._0_8_ = CONCAT44(fVar246,fVar234);
      auVar238._8_4_ = fVar268 * pfVar1[2] + fVar225 * pfVar5[2];
      auVar238._12_4_ = fVar210 * pfVar1[3] + fVar227 * pfVar5[3];
      fVar362 = fVar316 * *pfVar6 + fVar359 * *pfVar2;
      fVar367 = fVar223 * pfVar6[1] + fVar206 * pfVar2[1];
      auVar365._0_8_ = CONCAT44(fVar367,fVar362);
      auVar365._8_4_ = fVar225 * pfVar6[2] + fVar268 * pfVar2[2];
      auVar365._12_4_ = fVar227 * pfVar6[3] + fVar210 * pfVar2[3];
      fVar371 = fVar316 * *pfVar7 + fVar359 * *pfVar3;
      fVar376 = fVar223 * pfVar7[1] + fVar206 * pfVar3[1];
      auVar373._0_8_ = CONCAT44(fVar376,fVar371);
      auVar373._8_4_ = fVar225 * pfVar7[2] + fVar268 * pfVar3[2];
      auVar373._12_4_ = fVar227 * pfVar7[3] + fVar210 * pfVar3[3];
      fVar342 = fVar316 * *pfVar8 + fVar359 * *pfVar4;
      fVar351 = fVar223 * pfVar8[1] + fVar206 * pfVar4[1];
      auVar344._0_8_ = CONCAT44(fVar351,fVar342);
      auVar344._8_4_ = fVar225 * pfVar8[2] + fVar268 * pfVar4[2];
      auVar344._12_4_ = fVar227 * pfVar8[3] + fVar210 * pfVar4[3];
      aVar14 = (ray->super_RayK<1>).org.field_0;
      auVar198 = vsubps_avx(auVar238,(undefined1  [16])aVar14);
      _local_7f0 = auVar238;
      auVar172 = vshufps_avx(auVar198,auVar198,0);
      auVar197 = vshufps_avx(auVar198,auVar198,0x55);
      auVar198 = vshufps_avx(auVar198,auVar198,0xaa);
      fVar316 = (local_7d8->ray_space).vx.field_0.m128[0];
      fVar359 = (local_7d8->ray_space).vx.field_0.m128[1];
      fVar206 = (local_7d8->ray_space).vx.field_0.m128[2];
      fVar268 = (local_7d8->ray_space).vx.field_0.m128[3];
      fVar210 = (local_7d8->ray_space).vy.field_0.m128[0];
      fVar223 = (local_7d8->ray_space).vy.field_0.m128[1];
      fVar225 = (local_7d8->ray_space).vy.field_0.m128[2];
      fVar227 = (local_7d8->ray_space).vy.field_0.m128[3];
      fVar233 = (local_7d8->ray_space).vz.field_0.m128[0];
      fVar245 = (local_7d8->ray_space).vz.field_0.m128[1];
      fVar248 = (local_7d8->ray_space).vz.field_0.m128[2];
      fVar250 = (local_7d8->ray_space).vz.field_0.m128[3];
      auVar213._0_8_ =
           CONCAT44(auVar172._4_4_ * fVar359 + auVar198._4_4_ * fVar245 + auVar197._4_4_ * fVar223,
                    auVar172._0_4_ * fVar316 + auVar198._0_4_ * fVar233 + auVar197._0_4_ * fVar210);
      auVar213._8_4_ =
           auVar172._8_4_ * fVar206 + auVar198._8_4_ * fVar248 + auVar197._8_4_ * fVar225;
      auVar213._12_4_ =
           auVar172._12_4_ * fVar268 + auVar198._12_4_ * fVar250 + auVar197._12_4_ * fVar227;
      auVar172 = vblendps_avx(auVar213,auVar238,8);
      auVar215 = vsubps_avx(auVar365,(undefined1  [16])aVar14);
      auVar197 = vshufps_avx(auVar215,auVar215,0);
      auVar198 = vshufps_avx(auVar215,auVar215,0x55);
      auVar215 = vshufps_avx(auVar215,auVar215,0xaa);
      auVar288._0_4_ =
           auVar197._0_4_ * fVar316 + auVar198._0_4_ * fVar210 + auVar215._0_4_ * fVar233;
      auVar288._4_4_ =
           auVar197._4_4_ * fVar359 + auVar198._4_4_ * fVar223 + auVar215._4_4_ * fVar245;
      auVar288._8_4_ =
           auVar197._8_4_ * fVar206 + auVar198._8_4_ * fVar225 + auVar215._8_4_ * fVar248;
      auVar288._12_4_ =
           auVar197._12_4_ * fVar268 + auVar198._12_4_ * fVar227 + auVar215._12_4_ * fVar250;
      auVar197 = vblendps_avx(auVar288,auVar365,8);
      auVar25 = vsubps_avx(auVar373,(undefined1  [16])aVar14);
      auVar198 = vshufps_avx(auVar25,auVar25,0);
      auVar215 = vshufps_avx(auVar25,auVar25,0x55);
      auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar297._0_4_ = auVar198._0_4_ * fVar316 + auVar25._0_4_ * fVar233 + auVar215._0_4_ * fVar210
      ;
      auVar297._4_4_ = auVar198._4_4_ * fVar359 + auVar25._4_4_ * fVar245 + auVar215._4_4_ * fVar223
      ;
      auVar297._8_4_ = auVar198._8_4_ * fVar206 + auVar25._8_4_ * fVar248 + auVar215._8_4_ * fVar225
      ;
      auVar297._12_4_ =
           auVar198._12_4_ * fVar268 + auVar25._12_4_ * fVar250 + auVar215._12_4_ * fVar227;
      auVar198 = vblendps_avx(auVar297,auVar373,8);
      auVar26 = vsubps_avx(auVar344,(undefined1  [16])aVar14);
      auVar215 = vshufps_avx(auVar26,auVar26,0);
      auVar25 = vshufps_avx(auVar26,auVar26,0x55);
      auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
      auVar170._0_4_ = auVar215._0_4_ * fVar316 + auVar26._0_4_ * fVar233 + auVar25._0_4_ * fVar210;
      auVar170._4_4_ = auVar215._4_4_ * fVar359 + auVar26._4_4_ * fVar245 + auVar25._4_4_ * fVar223;
      auVar170._8_4_ = auVar215._8_4_ * fVar206 + auVar26._8_4_ * fVar248 + auVar25._8_4_ * fVar225;
      auVar170._12_4_ =
           auVar215._12_4_ * fVar268 + auVar26._12_4_ * fVar250 + auVar25._12_4_ * fVar227;
      auVar215 = vblendps_avx(auVar170,auVar344,8);
      auVar239._8_4_ = 0x7fffffff;
      auVar239._0_8_ = 0x7fffffff7fffffff;
      auVar239._12_4_ = 0x7fffffff;
      auVar172 = vandps_avx(auVar172,auVar239);
      auVar197 = vandps_avx(auVar197,auVar239);
      auVar25 = vmaxps_avx(auVar172,auVar197);
      auVar172 = vandps_avx(auVar198,auVar239);
      auVar197 = vandps_avx(auVar215,auVar239);
      auVar172 = vmaxps_avx(auVar172,auVar197);
      auVar172 = vmaxps_avx(auVar25,auVar172);
      auVar197 = vmovshdup_avx(auVar172);
      auVar197 = vmaxss_avx(auVar197,auVar172);
      auVar172 = vshufpd_avx(auVar172,auVar172,1);
      auVar172 = vmaxss_avx(auVar172,auVar197);
      fVar227 = *(float *)(catmullrom_basis0 + lVar22 + 0x908);
      fVar233 = *(float *)(catmullrom_basis0 + lVar22 + 0x90c);
      fVar245 = *(float *)(catmullrom_basis0 + lVar22 + 0x910);
      fVar248 = *(float *)(catmullrom_basis0 + lVar22 + 0x914);
      fVar250 = *(float *)(catmullrom_basis0 + lVar22 + 0x918);
      fVar253 = *(float *)(catmullrom_basis0 + lVar22 + 0x91c);
      fVar262 = *(float *)(catmullrom_basis0 + lVar22 + 0x920);
      auVar197 = vshufps_avx(auVar297,auVar297,0);
      register0x00001250 = auVar197;
      _local_6a0 = auVar197;
      auVar198 = vshufps_avx(auVar297,auVar297,0x55);
      register0x00001290 = auVar198;
      _local_620 = auVar198;
      fVar316 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar22 + 0xd8c);
      fVar359 = *(float *)(catmullrom_basis0 + lVar22 + 0xd90);
      fVar206 = *(float *)(catmullrom_basis0 + lVar22 + 0xd94);
      fVar268 = *(float *)(catmullrom_basis0 + lVar22 + 0xd98);
      fVar210 = *(float *)(catmullrom_basis0 + lVar22 + 0xd9c);
      fVar223 = *(float *)(catmullrom_basis0 + lVar22 + 0xda0);
      fVar225 = *(float *)(catmullrom_basis0 + lVar22 + 0xda4);
      auVar129 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar22 + 0xd8c);
      auVar215 = vshufps_avx(auVar170,auVar170,0);
      register0x00001210 = auVar215;
      _local_440 = auVar215;
      fVar143 = auVar215._0_4_;
      fVar165 = auVar215._4_4_;
      fVar189 = auVar215._8_4_;
      fVar282 = auVar215._12_4_;
      fVar166 = auVar197._0_4_;
      fVar185 = auVar197._4_4_;
      fVar186 = auVar197._8_4_;
      fVar187 = auVar197._12_4_;
      auVar197 = vshufps_avx(auVar170,auVar170,0x55);
      register0x000014d0 = auVar197;
      _local_120 = auVar197;
      fVar331 = auVar197._0_4_;
      fVar334 = auVar197._4_4_;
      fVar335 = auVar197._8_4_;
      fVar336 = auVar197._12_4_;
      fVar190 = auVar198._0_4_;
      fVar202 = auVar198._4_4_;
      fVar204 = auVar198._8_4_;
      fVar207 = auVar198._12_4_;
      _local_5e0 = auVar373;
      auVar26 = _local_5e0;
      auVar197 = vshufps_avx(auVar373,auVar373,0xff);
      register0x00001450 = auVar197;
      _local_140 = auVar197;
      _local_5f0 = auVar344;
      auVar25 = _local_5f0;
      auVar198 = vshufps_avx(auVar344,auVar344,0xff);
      register0x00001390 = auVar198;
      _local_160 = auVar198;
      fVar271 = auVar198._0_4_;
      fVar278 = auVar198._4_4_;
      fVar279 = auVar198._8_4_;
      fVar280 = auVar198._12_4_;
      fVar307 = auVar197._0_4_;
      fVar312 = auVar197._4_4_;
      fVar313 = auVar197._8_4_;
      auVar198 = vshufps_avx(auVar288,auVar288,0);
      register0x00001310 = auVar198;
      _local_760 = auVar198;
      fVar264 = *(float *)(catmullrom_basis0 + lVar22 + 0x484);
      fVar266 = *(float *)(catmullrom_basis0 + lVar22 + 0x488);
      fVar338 = *(float *)(catmullrom_basis0 + lVar22 + 0x48c);
      fVar337 = *(float *)(catmullrom_basis0 + lVar22 + 0x490);
      fVar339 = *(float *)(catmullrom_basis0 + lVar22 + 0x494);
      fVar269 = *(float *)(catmullrom_basis0 + lVar22 + 0x498);
      fVar341 = *(float *)(catmullrom_basis0 + lVar22 + 0x49c);
      fVar235 = auVar198._0_4_;
      fVar247 = auVar198._4_4_;
      fVar249 = auVar198._8_4_;
      fVar251 = auVar198._12_4_;
      auVar198 = vshufps_avx(auVar288,auVar288,0x55);
      local_520._16_16_ = auVar198;
      local_520._0_16_ = auVar198;
      fVar372 = auVar198._0_4_;
      fVar377 = auVar198._4_4_;
      fVar378 = auVar198._8_4_;
      fVar379 = auVar198._12_4_;
      _local_5d0 = auVar365;
      auVar27 = _local_5d0;
      auVar198 = vshufps_avx(auVar365,auVar365,0xff);
      register0x00001590 = auVar198;
      _local_80 = auVar198;
      fVar363 = auVar198._0_4_;
      fVar270 = auVar198._4_4_;
      fVar281 = auVar198._8_4_;
      fVar315 = auVar198._12_4_;
      auVar118._8_4_ = auVar213._8_4_;
      auVar118._0_8_ = auVar213._0_8_;
      auVar118._12_4_ = auVar213._12_4_;
      auVar198 = vshufps_avx(auVar118,auVar118,0);
      register0x00001350 = auVar198;
      _local_400 = auVar198;
      local_460 = *(float *)(catmullrom_basis0 + lVar22);
      fStack_45c = *(float *)(catmullrom_basis0 + lVar22 + 4);
      fStack_458 = *(float *)(catmullrom_basis0 + lVar22 + 8);
      fStack_454 = *(float *)(catmullrom_basis0 + lVar22 + 0xc);
      fStack_450 = *(float *)(catmullrom_basis0 + lVar22 + 0x10);
      fStack_44c = *(float *)(catmullrom_basis0 + lVar22 + 0x14);
      fStack_448 = *(float *)(catmullrom_basis0 + lVar22 + 0x18);
      fVar254 = auVar198._0_4_;
      fVar263 = auVar198._4_4_;
      fVar265 = auVar198._8_4_;
      fVar267 = auVar198._12_4_;
      auVar289._0_4_ =
           fVar254 * local_460 + fVar235 * fVar264 + fVar166 * fVar227 + fVar143 * fVar316;
      auVar289._4_4_ =
           fVar263 * fStack_45c + fVar247 * fVar266 + fVar185 * fVar233 + fVar165 * fVar359;
      auVar289._8_4_ =
           fVar265 * fStack_458 + fVar249 * fVar338 + fVar186 * fVar245 + fVar189 * fVar206;
      auVar289._12_4_ =
           fVar267 * fStack_454 + fVar251 * fVar337 + fVar187 * fVar248 + fVar282 * fVar268;
      auVar289._16_4_ =
           fVar254 * fStack_450 + fVar235 * fVar339 + fVar166 * fVar250 + fVar143 * fVar210;
      auVar289._20_4_ =
           fVar263 * fStack_44c + fVar247 * fVar269 + fVar185 * fVar253 + fVar165 * fVar223;
      auVar289._24_4_ =
           fVar265 * fStack_448 + fVar249 * fVar341 + fVar186 * fVar262 + fVar189 * fVar225;
      auVar289._28_4_ = fVar267 + fVar187 + fVar282 + 0.0;
      auVar198 = vshufps_avx(auVar118,auVar118,0x55);
      register0x00001290 = auVar198;
      _local_1e0 = auVar198;
      fVar191 = auVar198._0_4_;
      fVar203 = auVar198._4_4_;
      fVar205 = auVar198._8_4_;
      fVar208 = auVar198._12_4_;
      auVar345._0_4_ =
           fVar191 * local_460 + fVar372 * fVar264 + fVar190 * fVar227 + fVar331 * fVar316;
      auVar345._4_4_ =
           fVar203 * fStack_45c + fVar377 * fVar266 + fVar202 * fVar233 + fVar334 * fVar359;
      auVar345._8_4_ =
           fVar205 * fStack_458 + fVar378 * fVar338 + fVar204 * fVar245 + fVar335 * fVar206;
      auVar345._12_4_ =
           fVar208 * fStack_454 + fVar379 * fVar337 + fVar207 * fVar248 + fVar336 * fVar268;
      auVar345._16_4_ =
           fVar191 * fStack_450 + fVar372 * fVar339 + fVar190 * fVar250 + fVar331 * fVar210;
      auVar345._20_4_ =
           fVar203 * fStack_44c + fVar377 * fVar269 + fVar202 * fVar253 + fVar334 * fVar223;
      auVar345._24_4_ =
           fVar205 * fStack_448 + fVar378 * fVar341 + fVar204 * fVar262 + fVar335 * fVar225;
      auVar345._28_4_ = fVar207 + 0.0 + 0.0 + 0.0;
      auVar198 = vpermilps_avx(auVar238,0xff);
      register0x00001490 = auVar198;
      _local_180 = auVar198;
      fStack_444 = (float)*(undefined4 *)(catmullrom_basis0 + lVar22 + 0x1c);
      fVar314 = auVar198._0_4_;
      fVar324 = auVar198._4_4_;
      fVar326 = auVar198._8_4_;
      local_820._0_4_ =
           fVar363 * fVar264 + fVar307 * fVar227 + fVar271 * fVar316 + fVar314 * local_460;
      local_820._4_4_ =
           fVar270 * fVar266 + fVar312 * fVar233 + fVar278 * fVar359 + fVar324 * fStack_45c;
      fStack_818 = fVar281 * fVar338 + fVar313 * fVar245 + fVar279 * fVar206 + fVar326 * fStack_458;
      fStack_814 = fVar315 * fVar337 + auVar197._12_4_ * fVar248 + fVar280 * fVar268 +
                   auVar198._12_4_ * fStack_454;
      fStack_810 = fVar363 * fVar339 + fVar307 * fVar250 + fVar271 * fVar210 + fVar314 * fStack_450;
      fStack_80c = fVar270 * fVar269 + fVar312 * fVar253 + fVar278 * fVar223 + fVar324 * fStack_44c;
      fStack_808 = fVar281 * fVar341 + fVar313 * fVar262 + fVar279 * fVar225 + fVar326 * fStack_448;
      fStack_804 = 0.0;
      fVar340 = *(float *)(catmullrom_basis1 + lVar22 + 0x908);
      fVar293 = *(float *)(catmullrom_basis1 + lVar22 + 0x90c);
      fVar230 = *(float *)(catmullrom_basis1 + lVar22 + 0x910);
      fVar329 = *(float *)(catmullrom_basis1 + lVar22 + 0x914);
      fVar299 = *(float *)(catmullrom_basis1 + lVar22 + 0x918);
      fVar301 = *(float *)(catmullrom_basis1 + lVar22 + 0x91c);
      fVar232 = *(float *)(catmullrom_basis1 + lVar22 + 0x920);
      fVar303 = *(float *)(catmullrom_basis1 + lVar22 + 0xd8c);
      fVar144 = *(float *)(catmullrom_basis1 + lVar22 + 0xd90);
      fVar160 = *(float *)(catmullrom_basis1 + lVar22 + 0xd94);
      fVar161 = *(float *)(catmullrom_basis1 + lVar22 + 0xd98);
      fVar188 = *(float *)(catmullrom_basis1 + lVar22 + 0xd9c);
      fVar162 = *(float *)(catmullrom_basis1 + lVar22 + 0xda0);
      fVar163 = *(float *)(catmullrom_basis1 + lVar22 + 0xda4);
      fVar164 = *(float *)(catmullrom_basis1 + lVar22 + 0x484);
      fVar209 = *(float *)(catmullrom_basis1 + lVar22 + 0x488);
      fVar224 = *(float *)(catmullrom_basis1 + lVar22 + 0x48c);
      fVar226 = *(float *)(catmullrom_basis1 + lVar22 + 0x490);
      fVar228 = *(float *)(catmullrom_basis1 + lVar22 + 0x494);
      fVar229 = *(float *)(catmullrom_basis1 + lVar22 + 0x498);
      fVar252 = *(float *)(catmullrom_basis1 + lVar22 + 0x49c);
      fVar231 = *(float *)(catmullrom_basis1 + lVar22);
      fVar330 = *(float *)(catmullrom_basis1 + lVar22 + 4);
      fVar300 = *(float *)(catmullrom_basis1 + lVar22 + 8);
      fVar302 = *(float *)(catmullrom_basis1 + lVar22 + 0xc);
      fVar304 = *(float *)(catmullrom_basis1 + lVar22 + 0x10);
      fVar305 = *(float *)(catmullrom_basis1 + lVar22 + 0x14);
      fVar306 = *(float *)(catmullrom_basis1 + lVar22 + 0x18);
      auVar240._0_4_ = fVar254 * fVar231 + fVar235 * fVar164 + fVar340 * fVar166 + fVar303 * fVar143
      ;
      auVar240._4_4_ = fVar263 * fVar330 + fVar247 * fVar209 + fVar293 * fVar185 + fVar144 * fVar165
      ;
      auVar240._8_4_ = fVar265 * fVar300 + fVar249 * fVar224 + fVar230 * fVar186 + fVar160 * fVar189
      ;
      auVar240._12_4_ =
           fVar267 * fVar302 + fVar251 * fVar226 + fVar329 * fVar187 + fVar161 * fVar282;
      auVar240._16_4_ =
           fVar254 * fVar304 + fVar235 * fVar228 + fVar299 * fVar166 + fVar188 * fVar143;
      auVar240._20_4_ =
           fVar263 * fVar305 + fVar247 * fVar229 + fVar301 * fVar185 + fVar162 * fVar165;
      auVar240._24_4_ =
           fVar265 * fVar306 + fVar249 * fVar252 + fVar232 * fVar186 + fVar163 * fVar189;
      auVar240._28_4_ = fVar315 + fVar267 + 0.0 + 0.0;
      local_200._0_4_ =
           fVar191 * fVar231 + fVar372 * fVar164 + fVar340 * fVar190 + fVar331 * fVar303;
      local_200._4_4_ =
           fVar203 * fVar330 + fVar377 * fVar209 + fVar293 * fVar202 + fVar334 * fVar144;
      local_200._8_4_ =
           fVar205 * fVar300 + fVar378 * fVar224 + fVar230 * fVar204 + fVar335 * fVar160;
      local_200._12_4_ =
           fVar208 * fVar302 + fVar379 * fVar226 + fVar329 * fVar207 + fVar336 * fVar161;
      local_200._16_4_ =
           fVar191 * fVar304 + fVar372 * fVar228 + fVar299 * fVar190 + fVar331 * fVar188;
      local_200._20_4_ =
           fVar203 * fVar305 + fVar377 * fVar229 + fVar301 * fVar202 + fVar334 * fVar162;
      local_200._24_4_ =
           fVar205 * fVar306 + fVar378 * fVar252 + fVar232 * fVar204 + fVar335 * fVar163;
      local_200._28_4_ = fVar208 + fVar267 + 0.0 + 0.0;
      local_6c0._0_4_ =
           fVar363 * fVar164 + fVar307 * fVar340 + fVar303 * fVar271 + fVar314 * fVar231;
      local_6c0._4_4_ =
           fVar270 * fVar209 + fVar312 * fVar293 + fVar144 * fVar278 + fVar324 * fVar330;
      fStack_6b8 = fVar281 * fVar224 + fVar313 * fVar230 + fVar160 * fVar279 + fVar326 * fVar300;
      fStack_6b4 = fVar315 * fVar226 + auVar197._12_4_ * fVar329 + fVar161 * fVar280 +
                   auVar198._12_4_ * fVar302;
      register0x00001450 =
           fVar363 * fVar228 + fVar307 * fVar299 + fVar188 * fVar271 + fVar314 * fVar304;
      register0x00001454 =
           fVar270 * fVar229 + fVar312 * fVar301 + fVar162 * fVar278 + fVar324 * fVar305;
      register0x00001458 =
           fVar281 * fVar252 + fVar313 * fVar232 + fVar163 * fVar279 + fVar326 * fVar306;
      register0x0000145c = fVar280 + fVar267 + 0.0 + fVar208;
      local_260 = vsubps_avx(auVar240,auVar289);
      auVar260 = vsubps_avx(local_200,auVar345);
      fVar316 = local_260._0_4_;
      fVar359 = local_260._4_4_;
      auVar180._4_4_ = auVar345._4_4_ * fVar359;
      auVar180._0_4_ = auVar345._0_4_ * fVar316;
      fVar206 = local_260._8_4_;
      auVar180._8_4_ = auVar345._8_4_ * fVar206;
      fVar268 = local_260._12_4_;
      auVar180._12_4_ = auVar345._12_4_ * fVar268;
      fVar210 = local_260._16_4_;
      auVar180._16_4_ = auVar345._16_4_ * fVar210;
      fVar223 = local_260._20_4_;
      auVar180._20_4_ = auVar345._20_4_ * fVar223;
      fVar225 = local_260._24_4_;
      auVar180._24_4_ = auVar345._24_4_ * fVar225;
      auVar180._28_4_ = fVar208;
      fVar271 = auVar260._0_4_;
      fVar278 = auVar260._4_4_;
      auVar354._4_4_ = fVar278 * auVar289._4_4_;
      auVar354._0_4_ = fVar271 * auVar289._0_4_;
      fVar279 = auVar260._8_4_;
      auVar354._8_4_ = fVar279 * auVar289._8_4_;
      fVar280 = auVar260._12_4_;
      auVar354._12_4_ = fVar280 * auVar289._12_4_;
      fVar307 = auVar260._16_4_;
      auVar354._16_4_ = fVar307 * auVar289._16_4_;
      fVar312 = auVar260._20_4_;
      auVar354._20_4_ = fVar312 * auVar289._20_4_;
      fVar313 = auVar260._24_4_;
      auVar354._24_4_ = fVar313 * auVar289._24_4_;
      auVar354._28_4_ = local_200._28_4_;
      auVar354 = vsubps_avx(auVar180,auVar354);
      auVar180 = vmaxps_avx(_local_820,_local_6c0);
      auVar38._4_4_ = auVar180._4_4_ * auVar180._4_4_ * (fVar359 * fVar359 + fVar278 * fVar278);
      auVar38._0_4_ = auVar180._0_4_ * auVar180._0_4_ * (fVar316 * fVar316 + fVar271 * fVar271);
      auVar38._8_4_ = auVar180._8_4_ * auVar180._8_4_ * (fVar206 * fVar206 + fVar279 * fVar279);
      auVar38._12_4_ = auVar180._12_4_ * auVar180._12_4_ * (fVar268 * fVar268 + fVar280 * fVar280);
      auVar38._16_4_ = auVar180._16_4_ * auVar180._16_4_ * (fVar210 * fVar210 + fVar307 * fVar307);
      auVar38._20_4_ = auVar180._20_4_ * auVar180._20_4_ * (fVar223 * fVar223 + fVar312 * fVar312);
      auVar38._24_4_ = auVar180._24_4_ * auVar180._24_4_ * (fVar225 * fVar225 + fVar313 * fVar313);
      auVar38._28_4_ = auVar240._28_4_ + local_200._28_4_;
      auVar23._4_4_ = auVar354._4_4_ * auVar354._4_4_;
      auVar23._0_4_ = auVar354._0_4_ * auVar354._0_4_;
      auVar23._8_4_ = auVar354._8_4_ * auVar354._8_4_;
      auVar23._12_4_ = auVar354._12_4_ * auVar354._12_4_;
      auVar23._16_4_ = auVar354._16_4_ * auVar354._16_4_;
      auVar23._20_4_ = auVar354._20_4_ * auVar354._20_4_;
      auVar23._24_4_ = auVar354._24_4_ * auVar354._24_4_;
      auVar23._28_4_ = auVar354._28_4_;
      auVar180 = vcmpps_avx(auVar23,auVar38,2);
      auVar214 = ZEXT416((uint)(auVar172._0_4_ * 4.7683716e-07));
      _local_7a0 = auVar214;
      _local_420 = ZEXT416((uint)(float)(int)uVar16);
      auVar172 = vshufps_avx(_local_420,_local_420,0);
      auVar218._16_16_ = auVar172;
      auVar218._0_16_ = auVar172;
      auVar354 = vcmpps_avx(_DAT_02020f40,auVar218,1);
      auVar222 = ZEXT3264(auVar354);
      auVar119._8_4_ = auVar213._8_4_;
      auVar119._0_8_ = auVar213._0_8_;
      auVar119._12_4_ = auVar213._12_4_;
      auVar172 = vpermilps_avx(auVar119,0xaa);
      auVar318._16_16_ = auVar172;
      auVar318._0_16_ = auVar172;
      auVar197 = vpermilps_avx(auVar288,0xaa);
      register0x00001550 = auVar197;
      _local_1c0 = auVar197;
      auVar198 = vpermilps_avx(auVar297,0xaa);
      register0x00001590 = auVar198;
      _local_a0 = auVar198;
      auVar215 = vpermilps_avx(auVar170,0xaa);
      register0x00001310 = auVar215;
      _local_5c0 = auVar215;
      auVar38 = auVar354 & auVar180;
      local_780 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fStack_77c = 0.0;
      fStack_778 = 0.0;
      fStack_774 = 0.0;
      if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar38 >> 0x7f,0) == '\0') &&
            (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar38 >> 0xbf,0) == '\0') &&
          (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar38[0x1f])
      {
        auVar350 = ZEXT3264(_local_760);
        auVar292 = ZEXT3264(local_520);
        auVar180 = local_560;
        auVar354 = local_540;
      }
      else {
        _local_220 = vandps_avx(auVar180,auVar354);
        fVar315 = auVar172._0_4_;
        fVar325 = auVar172._4_4_;
        fVar327 = auVar172._8_4_;
        fVar328 = auVar172._12_4_;
        fVar352 = auVar197._0_4_;
        fVar358 = auVar197._4_4_;
        fVar360 = auVar197._8_4_;
        fVar361 = auVar197._12_4_;
        fVar364 = auVar198._0_4_;
        fVar368 = auVar198._4_4_;
        fVar369 = auVar198._8_4_;
        fVar370 = auVar198._12_4_;
        fVar316 = auVar215._0_4_;
        fVar359 = auVar215._4_4_;
        fVar206 = auVar215._8_4_;
        fVar268 = auVar215._12_4_;
        fVar210 = auVar354._28_4_ +
                  *(float *)(catmullrom_basis1 + lVar22 + 0x924) +
                  *(float *)(catmullrom_basis1 + lVar22 + 0x4a0);
        local_240 = fVar315 * fVar231 + fVar352 * fVar164 + fVar364 * fVar340 + fVar303 * fVar316;
        fStack_23c = fVar325 * fVar330 + fVar358 * fVar209 + fVar368 * fVar293 + fVar144 * fVar359;
        fStack_238 = fVar327 * fVar300 + fVar360 * fVar224 + fVar369 * fVar230 + fVar160 * fVar206;
        fStack_234 = fVar328 * fVar302 + fVar361 * fVar226 + fVar370 * fVar329 + fVar161 * fVar268;
        fStack_230 = fVar315 * fVar304 + fVar352 * fVar228 + fVar364 * fVar299 + fVar188 * fVar316;
        fStack_22c = fVar325 * fVar305 + fVar358 * fVar229 + fVar368 * fVar301 + fVar162 * fVar359;
        fStack_228 = fVar327 * fVar306 + fVar360 * fVar252 + fVar369 * fVar232 + fVar163 * fVar206;
        fStack_224 = local_220._28_4_ + fVar210;
        local_580._0_4_ = auVar129._0_4_;
        local_580._4_4_ = auVar129._4_4_;
        fStack_578 = auVar129._8_4_;
        fStack_574 = auVar129._12_4_;
        fStack_570 = auVar129._16_4_;
        fStack_56c = auVar129._20_4_;
        fStack_568 = auVar129._24_4_;
        local_680 = fVar315 * local_460 +
                    fVar352 * fVar264 + fVar364 * fVar227 + fVar316 * (float)local_580._0_4_;
        fStack_67c = fVar325 * fStack_45c +
                     fVar358 * fVar266 + fVar368 * fVar233 + fVar359 * (float)local_580._4_4_;
        fStack_678 = fVar327 * fStack_458 +
                     fVar360 * fVar338 + fVar369 * fVar245 + fVar206 * fStack_578;
        fStack_674 = fVar328 * fStack_454 +
                     fVar361 * fVar337 + fVar370 * fVar248 + fVar268 * fStack_574;
        fStack_670 = fVar315 * fStack_450 +
                     fVar352 * fVar339 + fVar364 * fVar250 + fVar316 * fStack_570;
        fStack_66c = fVar325 * fStack_44c +
                     fVar358 * fVar269 + fVar368 * fVar253 + fVar359 * fStack_56c;
        fStack_668 = fVar327 * fStack_448 +
                     fVar360 * fVar341 + fVar369 * fVar262 + fVar206 * fStack_568;
        fStack_664 = fStack_224 + fVar210 + local_220._28_4_ + auVar354._28_4_;
        fVar210 = *(float *)(catmullrom_basis0 + lVar22 + 0x1210);
        fVar223 = *(float *)(catmullrom_basis0 + lVar22 + 0x1214);
        fVar225 = *(float *)(catmullrom_basis0 + lVar22 + 0x1218);
        fVar227 = *(float *)(catmullrom_basis0 + lVar22 + 0x121c);
        fVar233 = *(float *)(catmullrom_basis0 + lVar22 + 0x1220);
        fVar245 = *(float *)(catmullrom_basis0 + lVar22 + 0x1224);
        fVar248 = *(float *)(catmullrom_basis0 + lVar22 + 0x1228);
        fVar250 = *(float *)(catmullrom_basis0 + lVar22 + 0x1694);
        fVar253 = *(float *)(catmullrom_basis0 + lVar22 + 0x1698);
        fVar262 = *(float *)(catmullrom_basis0 + lVar22 + 0x169c);
        fVar264 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a0);
        fVar266 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a4);
        fVar338 = *(float *)(catmullrom_basis0 + lVar22 + 0x16a8);
        fVar337 = *(float *)(catmullrom_basis0 + lVar22 + 0x16ac);
        fVar339 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b18);
        fVar269 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b1c);
        fVar341 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b20);
        fVar340 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b24);
        fVar293 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b28);
        fVar230 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b2c);
        fVar329 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b30);
        fVar299 = *(float *)(catmullrom_basis0 + lVar22 + 0x1f9c);
        fVar301 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa0);
        fVar232 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa4);
        fVar303 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fa8);
        fVar144 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fac);
        fVar160 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fb0);
        fVar161 = *(float *)(catmullrom_basis0 + lVar22 + 0x1fb4);
        fVar270 = *(float *)(catmullrom_basis1 + lVar22 + 0x4a0) + 0.0;
        fVar188 = *(float *)(catmullrom_basis0 + lVar22 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar22 + 0x1fb8);
        fVar281 = *(float *)(catmullrom_basis0 + lVar22 + 0x16b0) + fVar188;
        auVar174._0_4_ =
             fVar191 * fVar210 + fVar372 * fVar250 + fVar190 * fVar339 + fVar331 * fVar299;
        auVar174._4_4_ =
             fVar203 * fVar223 + fVar377 * fVar253 + fVar202 * fVar269 + fVar334 * fVar301;
        auVar174._8_4_ =
             fVar205 * fVar225 + fVar378 * fVar262 + fVar204 * fVar341 + fVar335 * fVar232;
        auVar174._12_4_ =
             fVar208 * fVar227 + fVar379 * fVar264 + fVar207 * fVar340 + fVar336 * fVar303;
        auVar174._16_4_ =
             fVar191 * fVar233 + fVar372 * fVar266 + fVar190 * fVar293 + fVar331 * fVar144;
        auVar174._20_4_ =
             fVar203 * fVar245 + fVar377 * fVar338 + fVar202 * fVar230 + fVar334 * fVar160;
        auVar174._24_4_ =
             fVar205 * fVar248 + fVar378 * fVar337 + fVar204 * fVar329 + fVar335 * fVar161;
        auVar174._28_4_ = fVar188 + fVar270 + *(float *)(catmullrom_basis1 + lVar22 + 0x1c) + 0.0;
        auVar256._0_4_ =
             fVar315 * fVar210 + fVar352 * fVar250 + fVar364 * fVar339 + fVar316 * fVar299;
        auVar256._4_4_ =
             fVar325 * fVar223 + fVar358 * fVar253 + fVar368 * fVar269 + fVar359 * fVar301;
        auVar256._8_4_ =
             fVar327 * fVar225 + fVar360 * fVar262 + fVar369 * fVar341 + fVar206 * fVar232;
        auVar256._12_4_ =
             fVar328 * fVar227 + fVar361 * fVar264 + fVar370 * fVar340 + fVar268 * fVar303;
        auVar256._16_4_ =
             fVar315 * fVar233 + fVar352 * fVar266 + fVar364 * fVar293 + fVar316 * fVar144;
        auVar256._20_4_ =
             fVar325 * fVar245 + fVar358 * fVar338 + fVar368 * fVar230 + fVar359 * fVar160;
        auVar256._24_4_ =
             fVar327 * fVar248 + fVar360 * fVar337 + fVar369 * fVar329 + fVar206 * fVar161;
        auVar256._28_4_ = *(float *)(catmullrom_basis0 + lVar22 + 0x122c) + fVar281;
        fVar188 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b18);
        fVar162 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b1c);
        fVar163 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b20);
        fVar164 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b24);
        fVar209 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b28);
        fVar224 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b2c);
        fVar226 = *(float *)(catmullrom_basis1 + lVar22 + 0x1b30);
        fVar228 = *(float *)(catmullrom_basis1 + lVar22 + 0x1f9c);
        fVar229 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa0);
        fVar252 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa4);
        fVar231 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fa8);
        fVar330 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fac);
        fVar300 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fb0);
        fVar302 = *(float *)(catmullrom_basis1 + lVar22 + 0x1fb4);
        fVar304 = *(float *)(catmullrom_basis1 + lVar22 + 0x1694);
        fVar305 = *(float *)(catmullrom_basis1 + lVar22 + 0x1698);
        fVar306 = *(float *)(catmullrom_basis1 + lVar22 + 0x169c);
        fVar271 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a0);
        fVar278 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a4);
        fVar279 = *(float *)(catmullrom_basis1 + lVar22 + 0x16a8);
        fVar280 = *(float *)(catmullrom_basis1 + lVar22 + 0x16ac);
        fVar307 = *(float *)(catmullrom_basis1 + lVar22 + 0x1210);
        fVar312 = *(float *)(catmullrom_basis1 + lVar22 + 0x1214);
        fVar313 = *(float *)(catmullrom_basis1 + lVar22 + 0x1218);
        fVar314 = *(float *)(catmullrom_basis1 + lVar22 + 0x121c);
        fVar324 = *(float *)(catmullrom_basis1 + lVar22 + 0x1220);
        fVar326 = *(float *)(catmullrom_basis1 + lVar22 + 0x1224);
        fVar363 = *(float *)(catmullrom_basis1 + lVar22 + 0x1228);
        auVar274._0_4_ =
             fVar307 * fVar254 + fVar235 * fVar304 + fVar166 * fVar188 + fVar143 * fVar228;
        auVar274._4_4_ =
             fVar312 * fVar263 + fVar247 * fVar305 + fVar185 * fVar162 + fVar165 * fVar229;
        auVar274._8_4_ =
             fVar313 * fVar265 + fVar249 * fVar306 + fVar186 * fVar163 + fVar189 * fVar252;
        auVar274._12_4_ =
             fVar314 * fVar267 + fVar251 * fVar271 + fVar187 * fVar164 + fVar282 * fVar231;
        auVar274._16_4_ =
             fVar324 * fVar254 + fVar235 * fVar278 + fVar166 * fVar209 + fVar143 * fVar330;
        auVar274._20_4_ =
             fVar326 * fVar263 + fVar247 * fVar279 + fVar185 * fVar224 + fVar165 * fVar300;
        auVar274._24_4_ =
             fVar363 * fVar265 + fVar249 * fVar280 + fVar186 * fVar226 + fVar189 * fVar302;
        auVar274._28_4_ = fVar187 + fVar187 + fVar267 + fVar281;
        auVar309._0_4_ =
             fVar191 * fVar307 + fVar372 * fVar304 + fVar190 * fVar188 + fVar331 * fVar228;
        auVar309._4_4_ =
             fVar203 * fVar312 + fVar377 * fVar305 + fVar202 * fVar162 + fVar334 * fVar229;
        auVar309._8_4_ =
             fVar205 * fVar313 + fVar378 * fVar306 + fVar204 * fVar163 + fVar335 * fVar252;
        auVar309._12_4_ =
             fVar208 * fVar314 + fVar379 * fVar271 + fVar207 * fVar164 + fVar336 * fVar231;
        auVar309._16_4_ =
             fVar191 * fVar324 + fVar372 * fVar278 + fVar190 * fVar209 + fVar331 * fVar330;
        auVar309._20_4_ =
             fVar203 * fVar326 + fVar377 * fVar279 + fVar202 * fVar224 + fVar334 * fVar300;
        auVar309._24_4_ =
             fVar205 * fVar363 + fVar378 * fVar280 + fVar204 * fVar226 + fVar335 * fVar302;
        auVar309._28_4_ = fVar187 + fVar187 + fVar187 + fVar267;
        _local_740 = auVar318;
        auVar201._0_4_ =
             fVar315 * fVar307 + fVar352 * fVar304 + fVar364 * fVar188 + fVar228 * fVar316;
        auVar201._4_4_ =
             fVar325 * fVar312 + fVar358 * fVar305 + fVar368 * fVar162 + fVar229 * fVar359;
        auVar201._8_4_ =
             fVar327 * fVar313 + fVar360 * fVar306 + fVar369 * fVar163 + fVar252 * fVar206;
        auVar201._12_4_ =
             fVar328 * fVar314 + fVar361 * fVar271 + fVar370 * fVar164 + fVar231 * fVar268;
        auVar201._16_4_ =
             fVar315 * fVar324 + fVar352 * fVar278 + fVar364 * fVar209 + fVar330 * fVar316;
        auVar201._20_4_ =
             fVar325 * fVar326 + fVar358 * fVar279 + fVar368 * fVar224 + fVar300 * fVar359;
        auVar201._24_4_ =
             fVar327 * fVar363 + fVar360 * fVar280 + fVar369 * fVar226 + fVar302 * fVar206;
        auVar201._28_4_ =
             *(float *)(catmullrom_basis1 + lVar22 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar22 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar22 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar22 + 0x1fb8);
        auVar241._8_4_ = 0x7fffffff;
        auVar241._0_8_ = 0x7fffffff7fffffff;
        auVar241._12_4_ = 0x7fffffff;
        auVar241._16_4_ = 0x7fffffff;
        auVar241._20_4_ = 0x7fffffff;
        auVar241._24_4_ = 0x7fffffff;
        auVar241._28_4_ = 0x7fffffff;
        auVar124._4_4_ =
             fVar263 * fVar223 + fVar247 * fVar253 + fVar185 * fVar269 + fVar165 * fVar301;
        auVar124._0_4_ =
             fVar254 * fVar210 + fVar235 * fVar250 + fVar166 * fVar339 + fVar143 * fVar299;
        auVar124._8_4_ =
             fVar265 * fVar225 + fVar249 * fVar262 + fVar186 * fVar341 + fVar189 * fVar232;
        auVar124._12_4_ =
             fVar267 * fVar227 + fVar251 * fVar264 + fVar187 * fVar340 + fVar282 * fVar303;
        auVar124._16_4_ =
             fVar254 * fVar233 + fVar235 * fVar266 + fVar166 * fVar293 + fVar143 * fVar144;
        auVar124._20_4_ =
             fVar263 * fVar245 + fVar247 * fVar338 + fVar185 * fVar230 + fVar165 * fVar160;
        auVar124._24_4_ =
             fVar265 * fVar248 + fVar249 * fVar337 + fVar186 * fVar329 + fVar189 * fVar161;
        auVar124._28_4_ =
             *(float *)(catmullrom_basis0 + lVar22 + 0x16b0) +
             *(float *)(catmullrom_basis0 + lVar22 + 0x1fb8) + fVar270;
        auVar180 = vandps_avx(auVar124,auVar241);
        auVar354 = vandps_avx(auVar174,auVar241);
        auVar354 = vmaxps_avx(auVar180,auVar354);
        auVar180 = vandps_avx(auVar256,auVar241);
        auVar180 = vmaxps_avx(auVar354,auVar180);
        auVar172 = vpermilps_avx(auVar214,0);
        auVar257._16_16_ = auVar172;
        auVar257._0_16_ = auVar172;
        auVar180 = vcmpps_avx(auVar180,auVar257,1);
        auVar38 = vblendvps_avx(auVar124,local_260,auVar180);
        auVar23 = vblendvps_avx(auVar174,auVar260,auVar180);
        auVar180 = vandps_avx(auVar274,auVar241);
        auVar354 = vandps_avx(auVar309,auVar241);
        auVar218 = vmaxps_avx(auVar180,auVar354);
        auVar180 = vandps_avx(auVar201,auVar241);
        auVar180 = vmaxps_avx(auVar218,auVar180);
        auVar218 = vcmpps_avx(auVar180,auVar257,1);
        auVar180 = vblendvps_avx(auVar274,local_260,auVar218);
        auVar260 = vblendvps_avx(auVar309,auVar260,auVar218);
        fVar144 = auVar38._0_4_;
        fVar160 = auVar38._4_4_;
        fVar161 = auVar38._8_4_;
        fVar188 = auVar38._12_4_;
        fVar162 = auVar38._16_4_;
        fVar163 = auVar38._20_4_;
        fVar164 = auVar38._24_4_;
        fVar330 = -auVar38._28_4_;
        fVar209 = auVar180._0_4_;
        fVar224 = auVar180._4_4_;
        fVar226 = auVar180._8_4_;
        fVar228 = auVar180._12_4_;
        fVar229 = auVar180._16_4_;
        fVar252 = auVar180._20_4_;
        fVar231 = auVar180._24_4_;
        fVar316 = auVar23._0_4_;
        fVar210 = auVar23._4_4_;
        fVar233 = auVar23._8_4_;
        fVar253 = auVar23._12_4_;
        fVar338 = auVar23._16_4_;
        fVar341 = auVar23._20_4_;
        fVar329 = auVar23._24_4_;
        auVar150._0_4_ = fVar316 * fVar316 + fVar144 * fVar144;
        auVar150._4_4_ = fVar210 * fVar210 + fVar160 * fVar160;
        auVar150._8_4_ = fVar233 * fVar233 + fVar161 * fVar161;
        auVar150._12_4_ = fVar253 * fVar253 + fVar188 * fVar188;
        auVar150._16_4_ = fVar338 * fVar338 + fVar162 * fVar162;
        auVar150._20_4_ = fVar341 * fVar341 + fVar163 * fVar163;
        auVar150._24_4_ = fVar329 * fVar329 + fVar164 * fVar164;
        auVar150._28_4_ = auVar309._28_4_ + auVar38._28_4_;
        auVar38 = vrsqrtps_avx(auVar150);
        fVar359 = auVar38._0_4_;
        fVar206 = auVar38._4_4_;
        auVar34._4_4_ = fVar206 * 1.5;
        auVar34._0_4_ = fVar359 * 1.5;
        fVar268 = auVar38._8_4_;
        auVar34._8_4_ = fVar268 * 1.5;
        fVar223 = auVar38._12_4_;
        auVar34._12_4_ = fVar223 * 1.5;
        fVar225 = auVar38._16_4_;
        auVar34._16_4_ = fVar225 * 1.5;
        fVar227 = auVar38._20_4_;
        auVar34._20_4_ = fVar227 * 1.5;
        fVar245 = auVar38._24_4_;
        fVar303 = auVar354._28_4_;
        auVar34._24_4_ = fVar245 * 1.5;
        auVar34._28_4_ = fVar303;
        auVar24._4_4_ = fVar206 * fVar206 * fVar206 * auVar150._4_4_ * 0.5;
        auVar24._0_4_ = fVar359 * fVar359 * fVar359 * auVar150._0_4_ * 0.5;
        auVar24._8_4_ = fVar268 * fVar268 * fVar268 * auVar150._8_4_ * 0.5;
        auVar24._12_4_ = fVar223 * fVar223 * fVar223 * auVar150._12_4_ * 0.5;
        auVar24._16_4_ = fVar225 * fVar225 * fVar225 * auVar150._16_4_ * 0.5;
        auVar24._20_4_ = fVar227 * fVar227 * fVar227 * auVar150._20_4_ * 0.5;
        auVar24._24_4_ = fVar245 * fVar245 * fVar245 * auVar150._24_4_ * 0.5;
        auVar24._28_4_ = auVar150._28_4_;
        auVar354 = vsubps_avx(auVar34,auVar24);
        fVar359 = auVar354._0_4_;
        fVar223 = auVar354._4_4_;
        fVar245 = auVar354._8_4_;
        fVar262 = auVar354._12_4_;
        fVar337 = auVar354._16_4_;
        fVar340 = auVar354._20_4_;
        fVar299 = auVar354._24_4_;
        fVar206 = auVar260._0_4_;
        fVar225 = auVar260._4_4_;
        fVar248 = auVar260._8_4_;
        fVar264 = auVar260._12_4_;
        fVar339 = auVar260._16_4_;
        fVar293 = auVar260._20_4_;
        fVar301 = auVar260._24_4_;
        auVar151._0_4_ = fVar206 * fVar206 + fVar209 * fVar209;
        auVar151._4_4_ = fVar225 * fVar225 + fVar224 * fVar224;
        auVar151._8_4_ = fVar248 * fVar248 + fVar226 * fVar226;
        auVar151._12_4_ = fVar264 * fVar264 + fVar228 * fVar228;
        auVar151._16_4_ = fVar339 * fVar339 + fVar229 * fVar229;
        auVar151._20_4_ = fVar293 * fVar293 + fVar252 * fVar252;
        auVar151._24_4_ = fVar301 * fVar301 + fVar231 * fVar231;
        auVar151._28_4_ = auVar180._28_4_ + auVar354._28_4_;
        auVar180 = vrsqrtps_avx(auVar151);
        fVar268 = auVar180._0_4_;
        fVar227 = auVar180._4_4_;
        auVar32._4_4_ = fVar227 * 1.5;
        auVar32._0_4_ = fVar268 * 1.5;
        fVar250 = auVar180._8_4_;
        auVar32._8_4_ = fVar250 * 1.5;
        fVar266 = auVar180._12_4_;
        auVar32._12_4_ = fVar266 * 1.5;
        fVar269 = auVar180._16_4_;
        auVar32._16_4_ = fVar269 * 1.5;
        fVar230 = auVar180._20_4_;
        auVar32._20_4_ = fVar230 * 1.5;
        fVar232 = auVar180._24_4_;
        auVar32._24_4_ = fVar232 * 1.5;
        auVar32._28_4_ = fVar303;
        auVar33._4_4_ = fVar227 * fVar227 * fVar227 * auVar151._4_4_ * 0.5;
        auVar33._0_4_ = fVar268 * fVar268 * fVar268 * auVar151._0_4_ * 0.5;
        auVar33._8_4_ = fVar250 * fVar250 * fVar250 * auVar151._8_4_ * 0.5;
        auVar33._12_4_ = fVar266 * fVar266 * fVar266 * auVar151._12_4_ * 0.5;
        auVar33._16_4_ = fVar269 * fVar269 * fVar269 * auVar151._16_4_ * 0.5;
        auVar33._20_4_ = fVar230 * fVar230 * fVar230 * auVar151._20_4_ * 0.5;
        auVar33._24_4_ = fVar232 * fVar232 * fVar232 * auVar151._24_4_ * 0.5;
        auVar33._28_4_ = auVar151._28_4_;
        auVar180 = vsubps_avx(auVar32,auVar33);
        fVar268 = auVar180._0_4_;
        fVar227 = auVar180._4_4_;
        fVar250 = auVar180._8_4_;
        fVar266 = auVar180._12_4_;
        fVar269 = auVar180._16_4_;
        fVar230 = auVar180._20_4_;
        fVar232 = auVar180._24_4_;
        fVar316 = (float)local_820._0_4_ * fVar316 * fVar359;
        fVar210 = (float)local_820._4_4_ * fVar210 * fVar223;
        auVar35._4_4_ = fVar210;
        auVar35._0_4_ = fVar316;
        fVar233 = fStack_818 * fVar233 * fVar245;
        auVar35._8_4_ = fVar233;
        fVar253 = fStack_814 * fVar253 * fVar262;
        auVar35._12_4_ = fVar253;
        fVar338 = fStack_810 * fVar338 * fVar337;
        auVar35._16_4_ = fVar338;
        fVar341 = fStack_80c * fVar341 * fVar340;
        auVar35._20_4_ = fVar341;
        fVar329 = fStack_808 * fVar329 * fVar299;
        auVar35._24_4_ = fVar329;
        auVar35._28_4_ = fVar303;
        local_580._4_4_ = fVar210 + auVar289._4_4_;
        local_580._0_4_ = fVar316 + auVar289._0_4_;
        fStack_578 = fVar233 + auVar289._8_4_;
        fStack_574 = fVar253 + auVar289._12_4_;
        fStack_570 = fVar338 + auVar289._16_4_;
        fStack_56c = fVar341 + auVar289._20_4_;
        fStack_568 = fVar329 + auVar289._24_4_;
        fStack_564 = fVar303 + auVar289._28_4_;
        local_5a0 = (float)local_820._0_4_ * fVar359 * -fVar144;
        fStack_59c = (float)local_820._4_4_ * fVar223 * -fVar160;
        auVar36._4_4_ = fStack_59c;
        auVar36._0_4_ = local_5a0;
        fStack_598 = fStack_818 * fVar245 * -fVar161;
        auVar36._8_4_ = fStack_598;
        fStack_594 = fStack_814 * fVar262 * -fVar188;
        auVar36._12_4_ = fStack_594;
        fStack_590 = fStack_810 * fVar337 * -fVar162;
        auVar36._16_4_ = fStack_590;
        fStack_58c = fStack_80c * fVar340 * -fVar163;
        auVar36._20_4_ = fStack_58c;
        fStack_588 = fStack_808 * fVar299 * -fVar164;
        auVar36._24_4_ = fStack_588;
        auVar36._28_4_ = fVar330;
        local_5a0 = auVar345._0_4_ + local_5a0;
        fStack_59c = auVar345._4_4_ + fStack_59c;
        fStack_598 = auVar345._8_4_ + fStack_598;
        fStack_594 = auVar345._12_4_ + fStack_594;
        fStack_590 = auVar345._16_4_ + fStack_590;
        fStack_58c = auVar345._20_4_ + fStack_58c;
        fStack_588 = auVar345._24_4_ + fStack_588;
        fStack_584 = auVar345._28_4_ + fVar330;
        fVar316 = fVar359 * 0.0 * (float)local_820._0_4_;
        fVar359 = fVar223 * 0.0 * (float)local_820._4_4_;
        auVar37._4_4_ = fVar359;
        auVar37._0_4_ = fVar316;
        fVar210 = fVar245 * 0.0 * fStack_818;
        auVar37._8_4_ = fVar210;
        fVar223 = fVar262 * 0.0 * fStack_814;
        auVar37._12_4_ = fVar223;
        fVar233 = fVar337 * 0.0 * fStack_810;
        auVar37._16_4_ = fVar233;
        fVar245 = fVar340 * 0.0 * fStack_80c;
        auVar37._20_4_ = fVar245;
        fVar253 = fVar299 * 0.0 * fStack_808;
        auVar37._24_4_ = fVar253;
        auVar37._28_4_ = fVar361;
        auVar122._4_4_ = fStack_67c;
        auVar122._0_4_ = local_680;
        auVar122._8_4_ = fStack_678;
        auVar122._12_4_ = fStack_674;
        auVar122._16_4_ = fStack_670;
        auVar122._20_4_ = fStack_66c;
        auVar122._24_4_ = fStack_668;
        auVar122._28_4_ = fStack_664;
        auVar275._0_4_ = local_680 + fVar316;
        auVar275._4_4_ = fStack_67c + fVar359;
        auVar275._8_4_ = fStack_678 + fVar210;
        auVar275._12_4_ = fStack_674 + fVar223;
        auVar275._16_4_ = fStack_670 + fVar233;
        auVar275._20_4_ = fStack_66c + fVar245;
        auVar275._24_4_ = fStack_668 + fVar253;
        auVar275._28_4_ = fStack_664 + fVar361;
        fVar316 = (float)local_6c0._0_4_ * fVar206 * fVar268;
        fVar359 = (float)local_6c0._4_4_ * fVar225 * fVar227;
        auVar39._4_4_ = fVar359;
        auVar39._0_4_ = fVar316;
        fVar206 = fStack_6b8 * fVar248 * fVar250;
        auVar39._8_4_ = fVar206;
        fVar210 = fStack_6b4 * fVar264 * fVar266;
        auVar39._12_4_ = fVar210;
        fVar223 = register0x00001450 * fVar339 * fVar269;
        auVar39._16_4_ = fVar223;
        fVar225 = register0x00001454 * fVar293 * fVar230;
        auVar39._20_4_ = fVar225;
        fVar233 = register0x00001458 * fVar301 * fVar232;
        auVar39._24_4_ = fVar233;
        auVar39._28_4_ = auVar260._28_4_;
        auVar23 = vsubps_avx(auVar289,auVar35);
        auVar319._0_4_ = auVar240._0_4_ + fVar316;
        auVar319._4_4_ = auVar240._4_4_ + fVar359;
        auVar319._8_4_ = auVar240._8_4_ + fVar206;
        auVar319._12_4_ = auVar240._12_4_ + fVar210;
        auVar319._16_4_ = auVar240._16_4_ + fVar223;
        auVar319._20_4_ = auVar240._20_4_ + fVar225;
        auVar319._24_4_ = auVar240._24_4_ + fVar233;
        auVar319._28_4_ = auVar240._28_4_ + auVar260._28_4_;
        fVar316 = (float)local_6c0._0_4_ * fVar268 * -fVar209;
        fVar359 = (float)local_6c0._4_4_ * fVar227 * -fVar224;
        auVar260._4_4_ = fVar359;
        auVar260._0_4_ = fVar316;
        fVar206 = fStack_6b8 * fVar250 * -fVar226;
        auVar260._8_4_ = fVar206;
        fVar210 = fStack_6b4 * fVar266 * -fVar228;
        auVar260._12_4_ = fVar210;
        fVar223 = register0x00001450 * fVar269 * -fVar229;
        auVar260._16_4_ = fVar223;
        fVar225 = register0x00001454 * fVar230 * -fVar252;
        auVar260._20_4_ = fVar225;
        fVar233 = register0x00001458 * fVar232 * -fVar231;
        auVar260._24_4_ = fVar233;
        auVar260._28_4_ = fVar370;
        auVar218 = vsubps_avx(auVar345,auVar36);
        auVar333._0_4_ = fVar316 + local_200._0_4_;
        auVar333._4_4_ = fVar359 + local_200._4_4_;
        auVar333._8_4_ = fVar206 + local_200._8_4_;
        auVar333._12_4_ = fVar210 + local_200._12_4_;
        auVar333._16_4_ = fVar223 + local_200._16_4_;
        auVar333._20_4_ = fVar225 + local_200._20_4_;
        auVar333._24_4_ = fVar233 + local_200._24_4_;
        auVar333._28_4_ = fVar370 + local_200._28_4_;
        fVar316 = fVar268 * 0.0 * (float)local_6c0._0_4_;
        fVar359 = fVar227 * 0.0 * (float)local_6c0._4_4_;
        auVar40._4_4_ = fVar359;
        auVar40._0_4_ = fVar316;
        fVar206 = fVar250 * 0.0 * fStack_6b8;
        auVar40._8_4_ = fVar206;
        fVar268 = fVar266 * 0.0 * fStack_6b4;
        auVar40._12_4_ = fVar268;
        fVar210 = fVar269 * 0.0 * register0x00001450;
        auVar40._16_4_ = fVar210;
        fVar223 = fVar230 * 0.0 * register0x00001454;
        auVar40._20_4_ = fVar223;
        fVar225 = fVar232 * 0.0 * register0x00001458;
        auVar40._24_4_ = fVar225;
        auVar40._28_4_ = fVar330;
        auVar24 = vsubps_avx(auVar122,auVar37);
        auVar128._4_4_ = fStack_23c;
        auVar128._0_4_ = local_240;
        auVar128._8_4_ = fStack_238;
        auVar128._12_4_ = fStack_234;
        auVar128._16_4_ = fStack_230;
        auVar128._20_4_ = fStack_22c;
        auVar128._24_4_ = fStack_228;
        auVar128._28_4_ = fStack_224;
        auVar374._0_4_ = local_240 + fVar316;
        auVar374._4_4_ = fStack_23c + fVar359;
        auVar374._8_4_ = fStack_238 + fVar206;
        auVar374._12_4_ = fStack_234 + fVar268;
        auVar374._16_4_ = fStack_230 + fVar210;
        auVar374._20_4_ = fStack_22c + fVar223;
        auVar374._24_4_ = fStack_228 + fVar225;
        auVar374._28_4_ = fStack_224 + fVar330;
        auVar180 = vsubps_avx(auVar240,auVar39);
        auVar354 = vsubps_avx(local_200,auVar260);
        auVar260 = vsubps_avx(auVar128,auVar40);
        auVar38 = vsubps_avx(auVar333,auVar218);
        auVar34 = vsubps_avx(auVar374,auVar24);
        auVar41._4_4_ = auVar24._4_4_ * auVar38._4_4_;
        auVar41._0_4_ = auVar24._0_4_ * auVar38._0_4_;
        auVar41._8_4_ = auVar24._8_4_ * auVar38._8_4_;
        auVar41._12_4_ = auVar24._12_4_ * auVar38._12_4_;
        auVar41._16_4_ = auVar24._16_4_ * auVar38._16_4_;
        auVar41._20_4_ = auVar24._20_4_ * auVar38._20_4_;
        auVar41._24_4_ = auVar24._24_4_ * auVar38._24_4_;
        auVar41._28_4_ = fVar370;
        auVar42._4_4_ = auVar218._4_4_ * auVar34._4_4_;
        auVar42._0_4_ = auVar218._0_4_ * auVar34._0_4_;
        auVar42._8_4_ = auVar218._8_4_ * auVar34._8_4_;
        auVar42._12_4_ = auVar218._12_4_ * auVar34._12_4_;
        auVar42._16_4_ = auVar218._16_4_ * auVar34._16_4_;
        auVar42._20_4_ = auVar218._20_4_ * auVar34._20_4_;
        auVar42._24_4_ = auVar218._24_4_ * auVar34._24_4_;
        auVar42._28_4_ = local_200._28_4_;
        auVar32 = vsubps_avx(auVar42,auVar41);
        auVar43._4_4_ = auVar23._4_4_ * auVar34._4_4_;
        auVar43._0_4_ = auVar23._0_4_ * auVar34._0_4_;
        auVar43._8_4_ = auVar23._8_4_ * auVar34._8_4_;
        auVar43._12_4_ = auVar23._12_4_ * auVar34._12_4_;
        auVar43._16_4_ = auVar23._16_4_ * auVar34._16_4_;
        auVar43._20_4_ = auVar23._20_4_ * auVar34._20_4_;
        auVar43._24_4_ = auVar23._24_4_ * auVar34._24_4_;
        auVar43._28_4_ = auVar34._28_4_;
        auVar33 = vsubps_avx(auVar319,auVar23);
        auVar44._4_4_ = auVar24._4_4_ * auVar33._4_4_;
        auVar44._0_4_ = auVar24._0_4_ * auVar33._0_4_;
        auVar44._8_4_ = auVar24._8_4_ * auVar33._8_4_;
        auVar44._12_4_ = auVar24._12_4_ * auVar33._12_4_;
        auVar44._16_4_ = auVar24._16_4_ * auVar33._16_4_;
        auVar44._20_4_ = auVar24._20_4_ * auVar33._20_4_;
        auVar44._24_4_ = auVar24._24_4_ * auVar33._24_4_;
        auVar44._28_4_ = auVar240._28_4_;
        auVar240 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar33._4_4_ * auVar218._4_4_;
        auVar45._0_4_ = auVar33._0_4_ * auVar218._0_4_;
        auVar45._8_4_ = auVar33._8_4_ * auVar218._8_4_;
        auVar45._12_4_ = auVar33._12_4_ * auVar218._12_4_;
        auVar45._16_4_ = auVar33._16_4_ * auVar218._16_4_;
        auVar45._20_4_ = auVar33._20_4_ * auVar218._20_4_;
        auVar45._24_4_ = auVar33._24_4_ * auVar218._24_4_;
        auVar45._28_4_ = auVar34._28_4_;
        auVar46._4_4_ = auVar23._4_4_ * auVar38._4_4_;
        auVar46._0_4_ = auVar23._0_4_ * auVar38._0_4_;
        auVar46._8_4_ = auVar23._8_4_ * auVar38._8_4_;
        auVar46._12_4_ = auVar23._12_4_ * auVar38._12_4_;
        auVar46._16_4_ = auVar23._16_4_ * auVar38._16_4_;
        auVar46._20_4_ = auVar23._20_4_ * auVar38._20_4_;
        auVar46._24_4_ = auVar23._24_4_ * auVar38._24_4_;
        auVar46._28_4_ = auVar38._28_4_;
        auVar38 = vsubps_avx(auVar46,auVar45);
        auVar152._0_4_ = auVar32._0_4_ * 0.0 + auVar38._0_4_ + auVar240._0_4_ * 0.0;
        auVar152._4_4_ = auVar32._4_4_ * 0.0 + auVar38._4_4_ + auVar240._4_4_ * 0.0;
        auVar152._8_4_ = auVar32._8_4_ * 0.0 + auVar38._8_4_ + auVar240._8_4_ * 0.0;
        auVar152._12_4_ = auVar32._12_4_ * 0.0 + auVar38._12_4_ + auVar240._12_4_ * 0.0;
        auVar152._16_4_ = auVar32._16_4_ * 0.0 + auVar38._16_4_ + auVar240._16_4_ * 0.0;
        auVar152._20_4_ = auVar32._20_4_ * 0.0 + auVar38._20_4_ + auVar240._20_4_ * 0.0;
        auVar152._24_4_ = auVar32._24_4_ * 0.0 + auVar38._24_4_ + auVar240._24_4_ * 0.0;
        auVar152._28_4_ = auVar38._28_4_ + auVar38._28_4_ + auVar240._28_4_;
        auVar34 = vcmpps_avx(auVar152,ZEXT432(0) << 0x20,2);
        _local_6e0 = vblendvps_avx(auVar180,_local_580,auVar34);
        auVar125._4_4_ = fStack_59c;
        auVar125._0_4_ = local_5a0;
        auVar125._8_4_ = fStack_598;
        auVar125._12_4_ = fStack_594;
        auVar125._16_4_ = fStack_590;
        auVar125._20_4_ = fStack_58c;
        auVar125._24_4_ = fStack_588;
        auVar125._28_4_ = auVar345._28_4_ + fVar330;
        _local_660 = vblendvps_avx(auVar354,auVar125,auVar34);
        auVar180 = vblendvps_avx(auVar260,auVar275,auVar34);
        auVar354 = vblendvps_avx(auVar23,auVar319,auVar34);
        auVar260 = vblendvps_avx(auVar218,auVar333,auVar34);
        auVar38 = vblendvps_avx(auVar24,auVar374,auVar34);
        auVar23 = vblendvps_avx(auVar319,auVar23,auVar34);
        auVar218 = vblendvps_avx(auVar333,auVar218,auVar34);
        _local_640 = vpackssdw_avx(local_220._0_16_,local_220._16_16_);
        auStack_630 = auVar289._16_16_;
        auVar240 = vblendvps_avx(auVar374,auVar24,auVar34);
        auVar23 = vsubps_avx(auVar23,_local_6e0);
        auVar289 = vsubps_avx(auVar218,_local_660);
        auVar240 = vsubps_avx(auVar240,auVar180);
        auVar345 = vsubps_avx(_local_660,auVar260);
        fVar316 = auVar289._0_4_;
        fVar164 = auVar180._0_4_;
        fVar223 = auVar289._4_4_;
        fVar209 = auVar180._4_4_;
        auVar47._4_4_ = fVar209 * fVar223;
        auVar47._0_4_ = fVar164 * fVar316;
        fVar248 = auVar289._8_4_;
        fVar224 = auVar180._8_4_;
        auVar47._8_4_ = fVar224 * fVar248;
        fVar266 = auVar289._12_4_;
        fVar226 = auVar180._12_4_;
        auVar47._12_4_ = fVar226 * fVar266;
        fVar341 = auVar289._16_4_;
        fVar228 = auVar180._16_4_;
        auVar47._16_4_ = fVar228 * fVar341;
        fVar299 = auVar289._20_4_;
        fVar229 = auVar180._20_4_;
        auVar47._20_4_ = fVar229 * fVar299;
        fVar160 = auVar289._24_4_;
        fVar252 = auVar180._24_4_;
        auVar47._24_4_ = fVar252 * fVar160;
        auVar47._28_4_ = auVar218._28_4_;
        fVar359 = local_660._0_4_;
        fVar143 = auVar240._0_4_;
        fVar225 = local_660._4_4_;
        fVar165 = auVar240._4_4_;
        auVar48._4_4_ = fVar165 * fVar225;
        auVar48._0_4_ = fVar143 * fVar359;
        fVar250 = local_660._8_4_;
        fVar189 = auVar240._8_4_;
        auVar48._8_4_ = fVar189 * fVar250;
        fVar338 = local_660._12_4_;
        fVar282 = auVar240._12_4_;
        auVar48._12_4_ = fVar282 * fVar338;
        fVar340 = local_660._16_4_;
        fVar166 = auVar240._16_4_;
        auVar48._16_4_ = fVar166 * fVar340;
        fVar301 = local_660._20_4_;
        fVar185 = auVar240._20_4_;
        auVar48._20_4_ = fVar185 * fVar301;
        fVar161 = local_660._24_4_;
        fVar186 = auVar240._24_4_;
        auVar48._24_4_ = fVar186 * fVar161;
        auVar48._28_4_ = auVar333._28_4_;
        auVar218 = vsubps_avx(auVar48,auVar47);
        fVar206 = local_6e0._0_4_;
        fVar227 = local_6e0._4_4_;
        auVar49._4_4_ = fVar165 * fVar227;
        auVar49._0_4_ = fVar143 * fVar206;
        fVar253 = local_6e0._8_4_;
        auVar49._8_4_ = fVar189 * fVar253;
        fVar337 = local_6e0._12_4_;
        auVar49._12_4_ = fVar282 * fVar337;
        fVar293 = local_6e0._16_4_;
        auVar49._16_4_ = fVar166 * fVar293;
        fVar232 = local_6e0._20_4_;
        auVar49._20_4_ = fVar185 * fVar232;
        fVar188 = local_6e0._24_4_;
        auVar49._24_4_ = fVar186 * fVar188;
        auVar49._28_4_ = auVar333._28_4_;
        fVar268 = auVar23._0_4_;
        auVar366._0_4_ = fVar164 * fVar268;
        fVar233 = auVar23._4_4_;
        auVar366._4_4_ = fVar209 * fVar233;
        fVar262 = auVar23._8_4_;
        auVar366._8_4_ = fVar224 * fVar262;
        fVar339 = auVar23._12_4_;
        auVar366._12_4_ = fVar226 * fVar339;
        fVar230 = auVar23._16_4_;
        auVar366._16_4_ = fVar228 * fVar230;
        fVar303 = auVar23._20_4_;
        auVar366._20_4_ = fVar229 * fVar303;
        fVar162 = auVar23._24_4_;
        auVar366._24_4_ = fVar252 * fVar162;
        auVar366._28_4_ = 0;
        auVar24 = vsubps_avx(auVar366,auVar49);
        auVar50._4_4_ = fVar225 * fVar233;
        auVar50._0_4_ = fVar359 * fVar268;
        auVar50._8_4_ = fVar250 * fVar262;
        auVar50._12_4_ = fVar338 * fVar339;
        auVar50._16_4_ = fVar340 * fVar230;
        auVar50._20_4_ = fVar301 * fVar303;
        auVar50._24_4_ = fVar161 * fVar162;
        auVar50._28_4_ = auVar333._28_4_;
        auVar51._4_4_ = fVar227 * fVar223;
        auVar51._0_4_ = fVar206 * fVar316;
        auVar51._8_4_ = fVar253 * fVar248;
        auVar51._12_4_ = fVar337 * fVar266;
        auVar51._16_4_ = fVar293 * fVar341;
        auVar51._20_4_ = fVar232 * fVar299;
        auVar51._24_4_ = fVar188 * fVar160;
        auVar51._28_4_ = auVar374._28_4_;
        auVar32 = vsubps_avx(auVar51,auVar50);
        auVar33 = vsubps_avx(auVar180,auVar38);
        fVar210 = auVar32._28_4_ + auVar24._28_4_;
        auVar175._0_4_ = auVar32._0_4_ + auVar24._0_4_ * 0.0 + auVar218._0_4_ * 0.0;
        auVar175._4_4_ = auVar32._4_4_ + auVar24._4_4_ * 0.0 + auVar218._4_4_ * 0.0;
        auVar175._8_4_ = auVar32._8_4_ + auVar24._8_4_ * 0.0 + auVar218._8_4_ * 0.0;
        auVar175._12_4_ = auVar32._12_4_ + auVar24._12_4_ * 0.0 + auVar218._12_4_ * 0.0;
        auVar175._16_4_ = auVar32._16_4_ + auVar24._16_4_ * 0.0 + auVar218._16_4_ * 0.0;
        auVar175._20_4_ = auVar32._20_4_ + auVar24._20_4_ * 0.0 + auVar218._20_4_ * 0.0;
        auVar175._24_4_ = auVar32._24_4_ + auVar24._24_4_ * 0.0 + auVar218._24_4_ * 0.0;
        auVar175._28_4_ = fVar210 + auVar218._28_4_;
        fVar231 = auVar345._0_4_;
        fVar330 = auVar345._4_4_;
        auVar52._4_4_ = fVar330 * auVar38._4_4_;
        auVar52._0_4_ = fVar231 * auVar38._0_4_;
        fVar300 = auVar345._8_4_;
        auVar52._8_4_ = fVar300 * auVar38._8_4_;
        fVar302 = auVar345._12_4_;
        auVar52._12_4_ = fVar302 * auVar38._12_4_;
        fVar304 = auVar345._16_4_;
        auVar52._16_4_ = fVar304 * auVar38._16_4_;
        fVar305 = auVar345._20_4_;
        auVar52._20_4_ = fVar305 * auVar38._20_4_;
        fVar306 = auVar345._24_4_;
        auVar52._24_4_ = fVar306 * auVar38._24_4_;
        auVar52._28_4_ = fVar210;
        fVar210 = auVar33._0_4_;
        fVar245 = auVar33._4_4_;
        auVar53._4_4_ = auVar260._4_4_ * fVar245;
        auVar53._0_4_ = auVar260._0_4_ * fVar210;
        fVar264 = auVar33._8_4_;
        auVar53._8_4_ = auVar260._8_4_ * fVar264;
        fVar269 = auVar33._12_4_;
        auVar53._12_4_ = auVar260._12_4_ * fVar269;
        fVar329 = auVar33._16_4_;
        auVar53._16_4_ = auVar260._16_4_ * fVar329;
        fVar144 = auVar33._20_4_;
        auVar53._20_4_ = auVar260._20_4_ * fVar144;
        fVar163 = auVar33._24_4_;
        auVar53._24_4_ = auVar260._24_4_ * fVar163;
        auVar53._28_4_ = auVar32._28_4_;
        auVar345 = vsubps_avx(auVar53,auVar52);
        auVar24 = vsubps_avx(_local_6e0,auVar354);
        fVar187 = auVar24._0_4_;
        fVar190 = auVar24._4_4_;
        auVar54._4_4_ = fVar190 * auVar38._4_4_;
        auVar54._0_4_ = fVar187 * auVar38._0_4_;
        fVar191 = auVar24._8_4_;
        auVar54._8_4_ = fVar191 * auVar38._8_4_;
        fVar202 = auVar24._12_4_;
        auVar54._12_4_ = fVar202 * auVar38._12_4_;
        fVar203 = auVar24._16_4_;
        auVar54._16_4_ = fVar203 * auVar38._16_4_;
        fVar204 = auVar24._20_4_;
        auVar54._20_4_ = fVar204 * auVar38._20_4_;
        fVar205 = auVar24._24_4_;
        auVar54._24_4_ = fVar205 * auVar38._24_4_;
        auVar54._28_4_ = auVar38._28_4_;
        auVar55._4_4_ = auVar354._4_4_ * fVar245;
        auVar55._0_4_ = auVar354._0_4_ * fVar210;
        auVar55._8_4_ = auVar354._8_4_ * fVar264;
        auVar55._12_4_ = auVar354._12_4_ * fVar269;
        auVar55._16_4_ = auVar354._16_4_ * fVar329;
        auVar55._20_4_ = auVar354._20_4_ * fVar144;
        auVar55._24_4_ = auVar354._24_4_ * fVar163;
        auVar55._28_4_ = auVar218._28_4_;
        auVar218 = vsubps_avx(auVar54,auVar55);
        auVar56._4_4_ = auVar260._4_4_ * fVar190;
        auVar56._0_4_ = auVar260._0_4_ * fVar187;
        auVar56._8_4_ = auVar260._8_4_ * fVar191;
        auVar56._12_4_ = auVar260._12_4_ * fVar202;
        auVar56._16_4_ = auVar260._16_4_ * fVar203;
        auVar56._20_4_ = auVar260._20_4_ * fVar204;
        auVar56._24_4_ = auVar260._24_4_ * fVar205;
        auVar56._28_4_ = auVar38._28_4_;
        auVar57._4_4_ = auVar354._4_4_ * fVar330;
        auVar57._0_4_ = auVar354._0_4_ * fVar231;
        auVar57._8_4_ = auVar354._8_4_ * fVar300;
        auVar57._12_4_ = auVar354._12_4_ * fVar302;
        auVar57._16_4_ = auVar354._16_4_ * fVar304;
        auVar57._20_4_ = auVar354._20_4_ * fVar305;
        auVar57._24_4_ = auVar354._24_4_ * fVar306;
        auVar57._28_4_ = auVar354._28_4_;
        auVar354 = vsubps_avx(auVar57,auVar56);
        auVar242._0_4_ = auVar345._0_4_ * 0.0 + auVar354._0_4_ + auVar218._0_4_ * 0.0;
        auVar242._4_4_ = auVar345._4_4_ * 0.0 + auVar354._4_4_ + auVar218._4_4_ * 0.0;
        auVar242._8_4_ = auVar345._8_4_ * 0.0 + auVar354._8_4_ + auVar218._8_4_ * 0.0;
        auVar242._12_4_ = auVar345._12_4_ * 0.0 + auVar354._12_4_ + auVar218._12_4_ * 0.0;
        auVar242._16_4_ = auVar345._16_4_ * 0.0 + auVar354._16_4_ + auVar218._16_4_ * 0.0;
        auVar242._20_4_ = auVar345._20_4_ * 0.0 + auVar354._20_4_ + auVar218._20_4_ * 0.0;
        auVar242._24_4_ = auVar345._24_4_ * 0.0 + auVar354._24_4_ + auVar218._24_4_ * 0.0;
        auVar242._28_4_ = auVar354._28_4_ + auVar354._28_4_ + auVar218._28_4_;
        auVar354 = vmaxps_avx(auVar175,auVar242);
        auVar354 = vcmpps_avx(auVar354,ZEXT832(0) << 0x20,2);
        auVar172 = vpackssdw_avx(auVar354._0_16_,auVar354._16_16_);
        auVar172 = vpand_avx(auVar172,_local_640);
        auVar197 = vpmovsxwd_avx(auVar172);
        auVar198 = vpunpckhwd_avx(auVar172,auVar172);
        auVar219._16_16_ = auVar198;
        auVar219._0_16_ = auVar197;
        if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar219 >> 0x7f,0) == '\0') &&
              (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar198 >> 0x3f,0) == '\0') &&
            (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar198[0xf]) {
LAB_0107bd58:
          auVar222 = ZEXT3264(auVar219);
          auVar184 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          auVar357 = ZEXT3264(local_540);
          auVar159 = ZEXT3264(local_560);
        }
        else {
          auVar58._4_4_ = fVar245 * fVar223;
          auVar58._0_4_ = fVar210 * fVar316;
          auVar58._8_4_ = fVar264 * fVar248;
          auVar58._12_4_ = fVar269 * fVar266;
          auVar58._16_4_ = fVar329 * fVar341;
          auVar58._20_4_ = fVar144 * fVar299;
          auVar58._24_4_ = fVar163 * fVar160;
          auVar58._28_4_ = auVar198._12_4_;
          auVar346._0_4_ = fVar231 * fVar143;
          auVar346._4_4_ = fVar330 * fVar165;
          auVar346._8_4_ = fVar300 * fVar189;
          auVar346._12_4_ = fVar302 * fVar282;
          auVar346._16_4_ = fVar304 * fVar166;
          auVar346._20_4_ = fVar305 * fVar185;
          auVar346._24_4_ = fVar306 * fVar186;
          auVar346._28_4_ = 0;
          auVar354 = vsubps_avx(auVar346,auVar58);
          auVar59._4_4_ = fVar190 * fVar165;
          auVar59._0_4_ = fVar187 * fVar143;
          auVar59._8_4_ = fVar191 * fVar189;
          auVar59._12_4_ = fVar202 * fVar282;
          auVar59._16_4_ = fVar203 * fVar166;
          auVar59._20_4_ = fVar204 * fVar185;
          auVar59._24_4_ = fVar205 * fVar186;
          auVar59._28_4_ = auVar240._28_4_;
          auVar60._4_4_ = fVar245 * fVar233;
          auVar60._0_4_ = fVar210 * fVar268;
          auVar60._8_4_ = fVar264 * fVar262;
          auVar60._12_4_ = fVar269 * fVar339;
          auVar60._16_4_ = fVar329 * fVar230;
          auVar60._20_4_ = fVar144 * fVar303;
          auVar60._24_4_ = fVar163 * fVar162;
          auVar60._28_4_ = auVar33._28_4_;
          auVar38 = vsubps_avx(auVar60,auVar59);
          auVar61._4_4_ = fVar330 * fVar233;
          auVar61._0_4_ = fVar231 * fVar268;
          auVar61._8_4_ = fVar300 * fVar262;
          auVar61._12_4_ = fVar302 * fVar339;
          auVar61._16_4_ = fVar304 * fVar230;
          auVar61._20_4_ = fVar305 * fVar303;
          auVar61._24_4_ = fVar306 * fVar162;
          auVar61._28_4_ = auVar175._28_4_;
          auVar62._4_4_ = fVar190 * fVar223;
          auVar62._0_4_ = fVar187 * fVar316;
          auVar62._8_4_ = fVar191 * fVar248;
          auVar62._12_4_ = fVar202 * fVar266;
          auVar62._16_4_ = fVar203 * fVar341;
          auVar62._20_4_ = fVar204 * fVar299;
          auVar62._24_4_ = fVar205 * fVar160;
          auVar62._28_4_ = auVar289._28_4_;
          auVar218 = vsubps_avx(auVar62,auVar61);
          auVar290._0_4_ = auVar354._0_4_ * 0.0 + auVar218._0_4_ + auVar38._0_4_ * 0.0;
          auVar290._4_4_ = auVar354._4_4_ * 0.0 + auVar218._4_4_ + auVar38._4_4_ * 0.0;
          auVar290._8_4_ = auVar354._8_4_ * 0.0 + auVar218._8_4_ + auVar38._8_4_ * 0.0;
          auVar290._12_4_ = auVar354._12_4_ * 0.0 + auVar218._12_4_ + auVar38._12_4_ * 0.0;
          auVar290._16_4_ = auVar354._16_4_ * 0.0 + auVar218._16_4_ + auVar38._16_4_ * 0.0;
          auVar290._20_4_ = auVar354._20_4_ * 0.0 + auVar218._20_4_ + auVar38._20_4_ * 0.0;
          auVar290._24_4_ = auVar354._24_4_ * 0.0 + auVar218._24_4_ + auVar38._24_4_ * 0.0;
          auVar290._28_4_ = auVar289._28_4_ + auVar218._28_4_ + auVar175._28_4_;
          auVar260 = vrcpps_avx(auVar290);
          fVar268 = auVar260._0_4_;
          fVar210 = auVar260._4_4_;
          auVar63._4_4_ = auVar290._4_4_ * fVar210;
          auVar63._0_4_ = auVar290._0_4_ * fVar268;
          fVar223 = auVar260._8_4_;
          auVar63._8_4_ = auVar290._8_4_ * fVar223;
          fVar233 = auVar260._12_4_;
          auVar63._12_4_ = auVar290._12_4_ * fVar233;
          fVar245 = auVar260._16_4_;
          auVar63._16_4_ = auVar290._16_4_ * fVar245;
          fVar248 = auVar260._20_4_;
          auVar63._20_4_ = auVar290._20_4_ * fVar248;
          fVar262 = auVar260._24_4_;
          auVar63._24_4_ = auVar290._24_4_ * fVar262;
          auVar63._28_4_ = auVar33._28_4_;
          auVar347._8_4_ = 0x3f800000;
          auVar347._0_8_ = &DAT_3f8000003f800000;
          auVar347._12_4_ = 0x3f800000;
          auVar347._16_4_ = 0x3f800000;
          auVar347._20_4_ = 0x3f800000;
          auVar347._24_4_ = 0x3f800000;
          auVar347._28_4_ = 0x3f800000;
          auVar240 = vsubps_avx(auVar347,auVar63);
          fVar268 = auVar240._0_4_ * fVar268 + fVar268;
          fVar210 = auVar240._4_4_ * fVar210 + fVar210;
          fVar223 = auVar240._8_4_ * fVar223 + fVar223;
          fVar233 = auVar240._12_4_ * fVar233 + fVar233;
          fVar245 = auVar240._16_4_ * fVar245 + fVar245;
          fVar248 = auVar240._20_4_ * fVar248 + fVar248;
          fVar262 = auVar240._24_4_ * fVar262 + fVar262;
          auVar64._4_4_ =
               (auVar354._4_4_ * fVar227 + auVar38._4_4_ * fVar225 + auVar218._4_4_ * fVar209) *
               fVar210;
          auVar64._0_4_ =
               (auVar354._0_4_ * fVar206 + auVar38._0_4_ * fVar359 + auVar218._0_4_ * fVar164) *
               fVar268;
          auVar64._8_4_ =
               (auVar354._8_4_ * fVar253 + auVar38._8_4_ * fVar250 + auVar218._8_4_ * fVar224) *
               fVar223;
          auVar64._12_4_ =
               (auVar354._12_4_ * fVar337 + auVar38._12_4_ * fVar338 + auVar218._12_4_ * fVar226) *
               fVar233;
          auVar64._16_4_ =
               (auVar354._16_4_ * fVar293 + auVar38._16_4_ * fVar340 + auVar218._16_4_ * fVar228) *
               fVar245;
          auVar64._20_4_ =
               (auVar354._20_4_ * fVar232 + auVar38._20_4_ * fVar301 + auVar218._20_4_ * fVar229) *
               fVar248;
          auVar64._24_4_ =
               (auVar354._24_4_ * fVar188 + auVar38._24_4_ * fVar161 + auVar218._24_4_ * fVar252) *
               fVar262;
          auVar64._28_4_ = local_6e0._28_4_ + auVar23._28_4_ + auVar180._28_4_;
          auVar197 = vpermilps_avx(ZEXT416((uint)local_780),0);
          auVar220._16_16_ = auVar197;
          auVar220._0_16_ = auVar197;
          auVar180 = vcmpps_avx(auVar220,auVar64,2);
          fVar316 = (ray->super_RayK<1>).tfar;
          auVar258._4_4_ = fVar316;
          auVar258._0_4_ = fVar316;
          auVar258._8_4_ = fVar316;
          auVar258._12_4_ = fVar316;
          auVar258._16_4_ = fVar316;
          auVar258._20_4_ = fVar316;
          auVar258._24_4_ = fVar316;
          auVar258._28_4_ = fVar316;
          auVar354 = vcmpps_avx(auVar64,auVar258,2);
          auVar180 = vandps_avx(auVar354,auVar180);
          auVar197 = vpackssdw_avx(auVar180._0_16_,auVar180._16_16_);
          auVar172 = vpand_avx(auVar172,auVar197);
          auVar197 = vpmovsxwd_avx(auVar172);
          auVar198 = vpshufd_avx(auVar172,0xee);
          auVar198 = vpmovsxwd_avx(auVar198);
          auVar219._16_16_ = auVar198;
          auVar219._0_16_ = auVar197;
          if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar219 >> 0x7f,0) == '\0') &&
                (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar198 >> 0x3f,0) == '\0') &&
              (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar198[0xf]) goto LAB_0107bd58;
          auVar180 = vcmpps_avx(ZEXT832(0) << 0x20,auVar290,4);
          auVar197 = vpackssdw_avx(auVar180._0_16_,auVar180._16_16_);
          auVar172 = vpand_avx(auVar172,auVar197);
          auVar197 = vpmovsxwd_avx(auVar172);
          auVar172 = vpunpckhwd_avx(auVar172,auVar172);
          auVar222 = ZEXT1664(auVar172);
          auVar276._16_16_ = auVar172;
          auVar276._0_16_ = auVar197;
          auVar184 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          auVar357 = ZEXT3264(local_540);
          auVar159 = ZEXT3264(local_560);
          if ((((((((auVar276 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar276 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar276 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar276 >> 0x7f,0) != '\0') ||
                (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar172 >> 0x3f,0) != '\0') ||
              (auVar276 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar172[0xf] < '\0') {
            auVar221._0_4_ = auVar175._0_4_ * fVar268;
            auVar221._4_4_ = auVar175._4_4_ * fVar210;
            auVar221._8_4_ = auVar175._8_4_ * fVar223;
            auVar221._12_4_ = auVar175._12_4_ * fVar233;
            auVar221._16_4_ = auVar175._16_4_ * fVar245;
            auVar221._20_4_ = auVar175._20_4_ * fVar248;
            auVar221._24_4_ = auVar175._24_4_ * fVar262;
            auVar221._28_4_ = 0;
            auVar65._4_4_ = auVar242._4_4_ * fVar210;
            auVar65._0_4_ = auVar242._0_4_ * fVar268;
            auVar65._8_4_ = auVar242._8_4_ * fVar223;
            auVar65._12_4_ = auVar242._12_4_ * fVar233;
            auVar65._16_4_ = auVar242._16_4_ * fVar245;
            auVar65._20_4_ = auVar242._20_4_ * fVar248;
            auVar65._24_4_ = auVar242._24_4_ * fVar262;
            auVar65._28_4_ = auVar240._28_4_ + auVar260._28_4_;
            auVar259._8_4_ = 0x3f800000;
            auVar259._0_8_ = &DAT_3f8000003f800000;
            auVar259._12_4_ = 0x3f800000;
            auVar259._16_4_ = 0x3f800000;
            auVar259._20_4_ = 0x3f800000;
            auVar259._24_4_ = 0x3f800000;
            auVar259._28_4_ = 0x3f800000;
            auVar180 = vsubps_avx(auVar259,auVar221);
            auVar180 = vblendvps_avx(auVar180,auVar221,auVar34);
            auVar357 = ZEXT3264(auVar180);
            auVar180 = vsubps_avx(auVar259,auVar65);
            auVar222 = ZEXT3264(auVar180);
            _local_280 = vblendvps_avx(auVar180,auVar65,auVar34);
            auVar184 = ZEXT3264(auVar276);
            auVar159 = ZEXT3264(auVar64);
          }
        }
        auVar350 = ZEXT3264(_local_760);
        auVar323 = ZEXT3264(auVar318);
        auVar354 = auVar357._0_32_;
        auVar180 = auVar159._0_32_;
        auVar260 = auVar184._0_32_;
        auVar292 = ZEXT3264(local_520);
        if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar260 >> 0x7f,0) != '\0') ||
              (auVar184 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar260 >> 0xbf,0) != '\0') ||
            (auVar184 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar184[0x1f] < '\0') {
          auVar38 = vsubps_avx(_local_6c0,_local_820);
          fVar359 = (float)local_820._0_4_ + auVar357._0_4_ * auVar38._0_4_;
          fVar206 = (float)local_820._4_4_ + auVar357._4_4_ * auVar38._4_4_;
          fVar268 = fStack_818 + auVar357._8_4_ * auVar38._8_4_;
          fVar210 = fStack_814 + auVar357._12_4_ * auVar38._12_4_;
          fVar223 = fStack_810 + auVar357._16_4_ * auVar38._16_4_;
          fVar225 = fStack_80c + auVar357._20_4_ * auVar38._20_4_;
          fVar227 = fStack_808 + auVar357._24_4_ * auVar38._24_4_;
          fVar233 = auVar38._28_4_ + 0.0;
          fVar316 = local_7d8->depth_scale;
          auVar66._4_4_ = (fVar206 + fVar206) * fVar316;
          auVar66._0_4_ = (fVar359 + fVar359) * fVar316;
          auVar66._8_4_ = (fVar268 + fVar268) * fVar316;
          auVar66._12_4_ = (fVar210 + fVar210) * fVar316;
          auVar66._16_4_ = (fVar223 + fVar223) * fVar316;
          auVar66._20_4_ = (fVar225 + fVar225) * fVar316;
          auVar66._24_4_ = (fVar227 + fVar227) * fVar316;
          auVar66._28_4_ = fVar233 + fVar233;
          auVar38 = vcmpps_avx(auVar180,auVar66,6);
          auVar23 = auVar260 & auVar38;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0x7f,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0xbf,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar23[0x1f] < '\0') {
            auVar260 = vandps_avx(auVar38,auVar260);
            local_280._0_4_ = (float)local_280._0_4_ + (float)local_280._0_4_ + -1.0;
            local_280._4_4_ = (float)local_280._4_4_ + (float)local_280._4_4_ + -1.0;
            uStack_278._0_4_ = (float)uStack_278 + (float)uStack_278 + -1.0;
            uStack_278._4_4_ = uStack_278._4_4_ + uStack_278._4_4_ + -1.0;
            uStack_270._0_4_ = (float)uStack_270 + (float)uStack_270 + -1.0;
            uStack_270._4_4_ = uStack_270._4_4_ + uStack_270._4_4_ + -1.0;
            uStack_268._0_4_ = (float)uStack_268 + (float)uStack_268 + -1.0;
            uStack_268._4_4_ = uStack_268._4_4_ + uStack_268._4_4_ + -1.0;
            local_3e0 = auVar354;
            auVar131 = _local_280;
            auVar38 = _local_280;
            local_3c0 = (float)local_280._0_4_;
            fStack_3bc = (float)local_280._4_4_;
            fStack_3b8 = (float)uStack_278;
            fStack_3b4 = uStack_278._4_4_;
            fStack_3b0 = (float)uStack_270;
            fStack_3ac = uStack_270._4_4_;
            fStack_3a8 = (float)uStack_268;
            fStack_3a4 = uStack_268._4_4_;
            local_3a0 = auVar180;
            local_380 = 0;
            local_37c = uVar16;
            uStack_7e8 = auVar238._8_8_;
            local_370 = auVar238._0_8_;
            uStack_368 = uStack_7e8;
            uStack_5c8 = auVar365._8_8_;
            local_360 = auVar365._0_8_;
            uStack_358 = uStack_5c8;
            uStack_5d8 = auVar373._8_8_;
            local_350 = auVar373._0_8_;
            uStack_348 = uStack_5d8;
            uStack_5e8 = auVar344._8_8_;
            local_340._8_8_ = uStack_5e8;
            local_340._0_8_ = auVar344._0_8_;
            local_320 = auVar260;
            _local_280 = auVar38;
            if ((pGVar17->mask & (ray->super_RayK<1>).mask) != 0) {
              local_500 = auVar260;
              auVar195._0_4_ = 1.0 / (float)(int)uVar16;
              auVar195._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar172 = vshufps_avx(auVar195,auVar195,0);
              local_300[0] = auVar172._0_4_ * (auVar357._0_4_ + 0.0);
              local_300[1] = auVar172._4_4_ * (auVar357._4_4_ + 1.0);
              local_300[2] = auVar172._8_4_ * (auVar357._8_4_ + 2.0);
              local_300[3] = auVar172._12_4_ * (auVar357._12_4_ + 3.0);
              fStack_2f0 = auVar172._0_4_ * (auVar357._16_4_ + 4.0);
              fStack_2ec = auVar172._4_4_ * (auVar357._20_4_ + 5.0);
              fStack_2e8 = auVar172._8_4_ * (auVar357._24_4_ + 6.0);
              fStack_2e4 = auVar357._28_4_ + 7.0;
              uStack_270 = auVar131._16_8_;
              uStack_268 = auVar38._24_8_;
              local_2e0 = local_280;
              uStack_2d8 = uStack_278;
              uStack_2d0 = uStack_270;
              uStack_2c8 = uStack_268;
              local_2c0 = auVar180;
              auVar176._8_4_ = 0x7f800000;
              auVar176._0_8_ = 0x7f8000007f800000;
              auVar176._12_4_ = 0x7f800000;
              auVar176._16_4_ = 0x7f800000;
              auVar176._20_4_ = 0x7f800000;
              auVar176._24_4_ = 0x7f800000;
              auVar176._28_4_ = 0x7f800000;
              auVar38 = vblendvps_avx(auVar176,auVar180,auVar260);
              auVar23 = vshufps_avx(auVar38,auVar38,0xb1);
              auVar23 = vminps_avx(auVar38,auVar23);
              auVar218 = vshufpd_avx(auVar23,auVar23,5);
              auVar23 = vminps_avx(auVar23,auVar218);
              auVar218 = vperm2f128_avx(auVar23,auVar23,1);
              auVar23 = vminps_avx(auVar23,auVar218);
              auVar38 = vcmpps_avx(auVar38,auVar23,0);
              auVar23 = auVar260 & auVar38;
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0xbf,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                auVar260 = vandps_avx(auVar38,auVar260);
              }
              uVar135 = vmovmskps_avx(auVar260);
              uVar21 = 0;
              if (uVar135 != 0) {
                for (; (uVar135 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              auVar141 = (undefined1  [8])(ulong)uVar21;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar316 = local_300[(long)auVar141];
                fVar206 = 1.0 - fVar316;
                fVar359 = fVar316 * 3.0;
                auVar172 = ZEXT416((uint)((fVar206 * -2.0 * fVar316 + fVar316 * fVar316) * 0.5));
                auVar172 = vshufps_avx(auVar172,auVar172,0);
                auVar197 = ZEXT416((uint)(((fVar206 + fVar206) * (fVar359 + 2.0) +
                                          fVar206 * fVar206 * -3.0) * 0.5));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar198 = ZEXT416((uint)(((fVar316 + fVar316) * (fVar359 + -5.0) +
                                          fVar316 * fVar359) * 0.5));
                auVar198 = vshufps_avx(auVar198,auVar198,0);
                fVar359 = *(float *)((long)&local_2e0 + (long)auVar141 * 4);
                auVar215 = ZEXT416((uint)((fVar316 * (fVar206 + fVar206) - fVar206 * fVar206) * 0.5)
                                  );
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar171._0_4_ =
                     auVar215._0_4_ * fVar234 +
                     auVar198._0_4_ * fVar362 + auVar172._0_4_ * fVar342 + auVar197._0_4_ * fVar371;
                auVar171._4_4_ =
                     auVar215._4_4_ * fVar246 +
                     auVar198._4_4_ * fVar367 + auVar172._4_4_ * fVar351 + auVar197._4_4_ * fVar376;
                auVar171._8_4_ =
                     auVar215._8_4_ * auVar238._8_4_ +
                     auVar198._8_4_ * auVar365._8_4_ +
                     auVar172._8_4_ * auVar344._8_4_ + auVar197._8_4_ * auVar373._8_4_;
                auVar171._12_4_ =
                     auVar215._12_4_ * auVar238._12_4_ +
                     auVar198._12_4_ * auVar365._12_4_ +
                     auVar172._12_4_ * auVar344._12_4_ + auVar197._12_4_ * auVar373._12_4_;
                auVar222 = ZEXT464((uint)*(float *)(local_2c0 + (long)auVar141 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + (long)auVar141 * 4);
                uVar13 = vmovlps_avx(auVar171);
                *(undefined8 *)&(ray->Ng).field_0 = uVar13;
                fVar206 = (float)vextractps_avx(auVar171,2);
                (ray->Ng).field_0.field_0.z = fVar206;
                ray->u = fVar316;
                ray->v = fVar359;
                ray->primID = uVar136;
                ray->geomID = uVar138;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                uStack_638 = uStack_5c8;
                local_640 = (undefined1  [8])auVar365._0_8_;
                auStack_6d8 = (undefined1  [8])uStack_5d8;
                local_6e0 = (undefined1  [8])auVar373._0_8_;
                uStack_658 = uStack_5e8;
                local_660 = (undefined1  [8])auVar344._0_8_;
                local_540 = auVar354;
                local_560 = auVar180;
                _local_5f0 = auVar25;
                _local_5e0 = auVar26;
                _local_5d0 = auVar27;
                do {
                  local_704 = local_300[(long)auVar141];
                  local_700 = *(undefined4 *)((long)&local_2e0 + (long)auVar141 * 4);
                  local_6c0._0_4_ = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + (long)auVar141 * 4);
                  fVar359 = 1.0 - local_704;
                  fVar316 = local_704 * 3.0;
                  auVar172 = ZEXT416((uint)((fVar359 * -2.0 * local_704 + local_704 * local_704) *
                                           0.5));
                  auVar172 = vshufps_avx(auVar172,auVar172,0);
                  auVar197 = ZEXT416((uint)(((fVar359 + fVar359) * (fVar316 + 2.0) +
                                            fVar359 * fVar359 * -3.0) * 0.5));
                  auVar197 = vshufps_avx(auVar197,auVar197,0);
                  auVar198 = ZEXT416((uint)(((local_704 + local_704) * (fVar316 + -5.0) +
                                            local_704 * fVar316) * 0.5));
                  auVar198 = vshufps_avx(auVar198,auVar198,0);
                  auVar215 = ZEXT416((uint)((local_704 * (fVar359 + fVar359) - fVar359 * fVar359) *
                                           0.5));
                  auVar215 = vshufps_avx(auVar215,auVar215,0);
                  auVar217._0_4_ = auVar215._0_4_ * (float)local_7f0._0_4_;
                  auVar217._4_4_ = auVar215._4_4_ * (float)local_7f0._4_4_;
                  auVar217._8_4_ = auVar215._8_4_ * (float)uStack_7e8;
                  auVar217._12_4_ = auVar215._12_4_ * uStack_7e8._4_4_;
                  auVar222 = ZEXT1664(auVar217);
                  auVar200._0_4_ =
                       auVar217._0_4_ +
                       auVar198._0_4_ * (float)local_640._0_4_ +
                       auVar172._0_4_ * (float)local_660._0_4_ +
                       auVar197._0_4_ * (float)local_6e0._0_4_;
                  auVar200._4_4_ =
                       auVar217._4_4_ +
                       auVar198._4_4_ * (float)local_640._4_4_ +
                       auVar172._4_4_ * (float)local_660._4_4_ +
                       auVar197._4_4_ * (float)local_6e0._4_4_;
                  auVar200._8_4_ =
                       auVar217._8_4_ +
                       auVar198._8_4_ * (float)uStack_638 +
                       auVar172._8_4_ * (float)uStack_658 +
                       auVar197._8_4_ * (float)auStack_6d8._0_4_;
                  auVar200._12_4_ =
                       auVar217._12_4_ +
                       auVar198._12_4_ * uStack_638._4_4_ +
                       auVar172._12_4_ * uStack_658._4_4_ +
                       auVar197._12_4_ * (float)auStack_6d8._4_4_;
                  local_7d0.context = context->user;
                  local_710 = vmovlps_avx(auVar200);
                  local_708 = vextractps_avx(auVar200,2);
                  local_6fc = (int)local_828;
                  local_6f8 = (int)local_830;
                  local_6f4 = (local_7d0.context)->instID[0];
                  local_6f0 = (local_7d0.context)->instPrimID[0];
                  local_834 = -1;
                  local_7d0.valid = &local_834;
                  local_7d0.geometryUserPtr = pGVar17->userPtr;
                  local_7d0.ray = (RTCRayN *)ray;
                  local_7d0.hit = (RTCHitN *)&local_710;
                  local_7d0.N = 1;
                  local_820 = auVar141;
                  if (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0107bfe7:
                    p_Var20 = context->args->filter;
                    if (p_Var20 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar17->field_8).field_0x2 & 0x40) != 0)) {
                        auVar222 = ZEXT1664(auVar222._0_16_);
                        (*p_Var20)(&local_7d0);
                        auVar323 = ZEXT3264(_local_740);
                        auVar350 = ZEXT3264(_local_760);
                        auVar159 = ZEXT3264(local_560);
                        auVar357 = ZEXT3264(local_540);
                        auVar141 = local_820;
                      }
                      if (*local_7d0.valid == 0) goto LAB_0107c0b2;
                    }
                    (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_7d0.hit;
                    (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_7d0.hit + 4);
                    (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_7d0.hit + 8);
                    *(float *)((long)local_7d0.ray + 0x3c) = *(float *)(local_7d0.hit + 0xc);
                    *(float *)((long)local_7d0.ray + 0x40) = *(float *)(local_7d0.hit + 0x10);
                    *(float *)((long)local_7d0.ray + 0x44) = *(float *)(local_7d0.hit + 0x14);
                    *(float *)((long)local_7d0.ray + 0x48) = *(float *)(local_7d0.hit + 0x18);
                    *(float *)((long)local_7d0.ray + 0x4c) = *(float *)(local_7d0.hit + 0x1c);
                    *(float *)((long)local_7d0.ray + 0x50) = *(float *)(local_7d0.hit + 0x20);
                  }
                  else {
                    auVar222 = ZEXT1664(auVar217);
                    (*pGVar17->intersectionFilterN)(&local_7d0);
                    auVar323 = ZEXT3264(_local_740);
                    auVar350 = ZEXT3264(_local_760);
                    auVar159 = ZEXT3264(local_560);
                    auVar357 = ZEXT3264(local_540);
                    auVar141 = local_820;
                    if (*local_7d0.valid != 0) goto LAB_0107bfe7;
LAB_0107c0b2:
                    (ray->super_RayK<1>).tfar = (float)local_6c0._0_4_;
                  }
                  auVar318 = auVar323._0_32_;
                  auVar354 = auVar357._0_32_;
                  *(undefined4 *)(local_500 + (long)auVar141 * 4) = 0;
                  auVar23 = local_500;
                  fVar316 = (ray->super_RayK<1>).tfar;
                  auVar158._4_4_ = fVar316;
                  auVar158._0_4_ = fVar316;
                  auVar158._8_4_ = fVar316;
                  auVar158._12_4_ = fVar316;
                  auVar158._16_4_ = fVar316;
                  auVar158._20_4_ = fVar316;
                  auVar158._24_4_ = fVar316;
                  auVar158._28_4_ = fVar316;
                  auVar180 = auVar159._0_32_;
                  auVar38 = vcmpps_avx(auVar180,auVar158,2);
                  auVar260 = vandps_avx(auVar38,local_500);
                  local_500 = auVar260;
                  auVar23 = auVar23 & auVar38;
                  bVar116 = (auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar117 = (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar115 = (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar114 = SUB321(auVar23 >> 0x7f,0) != '\0';
                  bVar113 = (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar112 = SUB321(auVar23 >> 0xbf,0) != '\0';
                  bVar111 = (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar110 = auVar23[0x1f] < '\0';
                  auVar292 = ZEXT3264(local_520);
                  if (((((((bVar116 || bVar117) || bVar115) || bVar114) || bVar113) || bVar112) ||
                      bVar111) || bVar110) {
                    auVar183._8_4_ = 0x7f800000;
                    auVar183._0_8_ = 0x7f8000007f800000;
                    auVar183._12_4_ = 0x7f800000;
                    auVar183._16_4_ = 0x7f800000;
                    auVar183._20_4_ = 0x7f800000;
                    auVar183._24_4_ = 0x7f800000;
                    auVar183._28_4_ = 0x7f800000;
                    auVar38 = vblendvps_avx(auVar183,auVar180,auVar260);
                    auVar23 = vshufps_avx(auVar38,auVar38,0xb1);
                    auVar23 = vminps_avx(auVar38,auVar23);
                    auVar218 = vshufpd_avx(auVar23,auVar23,5);
                    auVar23 = vminps_avx(auVar23,auVar218);
                    auVar218 = vperm2f128_avx(auVar23,auVar23,1);
                    auVar222 = ZEXT3264(auVar218);
                    auVar23 = vminps_avx(auVar23,auVar218);
                    auVar38 = vcmpps_avx(auVar38,auVar23,0);
                    auVar23 = auVar260 & auVar38;
                    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar23 >> 0x7f,0) != '\0') ||
                          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0xbf,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar23[0x1f] < '\0') {
                      auVar260 = vandps_avx(auVar38,auVar260);
                    }
                    uVar136 = vmovmskps_avx(auVar260);
                    uVar138 = 0;
                    if (uVar136 != 0) {
                      for (; (uVar136 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                      }
                    }
                    auVar141 = (undefined1  [8])(ulong)uVar138;
                  }
                  auVar25 = _local_5f0;
                  auVar26 = _local_5e0;
                  auVar27 = _local_5d0;
                } while (((((((bVar116 || bVar117) || bVar115) || bVar114) || bVar113) || bVar112)
                         || bVar111) || bVar110);
              }
            }
          }
        }
      }
      _local_5d0 = auVar27;
      _local_5e0 = auVar26;
      _local_5f0 = auVar25;
      auVar184 = ZEXT1664(_local_7a0);
      local_560 = auVar180;
      local_540 = auVar354;
      if (8 < (int)uVar16) {
        _local_740 = auVar318;
        auVar172 = vpshufd_avx(ZEXT416(uVar16),0);
        local_240 = auVar172._0_4_;
        fStack_23c = auVar172._4_4_;
        fStack_238 = auVar172._8_4_;
        fStack_234 = auVar172._12_4_;
        auVar172 = vshufps_avx(_local_7a0,_local_7a0,0);
        local_c0._16_16_ = auVar172;
        local_c0._0_16_ = auVar172;
        auVar120._4_4_ = fStack_77c;
        auVar120._0_4_ = local_780;
        auVar120._8_4_ = fStack_778;
        auVar120._12_4_ = fStack_774;
        auVar172 = vpermilps_avx(auVar120,0);
        local_e0._16_16_ = auVar172;
        local_e0._0_16_ = auVar172;
        auVar149._0_4_ = 1.0 / (float)local_420._0_4_;
        auVar149._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar172 = vshufps_avx(auVar149,auVar149,0);
        register0x00001210 = auVar172;
        _local_100 = auVar172;
        auVar159 = ZEXT3264(_local_100);
        lVar139 = 8;
        fVar316 = (float)local_620._0_4_;
        fVar359 = (float)local_620._4_4_;
        fVar206 = fStack_618;
        fVar268 = fStack_614;
        fVar210 = fStack_610;
        fVar223 = fStack_60c;
        fVar225 = fStack_608;
        fVar227 = fStack_604;
        do {
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar139 * 4 + lVar22);
          fVar266 = *(float *)*pauVar9;
          fVar338 = *(float *)(*pauVar9 + 4);
          fVar337 = *(float *)(*pauVar9 + 8);
          fVar339 = *(float *)(*pauVar9 + 0xc);
          fVar269 = *(float *)(*pauVar9 + 0x10);
          fVar341 = *(float *)(*pauVar9 + 0x14);
          fVar340 = *(float *)(*pauVar9 + 0x18);
          auVar130 = *pauVar9;
          pfVar1 = (float *)(lVar22 + 0x22307f0 + lVar139 * 4);
          fVar293 = *pfVar1;
          fVar230 = pfVar1[1];
          fVar329 = pfVar1[2];
          fVar299 = pfVar1[3];
          fVar301 = pfVar1[4];
          fVar232 = pfVar1[5];
          fVar303 = pfVar1[6];
          pauVar10 = (undefined1 (*) [32])(lVar22 + 0x2230c74 + lVar139 * 4);
          fVar144 = *(float *)*pauVar10;
          fVar160 = *(float *)(*pauVar10 + 4);
          fVar161 = *(float *)(*pauVar10 + 8);
          fVar188 = *(float *)(*pauVar10 + 0xc);
          fVar162 = *(float *)(*pauVar10 + 0x10);
          fVar163 = *(float *)(*pauVar10 + 0x14);
          fVar164 = *(float *)(*pauVar10 + 0x18);
          auVar129 = *(undefined1 (*) [28])*pauVar10;
          pfVar1 = (float *)(lVar22 + 0x22310f8 + lVar139 * 4);
          local_5a0 = *pfVar1;
          fStack_59c = pfVar1[1];
          fStack_598 = pfVar1[2];
          fStack_594 = pfVar1[3];
          fStack_590 = pfVar1[4];
          fStack_58c = pfVar1[5];
          fStack_588 = pfVar1[6];
          fStack_584 = pfVar1[7];
          fVar224 = auVar222._28_4_;
          _local_580 = *pauVar10;
          auVar23 = _local_580;
          fVar209 = fVar224 + pfVar1[7];
          fStack_764 = fVar224 + fVar224 + auVar159._28_4_;
          fVar233 = auVar292._0_4_;
          fVar245 = auVar292._4_4_;
          fVar248 = auVar292._8_4_;
          fVar250 = auVar292._12_4_;
          fVar253 = auVar292._16_4_;
          fVar262 = auVar292._20_4_;
          fVar264 = auVar292._24_4_;
          fVar330 = fVar224 + fVar224 + auVar184._28_4_;
          local_6c0._0_4_ =
               (float)local_400._0_4_ * fVar266 +
               auVar350._0_4_ * fVar293 +
               (float)local_6a0._0_4_ * fVar144 + (float)local_440._0_4_ * local_5a0;
          local_6c0._4_4_ =
               (float)local_400._4_4_ * fVar338 +
               auVar350._4_4_ * fVar230 +
               (float)local_6a0._4_4_ * fVar160 + (float)local_440._4_4_ * fStack_59c;
          fStack_6b8 = fStack_3f8 * fVar337 +
                       auVar350._8_4_ * fVar329 + fStack_698 * fVar161 + fStack_438 * fStack_598;
          fStack_6b4 = fStack_3f4 * fVar339 +
                       auVar350._12_4_ * fVar299 + fStack_694 * fVar188 + fStack_434 * fStack_594;
          register0x00001450 =
               fStack_3f0 * fVar269 +
               auVar350._16_4_ * fVar301 + fStack_690 * fVar162 + fStack_430 * fStack_590;
          register0x00001454 =
               fStack_3ec * fVar341 +
               auVar350._20_4_ * fVar232 + fStack_68c * fVar163 + fStack_42c * fStack_58c;
          register0x00001458 =
               fStack_3e8 * fVar340 +
               auVar350._24_4_ * fVar303 + fStack_688 * fVar164 + fStack_428 * fStack_588;
          register0x0000145c = fVar209 + fStack_764;
          local_7a0._0_4_ =
               fVar293 * fVar233 + fVar316 * fVar144 + (float)local_120._0_4_ * local_5a0 +
               (float)local_1e0._0_4_ * fVar266;
          local_7a0._4_4_ =
               fVar230 * fVar245 + fVar359 * fVar160 + (float)local_120._4_4_ * fStack_59c +
               (float)local_1e0._4_4_ * fVar338;
          fStack_798 = fVar329 * fVar248 + fVar206 * fVar161 + fStack_118 * fStack_598 +
                       fStack_1d8 * fVar337;
          fStack_794 = fVar299 * fVar250 + fVar268 * fVar188 + fStack_114 * fStack_594 +
                       fStack_1d4 * fVar339;
          register0x000012d0 =
               fVar301 * fVar253 + fVar210 * fVar162 + fStack_110 * fStack_590 +
               fStack_1d0 * fVar269;
          register0x000012d4 =
               fVar232 * fVar262 + fVar223 * fVar163 + fStack_10c * fStack_58c +
               fStack_1cc * fVar341;
          register0x000012d8 =
               fVar303 * fVar264 + fVar225 * fVar164 + fStack_108 * fStack_588 +
               fStack_1c8 * fVar340;
          register0x000012dc = fVar330 + fStack_764;
          local_780 = fVar266 * (float)local_180._0_4_ +
                      (float)local_80._0_4_ * fVar293 +
                      fVar144 * (float)local_140._0_4_ + local_5a0 * (float)local_160._0_4_;
          fStack_77c = fVar338 * (float)local_180._4_4_ +
                       (float)local_80._4_4_ * fVar230 +
                       fVar160 * (float)local_140._4_4_ + fStack_59c * (float)local_160._4_4_;
          fStack_778 = fVar337 * fStack_178 +
                       fStack_78 * fVar329 + fVar161 * fStack_138 + fStack_598 * fStack_158;
          fStack_774 = fVar339 * fStack_174 +
                       fStack_74 * fVar299 + fVar188 * fStack_134 + fStack_594 * fStack_154;
          fStack_770 = fVar269 * fStack_170 +
                       fStack_70 * fVar301 + fVar162 * fStack_130 + fStack_590 * fStack_150;
          fStack_76c = fVar341 * fStack_16c +
                       fStack_6c * fVar232 + fVar163 * fStack_12c + fStack_58c * fStack_14c;
          fStack_768 = fVar340 * fStack_168 +
                       fStack_68 * fVar303 + fVar164 * fStack_128 + fStack_588 * fStack_148;
          fStack_764 = fStack_764 + fVar224 + fVar209;
          auVar131 = *(undefined1 (*) [24])(catmullrom_basis1 + lVar139 * 4 + lVar22);
          uVar13 = *(undefined8 *)
                    ((undefined1 (*) [24])(catmullrom_basis1 + lVar139 * 4 + lVar22))[1];
          pfVar1 = (float *)(lVar22 + 0x2232c10 + lVar139 * 4);
          fVar266 = *pfVar1;
          fVar338 = pfVar1[1];
          fVar337 = pfVar1[2];
          fVar339 = pfVar1[3];
          fVar269 = pfVar1[4];
          fVar341 = pfVar1[5];
          fVar340 = pfVar1[6];
          pauVar11 = (undefined1 (*) [16])(lVar22 + 0x2233094 + lVar139 * 4);
          fVar144 = *(float *)*pauVar11;
          fVar160 = *(float *)(*pauVar11 + 4);
          fVar161 = *(float *)(*pauVar11 + 8);
          auVar133 = *(undefined1 (*) [12])*pauVar11;
          fVar188 = *(float *)(*pauVar11 + 0xc);
          fStack_410 = *(float *)pauVar11[1];
          fStack_40c = *(float *)(pauVar11[1] + 4);
          fStack_408 = *(float *)(pauVar11[1] + 8);
          pauVar10 = (undefined1 (*) [32])(lVar22 + 0x2233518 + lVar139 * 4);
          fVar162 = *(float *)*pauVar10;
          fVar163 = *(float *)(*pauVar10 + 4);
          fVar164 = *(float *)(*pauVar10 + 8);
          fVar209 = *(float *)(*pauVar10 + 0xc);
          fVar224 = *(float *)(*pauVar10 + 0x10);
          fVar226 = *(float *)(*pauVar10 + 0x14);
          fVar228 = *(float *)(*pauVar10 + 0x18);
          auVar132 = *(undefined1 (*) [28])*pauVar10;
          _local_220 = *pauVar10;
          auVar218 = _local_220;
          fVar231 = auVar292._28_4_;
          _local_420 = *pauVar11;
          auVar198 = _local_420;
          uStack_404 = *(undefined4 *)(pauVar11[1] + 0xc);
          auVar184 = ZEXT3264(auVar350._0_32_);
          fVar252 = fVar231 + fVar231 + fStack_424;
          local_820._0_4_ = auVar131._0_4_;
          local_820._4_4_ = auVar131._4_4_;
          fStack_818 = auVar131._8_4_;
          fStack_814 = auVar131._12_4_;
          fStack_810 = auVar131._16_4_;
          fStack_80c = auVar131._20_4_;
          fStack_808 = (float)uVar13;
          fStack_804 = (float)((ulong)uVar13 >> 0x20);
          fVar229 = fStack_804;
          local_640._0_4_ =
               (float)local_400._0_4_ * (float)local_820._0_4_ +
               fVar266 * auVar350._0_4_ +
               (float)local_6a0._0_4_ * fVar144 + (float)local_440._0_4_ * fVar162;
          local_640._4_4_ =
               (float)local_400._4_4_ * (float)local_820._4_4_ +
               fVar338 * auVar350._4_4_ +
               (float)local_6a0._4_4_ * fVar160 + (float)local_440._4_4_ * fVar163;
          uStack_638._0_4_ =
               fStack_3f8 * fStack_818 +
               fVar337 * auVar350._8_4_ + fStack_698 * fVar161 + fStack_438 * fVar164;
          uStack_638._4_4_ =
               fStack_3f4 * fStack_814 +
               fVar339 * auVar350._12_4_ + fStack_694 * fVar188 + fStack_434 * fVar209;
          register0x00001390 =
               fStack_3f0 * fStack_810 +
               fVar269 * auVar350._16_4_ + fStack_690 * fStack_410 + fStack_430 * fVar224;
          register0x00001394 =
               fStack_3ec * fStack_80c +
               fVar341 * auVar350._20_4_ + fStack_68c * fStack_40c + fStack_42c * fVar226;
          register0x00001398 =
               fStack_3e8 * fStack_808 +
               fVar340 * auVar350._24_4_ + fStack_688 * fStack_408 + fStack_428 * fVar228;
          register0x0000139c = fVar231 + fVar227 + fVar252;
          local_6e0._0_4_ =
               (float)local_1e0._0_4_ * (float)local_820._0_4_ +
               fVar233 * fVar266 + (float)local_120._0_4_ * fVar162 + fVar316 * fVar144;
          local_6e0._4_4_ =
               (float)local_1e0._4_4_ * (float)local_820._4_4_ +
               fVar245 * fVar338 + (float)local_120._4_4_ * fVar163 + fVar359 * fVar160;
          auStack_6d8._0_4_ =
               fStack_1d8 * fStack_818 +
               fVar248 * fVar337 + fStack_118 * fVar164 + fVar206 * fVar161;
          auStack_6d8._4_4_ =
               fStack_1d4 * fStack_814 +
               fVar250 * fVar339 + fStack_114 * fVar209 + fVar268 * fVar188;
          register0x00001350 =
               fStack_1d0 * fStack_810 +
               fVar253 * fVar269 + fStack_110 * fVar224 + fVar210 * fStack_410;
          register0x00001354 =
               fStack_1cc * fStack_80c +
               fVar262 * fVar341 + fStack_10c * fVar226 + fVar223 * fStack_40c;
          register0x00001358 =
               fStack_1c8 * fStack_808 +
               fVar264 * fVar340 + fStack_108 * fVar228 + fVar225 * fStack_408;
          register0x0000135c = fVar252 + fVar231 + fVar330 + fVar231;
          auVar291._0_4_ =
               (float)local_80._0_4_ * fVar266 +
               fVar144 * (float)local_140._0_4_ + fVar162 * (float)local_160._0_4_ +
               (float)local_820._0_4_ * (float)local_180._0_4_;
          auVar291._4_4_ =
               (float)local_80._4_4_ * fVar338 +
               fVar160 * (float)local_140._4_4_ + fVar163 * (float)local_160._4_4_ +
               (float)local_820._4_4_ * (float)local_180._4_4_;
          auVar291._8_4_ =
               fStack_78 * fVar337 + fVar161 * fStack_138 + fVar164 * fStack_158 +
               fStack_818 * fStack_178;
          auVar291._12_4_ =
               fStack_74 * fVar339 + fVar188 * fStack_134 + fVar209 * fStack_154 +
               fStack_814 * fStack_174;
          auVar291._16_4_ =
               fStack_70 * fVar269 + fStack_410 * fStack_130 + fVar224 * fStack_150 +
               fStack_810 * fStack_170;
          auVar291._20_4_ =
               fStack_6c * fVar341 + fStack_40c * fStack_12c + fVar226 * fStack_14c +
               fStack_80c * fStack_16c;
          auVar291._24_4_ =
               fStack_68 * fVar340 + fStack_408 * fStack_128 + fVar228 * fStack_148 +
               fStack_808 * fStack_168;
          auVar291._28_4_ = fVar231 + fVar231 + fVar227 + fVar252;
          auVar354 = vsubps_avx(_local_640,_local_6c0);
          auVar260 = vsubps_avx(_local_6e0,_local_7a0);
          fVar227 = auVar354._0_4_;
          fVar144 = auVar354._4_4_;
          auVar67._4_4_ = fVar144 * (float)local_7a0._4_4_;
          auVar67._0_4_ = fVar227 * (float)local_7a0._0_4_;
          fVar160 = auVar354._8_4_;
          auVar67._8_4_ = fVar160 * fStack_798;
          fVar161 = auVar354._12_4_;
          auVar67._12_4_ = fVar161 * fStack_794;
          fVar162 = auVar354._16_4_;
          auVar67._16_4_ = fVar162 * register0x000012d0;
          fVar163 = auVar354._20_4_;
          auVar67._20_4_ = fVar163 * register0x000012d4;
          fVar164 = auVar354._24_4_;
          auVar67._24_4_ = fVar164 * register0x000012d8;
          auVar67._28_4_ = fVar252;
          fVar316 = auVar260._0_4_;
          fVar359 = auVar260._4_4_;
          auVar68._4_4_ = (float)local_6c0._4_4_ * fVar359;
          auVar68._0_4_ = (float)local_6c0._0_4_ * fVar316;
          fVar206 = auVar260._8_4_;
          auVar68._8_4_ = fStack_6b8 * fVar206;
          fVar268 = auVar260._12_4_;
          auVar68._12_4_ = fStack_6b4 * fVar268;
          fVar210 = auVar260._16_4_;
          auVar68._16_4_ = register0x00001450 * fVar210;
          fVar223 = auVar260._20_4_;
          auVar68._20_4_ = register0x00001454 * fVar223;
          fVar225 = auVar260._24_4_;
          auVar68._24_4_ = register0x00001458 * fVar225;
          auVar68._28_4_ = register0x0000135c;
          auVar38 = vsubps_avx(auVar67,auVar68);
          auVar121._4_4_ = fStack_77c;
          auVar121._0_4_ = local_780;
          auVar121._8_4_ = fStack_778;
          auVar121._12_4_ = fStack_774;
          auVar121._16_4_ = fStack_770;
          auVar121._20_4_ = fStack_76c;
          auVar121._24_4_ = fStack_768;
          auVar121._28_4_ = fStack_764;
          auVar180 = vmaxps_avx(auVar121,auVar291);
          auVar69._4_4_ = auVar180._4_4_ * auVar180._4_4_ * (fVar144 * fVar144 + fVar359 * fVar359);
          auVar69._0_4_ = auVar180._0_4_ * auVar180._0_4_ * (fVar227 * fVar227 + fVar316 * fVar316);
          auVar69._8_4_ = auVar180._8_4_ * auVar180._8_4_ * (fVar160 * fVar160 + fVar206 * fVar206);
          auVar69._12_4_ =
               auVar180._12_4_ * auVar180._12_4_ * (fVar161 * fVar161 + fVar268 * fVar268);
          auVar69._16_4_ =
               auVar180._16_4_ * auVar180._16_4_ * (fVar162 * fVar162 + fVar210 * fVar210);
          auVar69._20_4_ =
               auVar180._20_4_ * auVar180._20_4_ * (fVar163 * fVar163 + fVar223 * fVar223);
          auVar69._24_4_ =
               auVar180._24_4_ * auVar180._24_4_ * (fVar164 * fVar164 + fVar225 * fVar225);
          auVar69._28_4_ = register0x0000139c + register0x0000135c;
          auVar70._4_4_ = auVar38._4_4_ * auVar38._4_4_;
          auVar70._0_4_ = auVar38._0_4_ * auVar38._0_4_;
          auVar70._8_4_ = auVar38._8_4_ * auVar38._8_4_;
          auVar70._12_4_ = auVar38._12_4_ * auVar38._12_4_;
          auVar70._16_4_ = auVar38._16_4_ * auVar38._16_4_;
          auVar70._20_4_ = auVar38._20_4_ * auVar38._20_4_;
          auVar70._24_4_ = auVar38._24_4_ * auVar38._24_4_;
          auVar70._28_4_ = auVar38._28_4_;
          local_200 = vcmpps_avx(auVar70,auVar69,2);
          auVar159 = ZEXT3264(local_200);
          local_380 = (uint)lVar139;
          auVar197 = vpshufd_avx(ZEXT416(local_380),0);
          auVar172 = vpor_avx(auVar197,_DAT_01ff0cf0);
          auVar197 = vpor_avx(auVar197,_DAT_02020ea0);
          auVar127._4_4_ = fStack_23c;
          auVar127._0_4_ = local_240;
          auVar127._8_4_ = fStack_238;
          auVar127._12_4_ = fStack_234;
          auVar172 = vpcmpgtd_avx(auVar127,auVar172);
          auVar197 = vpcmpgtd_avx(auVar127,auVar197);
          local_260._16_16_ = auVar197;
          local_260._0_16_ = auVar172;
          auVar222 = ZEXT3264(local_260);
          auVar180 = local_260 & local_200;
          fVar316 = (float)local_620._0_4_;
          fVar359 = (float)local_620._4_4_;
          fVar206 = fStack_618;
          fVar268 = fStack_614;
          fVar210 = fStack_610;
          fVar223 = fStack_60c;
          fVar225 = fStack_608;
          fVar227 = fStack_604;
          if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar180 >> 0x7f,0) == '\0') &&
                (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar180 >> 0xbf,0) == '\0') &&
              (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar180[0x1f]) {
            auVar350 = ZEXT3264(auVar350._0_32_);
            auVar292 = ZEXT3264(auVar292._0_32_);
          }
          else {
            local_460 = (float)local_820._0_4_ * (float)local_740._0_4_;
            fStack_45c = (float)local_820._4_4_ * (float)local_740._4_4_;
            fStack_458 = fStack_818 * fStack_738;
            fStack_454 = fStack_814 * fStack_734;
            fStack_450 = fStack_810 * fStack_730;
            fStack_44c = fStack_80c * fStack_72c;
            fStack_448 = fStack_808 * fStack_728;
            _local_820 = auVar291;
            local_420._0_4_ = auVar133._0_4_;
            local_420._4_4_ = auVar133._4_4_;
            fStack_418 = auVar133._8_4_;
            local_220._0_4_ = auVar132._0_4_;
            local_220._4_4_ = auVar132._4_4_;
            fStack_218 = auVar132._8_4_;
            fStack_214 = auVar132._12_4_;
            fStack_210 = auVar132._16_4_;
            fStack_20c = auVar132._20_4_;
            fStack_208 = auVar132._24_4_;
            local_460 = local_460 +
                        (float)local_1c0._0_4_ * fVar266 +
                        (float)local_a0._0_4_ * (float)local_420._0_4_ +
                        (float)local_5c0._0_4_ * (float)local_220._0_4_;
            fStack_45c = fStack_45c +
                         (float)local_1c0._4_4_ * fVar338 +
                         (float)local_a0._4_4_ * (float)local_420._4_4_ +
                         (float)local_5c0._4_4_ * (float)local_220._4_4_;
            fStack_458 = fStack_458 +
                         fStack_1b8 * fVar337 + fStack_98 * fStack_418 + fStack_5b8 * fStack_218;
            fStack_454 = fStack_454 +
                         fStack_1b4 * fVar339 + fStack_94 * fVar188 + fStack_5b4 * fStack_214;
            fStack_450 = fStack_450 +
                         fStack_1b0 * fVar269 + fStack_90 * fStack_410 + fStack_5b0 * fStack_210;
            fStack_44c = fStack_44c +
                         fStack_1ac * fVar341 + fStack_8c * fStack_40c + fStack_5ac * fStack_20c;
            fStack_448 = fStack_448 +
                         fStack_1a8 * fVar340 + fStack_88 * fStack_408 + fStack_5a8 * fStack_208;
            fStack_444 = register0x0000145c + local_200._28_4_ + auVar350._28_4_ + 0.0;
            local_580._0_4_ = auVar129._0_4_;
            local_580._4_4_ = auVar129._4_4_;
            fStack_578 = auVar129._8_4_;
            fStack_574 = auVar129._12_4_;
            fStack_570 = auVar129._16_4_;
            fStack_56c = auVar129._20_4_;
            fStack_568 = auVar129._24_4_;
            pfVar1 = (float *)(lVar22 + 0x2231e84 + lVar139 * 4);
            fVar266 = *pfVar1;
            fVar338 = pfVar1[1];
            fVar337 = pfVar1[2];
            fVar339 = pfVar1[3];
            fVar269 = pfVar1[4];
            fVar341 = pfVar1[5];
            fVar340 = pfVar1[6];
            pfVar2 = (float *)(lVar22 + 0x2232308 + lVar139 * 4);
            fVar144 = *pfVar2;
            fVar160 = pfVar2[1];
            fVar161 = pfVar2[2];
            fVar188 = pfVar2[3];
            fVar162 = pfVar2[4];
            fVar163 = pfVar2[5];
            fVar164 = pfVar2[6];
            fVar282 = fVar229 + 0.0;
            pfVar3 = (float *)(lVar22 + 0x2231a00 + lVar139 * 4);
            fVar209 = *pfVar3;
            fVar224 = pfVar3[1];
            fVar226 = pfVar3[2];
            fVar228 = pfVar3[3];
            fVar252 = pfVar3[4];
            fVar231 = pfVar3[5];
            fVar330 = pfVar3[6];
            fVar165 = pfVar1[7] + pfVar2[7];
            fVar189 = pfVar2[7] + fVar282;
            fVar282 = fVar229 + fStack_1c4 + fVar282;
            pfVar1 = (float *)(lVar22 + 0x223157c + lVar139 * 4);
            fVar229 = *pfVar1;
            fVar300 = pfVar1[1];
            fVar302 = pfVar1[2];
            fVar304 = pfVar1[3];
            fVar305 = pfVar1[4];
            fVar306 = pfVar1[5];
            fVar143 = pfVar1[6];
            auVar153._0_4_ =
                 fVar229 * (float)local_400._0_4_ +
                 fVar209 * (float)local_760._0_4_ +
                 fVar266 * (float)local_6a0._0_4_ + (float)local_440._0_4_ * fVar144;
            auVar153._4_4_ =
                 fVar300 * (float)local_400._4_4_ +
                 fVar224 * (float)local_760._4_4_ +
                 fVar338 * (float)local_6a0._4_4_ + (float)local_440._4_4_ * fVar160;
            auVar153._8_4_ =
                 fVar302 * fStack_3f8 +
                 fVar226 * fStack_758 + fVar337 * fStack_698 + fStack_438 * fVar161;
            auVar153._12_4_ =
                 fVar304 * fStack_3f4 +
                 fVar228 * fStack_754 + fVar339 * fStack_694 + fStack_434 * fVar188;
            auVar153._16_4_ =
                 fVar305 * fStack_3f0 +
                 fVar252 * fStack_750 + fVar269 * fStack_690 + fStack_430 * fVar162;
            auVar153._20_4_ =
                 fVar306 * fStack_3ec +
                 fVar231 * fStack_74c + fVar341 * fStack_68c + fStack_42c * fVar163;
            auVar153._24_4_ =
                 fVar143 * fStack_3e8 +
                 fVar330 * fStack_748 + fVar340 * fStack_688 + fStack_428 * fVar164;
            auVar153._28_4_ = fVar165 + fVar189;
            auVar177._0_4_ =
                 (float)local_1e0._0_4_ * fVar229 +
                 (float)local_620._0_4_ * fVar266 + (float)local_120._0_4_ * fVar144 +
                 fVar233 * fVar209;
            auVar177._4_4_ =
                 (float)local_1e0._4_4_ * fVar300 +
                 (float)local_620._4_4_ * fVar338 + (float)local_120._4_4_ * fVar160 +
                 fVar245 * fVar224;
            auVar177._8_4_ =
                 fStack_1d8 * fVar302 +
                 fStack_618 * fVar337 + fStack_118 * fVar161 + fVar248 * fVar226;
            auVar177._12_4_ =
                 fStack_1d4 * fVar304 +
                 fStack_614 * fVar339 + fStack_114 * fVar188 + fVar250 * fVar228;
            auVar177._16_4_ =
                 fStack_1d0 * fVar305 +
                 fStack_610 * fVar269 + fStack_110 * fVar162 + fVar253 * fVar252;
            auVar177._20_4_ =
                 fStack_1cc * fVar306 +
                 fStack_60c * fVar341 + fStack_10c * fVar163 + fVar262 * fVar231;
            auVar177._24_4_ =
                 fStack_1c8 * fVar143 +
                 fStack_608 * fVar340 + fStack_108 * fVar164 + fVar264 * fVar330;
            auVar177._28_4_ = fVar189 + fVar282;
            auVar355._0_4_ =
                 fVar209 * (float)local_1c0._0_4_ +
                 (float)local_a0._0_4_ * fVar266 + (float)local_5c0._0_4_ * fVar144 +
                 fVar229 * (float)local_740._0_4_;
            auVar355._4_4_ =
                 fVar224 * (float)local_1c0._4_4_ +
                 (float)local_a0._4_4_ * fVar338 + (float)local_5c0._4_4_ * fVar160 +
                 fVar300 * (float)local_740._4_4_;
            auVar355._8_4_ =
                 fVar226 * fStack_1b8 + fStack_98 * fVar337 + fStack_5b8 * fVar161 +
                 fVar302 * fStack_738;
            auVar355._12_4_ =
                 fVar228 * fStack_1b4 + fStack_94 * fVar339 + fStack_5b4 * fVar188 +
                 fVar304 * fStack_734;
            auVar355._16_4_ =
                 fVar252 * fStack_1b0 + fStack_90 * fVar269 + fStack_5b0 * fVar162 +
                 fVar305 * fStack_730;
            auVar355._20_4_ =
                 fVar231 * fStack_1ac + fStack_8c * fVar341 + fStack_5ac * fVar163 +
                 fVar306 * fStack_72c;
            auVar355._24_4_ =
                 fVar330 * fStack_1a8 + fStack_88 * fVar340 + fStack_5a8 * fVar164 +
                 fVar143 * fStack_728;
            auVar355._28_4_ = pfVar3[7] + fVar165 + fVar282;
            pfVar1 = (float *)(lVar22 + 0x22342a4 + lVar139 * 4);
            fVar266 = *pfVar1;
            fVar338 = pfVar1[1];
            fVar337 = pfVar1[2];
            fVar339 = pfVar1[3];
            fVar269 = pfVar1[4];
            fVar341 = pfVar1[5];
            fVar340 = pfVar1[6];
            pfVar2 = (float *)(lVar22 + 0x2234728 + lVar139 * 4);
            fVar144 = *pfVar2;
            fVar160 = pfVar2[1];
            fVar161 = pfVar2[2];
            fVar188 = pfVar2[3];
            fVar162 = pfVar2[4];
            fVar163 = pfVar2[5];
            fVar164 = pfVar2[6];
            pfVar3 = (float *)(lVar22 + 0x2233e20 + lVar139 * 4);
            fVar209 = *pfVar3;
            fVar224 = pfVar3[1];
            fVar226 = pfVar3[2];
            fVar228 = pfVar3[3];
            fVar229 = pfVar3[4];
            fVar252 = pfVar3[5];
            fVar231 = pfVar3[6];
            pfVar4 = (float *)(lVar22 + 0x223399c + lVar139 * 4);
            fVar330 = *pfVar4;
            fVar300 = pfVar4[1];
            fVar302 = pfVar4[2];
            fVar304 = pfVar4[3];
            fVar305 = pfVar4[4];
            fVar306 = pfVar4[5];
            fVar143 = pfVar4[6];
            auVar310._0_4_ =
                 fVar330 * (float)local_400._0_4_ +
                 fVar209 * (float)local_760._0_4_ +
                 fVar266 * (float)local_6a0._0_4_ + (float)local_440._0_4_ * fVar144;
            auVar310._4_4_ =
                 fVar300 * (float)local_400._4_4_ +
                 fVar224 * (float)local_760._4_4_ +
                 fVar338 * (float)local_6a0._4_4_ + (float)local_440._4_4_ * fVar160;
            auVar310._8_4_ =
                 fVar302 * fStack_3f8 +
                 fVar226 * fStack_758 + fVar337 * fStack_698 + fStack_438 * fVar161;
            auVar310._12_4_ =
                 fVar304 * fStack_3f4 +
                 fVar228 * fStack_754 + fVar339 * fStack_694 + fStack_434 * fVar188;
            auVar310._16_4_ =
                 fVar305 * fStack_3f0 +
                 fVar229 * fStack_750 + fVar269 * fStack_690 + fStack_430 * fVar162;
            auVar310._20_4_ =
                 fVar306 * fStack_3ec +
                 fVar252 * fStack_74c + fVar341 * fStack_68c + fStack_42c * fVar163;
            auVar310._24_4_ =
                 fVar143 * fStack_3e8 +
                 fVar231 * fStack_748 + fVar340 * fStack_688 + fStack_428 * fVar164;
            auVar310._28_4_ = fStack_1c4 + fStack_1c4 + fStack_424 + fStack_1c4;
            auVar348._0_4_ =
                 fVar330 * (float)local_1e0._0_4_ +
                 fVar233 * fVar209 +
                 (float)local_620._0_4_ * fVar266 + (float)local_120._0_4_ * fVar144;
            auVar348._4_4_ =
                 fVar300 * (float)local_1e0._4_4_ +
                 fVar245 * fVar224 +
                 (float)local_620._4_4_ * fVar338 + (float)local_120._4_4_ * fVar160;
            auVar348._8_4_ =
                 fVar302 * fStack_1d8 +
                 fVar248 * fVar226 + fStack_618 * fVar337 + fStack_118 * fVar161;
            auVar348._12_4_ =
                 fVar304 * fStack_1d4 +
                 fVar250 * fVar228 + fStack_614 * fVar339 + fStack_114 * fVar188;
            auVar348._16_4_ =
                 fVar305 * fStack_1d0 +
                 fVar253 * fVar229 + fStack_610 * fVar269 + fStack_110 * fVar162;
            auVar348._20_4_ =
                 fVar306 * fStack_1cc +
                 fVar262 * fVar252 + fStack_60c * fVar341 + fStack_10c * fVar163;
            auVar348._24_4_ =
                 fVar143 * fStack_1c8 +
                 fVar264 * fVar231 + fStack_608 * fVar340 + fStack_108 * fVar164;
            auVar348._28_4_ = fStack_1c4 + fStack_1c4 + fStack_104 + fStack_1c4;
            auVar261._8_4_ = 0x7fffffff;
            auVar261._0_8_ = 0x7fffffff7fffffff;
            auVar261._12_4_ = 0x7fffffff;
            auVar261._16_4_ = 0x7fffffff;
            auVar261._20_4_ = 0x7fffffff;
            auVar261._24_4_ = 0x7fffffff;
            auVar261._28_4_ = 0x7fffffff;
            auVar180 = vandps_avx(auVar153,auVar261);
            auVar38 = vandps_avx(auVar177,auVar261);
            auVar38 = vmaxps_avx(auVar180,auVar38);
            auVar180 = vandps_avx(auVar355,auVar261);
            auVar38 = vmaxps_avx(auVar38,auVar180);
            auVar38 = vcmpps_avx(auVar38,local_c0,1);
            auVar240 = vblendvps_avx(auVar153,auVar354,auVar38);
            auVar154._0_4_ =
                 fVar330 * (float)local_740._0_4_ +
                 fVar209 * (float)local_1c0._0_4_ +
                 fVar144 * (float)local_5c0._0_4_ + (float)local_a0._0_4_ * fVar266;
            auVar154._4_4_ =
                 fVar300 * (float)local_740._4_4_ +
                 fVar224 * (float)local_1c0._4_4_ +
                 fVar160 * (float)local_5c0._4_4_ + (float)local_a0._4_4_ * fVar338;
            auVar154._8_4_ =
                 fVar302 * fStack_738 +
                 fVar226 * fStack_1b8 + fVar161 * fStack_5b8 + fStack_98 * fVar337;
            auVar154._12_4_ =
                 fVar304 * fStack_734 +
                 fVar228 * fStack_1b4 + fVar188 * fStack_5b4 + fStack_94 * fVar339;
            auVar154._16_4_ =
                 fVar305 * fStack_730 +
                 fVar229 * fStack_1b0 + fVar162 * fStack_5b0 + fStack_90 * fVar269;
            auVar154._20_4_ =
                 fVar306 * fStack_72c +
                 fVar252 * fStack_1ac + fVar163 * fStack_5ac + fStack_8c * fVar341;
            auVar154._24_4_ =
                 fVar143 * fStack_728 +
                 fVar231 * fStack_1a8 + fVar164 * fStack_5a8 + fStack_88 * fVar340;
            auVar154._28_4_ = auVar180._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar289 = vblendvps_avx(auVar177,auVar260,auVar38);
            auVar180 = vandps_avx(auVar310,auVar261);
            auVar38 = vandps_avx(auVar348,auVar261);
            auVar318 = vmaxps_avx(auVar180,auVar38);
            auVar180 = vandps_avx(auVar154,auVar261);
            auVar180 = vmaxps_avx(auVar318,auVar180);
            local_660._0_4_ = auVar130._0_4_;
            local_660._4_4_ = auVar130._4_4_;
            uStack_658._0_4_ = auVar130._8_4_;
            uStack_658._4_4_ = auVar130._12_4_;
            auStack_650._0_4_ = auVar130._16_4_;
            auStack_650._4_4_ = auVar130._20_4_;
            fStack_648 = auVar130._24_4_;
            auVar38 = vcmpps_avx(auVar180,local_c0,1);
            auVar180 = vblendvps_avx(auVar310,auVar354,auVar38);
            auVar155._0_4_ =
                 (float)local_740._0_4_ * (float)local_660._0_4_ +
                 (float)local_1c0._0_4_ * fVar293 +
                 (float)local_a0._0_4_ * (float)local_580._0_4_ + (float)local_5c0._0_4_ * local_5a0
            ;
            auVar155._4_4_ =
                 (float)local_740._4_4_ * (float)local_660._4_4_ +
                 (float)local_1c0._4_4_ * fVar230 +
                 (float)local_a0._4_4_ * (float)local_580._4_4_ +
                 (float)local_5c0._4_4_ * fStack_59c;
            auVar155._8_4_ =
                 fStack_738 * (float)uStack_658 +
                 fStack_1b8 * fVar329 + fStack_98 * fStack_578 + fStack_5b8 * fStack_598;
            auVar155._12_4_ =
                 fStack_734 * uStack_658._4_4_ +
                 fStack_1b4 * fVar299 + fStack_94 * fStack_574 + fStack_5b4 * fStack_594;
            auVar155._16_4_ =
                 fStack_730 * (float)auStack_650._0_4_ +
                 fStack_1b0 * fVar301 + fStack_90 * fStack_570 + fStack_5b0 * fStack_590;
            auVar155._20_4_ =
                 fStack_72c * (float)auStack_650._4_4_ +
                 fStack_1ac * fVar232 + fStack_8c * fStack_56c + fStack_5ac * fStack_58c;
            auVar155._24_4_ =
                 fStack_728 * fStack_648 +
                 fStack_1a8 * fVar303 + fStack_88 * fStack_568 + fStack_5a8 * fStack_588;
            auVar155._28_4_ = auVar318._28_4_ + fStack_444 + auVar350._28_4_ + 0.0;
            auVar38 = vblendvps_avx(auVar348,auVar260,auVar38);
            fVar330 = auVar240._0_4_;
            fVar300 = auVar240._4_4_;
            fVar302 = auVar240._8_4_;
            fVar304 = auVar240._12_4_;
            fVar305 = auVar240._16_4_;
            fVar306 = auVar240._20_4_;
            fVar143 = auVar240._24_4_;
            fVar165 = auVar240._28_4_;
            fVar293 = auVar180._0_4_;
            fVar329 = auVar180._4_4_;
            fVar301 = auVar180._8_4_;
            fVar303 = auVar180._12_4_;
            fVar160 = auVar180._16_4_;
            fVar188 = auVar180._20_4_;
            fVar163 = auVar180._24_4_;
            fVar233 = auVar289._0_4_;
            fVar248 = auVar289._4_4_;
            fVar253 = auVar289._8_4_;
            fVar264 = auVar289._12_4_;
            fVar338 = auVar289._16_4_;
            fVar339 = auVar289._20_4_;
            fVar341 = auVar289._24_4_;
            auVar320._0_4_ = fVar233 * fVar233 + fVar330 * fVar330;
            auVar320._4_4_ = fVar248 * fVar248 + fVar300 * fVar300;
            auVar320._8_4_ = fVar253 * fVar253 + fVar302 * fVar302;
            auVar320._12_4_ = fVar264 * fVar264 + fVar304 * fVar304;
            auVar320._16_4_ = fVar338 * fVar338 + fVar305 * fVar305;
            auVar320._20_4_ = fVar339 * fVar339 + fVar306 * fVar306;
            auVar320._24_4_ = fVar341 * fVar341 + fVar143 * fVar143;
            auVar320._28_4_ = auVar354._28_4_ + auVar260._28_4_;
            auVar354 = vrsqrtps_avx(auVar320);
            fVar245 = auVar354._0_4_;
            fVar250 = auVar354._4_4_;
            auVar71._4_4_ = fVar250 * 1.5;
            auVar71._0_4_ = fVar245 * 1.5;
            fVar262 = auVar354._8_4_;
            auVar71._8_4_ = fVar262 * 1.5;
            fVar266 = auVar354._12_4_;
            auVar71._12_4_ = fVar266 * 1.5;
            fVar337 = auVar354._16_4_;
            auVar71._16_4_ = fVar337 * 1.5;
            fVar269 = auVar354._20_4_;
            auVar71._20_4_ = fVar269 * 1.5;
            fVar340 = auVar354._24_4_;
            auVar71._24_4_ = fVar340 * 1.5;
            auVar71._28_4_ = auVar348._28_4_;
            auVar72._4_4_ = fVar250 * fVar250 * fVar250 * auVar320._4_4_ * 0.5;
            auVar72._0_4_ = fVar245 * fVar245 * fVar245 * auVar320._0_4_ * 0.5;
            auVar72._8_4_ = fVar262 * fVar262 * fVar262 * auVar320._8_4_ * 0.5;
            auVar72._12_4_ = fVar266 * fVar266 * fVar266 * auVar320._12_4_ * 0.5;
            auVar72._16_4_ = fVar337 * fVar337 * fVar337 * auVar320._16_4_ * 0.5;
            auVar72._20_4_ = fVar269 * fVar269 * fVar269 * auVar320._20_4_ * 0.5;
            auVar72._24_4_ = fVar340 * fVar340 * fVar340 * auVar320._24_4_ * 0.5;
            auVar72._28_4_ = auVar320._28_4_;
            auVar260 = vsubps_avx(auVar71,auVar72);
            fVar209 = auVar260._0_4_;
            fVar224 = auVar260._4_4_;
            fVar226 = auVar260._8_4_;
            fVar228 = auVar260._12_4_;
            fVar229 = auVar260._16_4_;
            fVar252 = auVar260._20_4_;
            fVar231 = auVar260._24_4_;
            fVar245 = auVar38._0_4_;
            fVar250 = auVar38._4_4_;
            fVar262 = auVar38._8_4_;
            fVar266 = auVar38._12_4_;
            fVar337 = auVar38._16_4_;
            fVar269 = auVar38._20_4_;
            fVar340 = auVar38._24_4_;
            auVar298._0_4_ = fVar245 * fVar245 + fVar293 * fVar293;
            auVar298._4_4_ = fVar250 * fVar250 + fVar329 * fVar329;
            auVar298._8_4_ = fVar262 * fVar262 + fVar301 * fVar301;
            auVar298._12_4_ = fVar266 * fVar266 + fVar303 * fVar303;
            auVar298._16_4_ = fVar337 * fVar337 + fVar160 * fVar160;
            auVar298._20_4_ = fVar269 * fVar269 + fVar188 * fVar188;
            auVar298._24_4_ = fVar340 * fVar340 + fVar163 * fVar163;
            auVar298._28_4_ = auVar354._28_4_ + auVar180._28_4_;
            auVar180 = vrsqrtps_avx(auVar298);
            fVar230 = auVar180._0_4_;
            fVar299 = auVar180._4_4_;
            auVar73._4_4_ = fVar299 * 1.5;
            auVar73._0_4_ = fVar230 * 1.5;
            fVar232 = auVar180._8_4_;
            auVar73._8_4_ = fVar232 * 1.5;
            fVar144 = auVar180._12_4_;
            auVar73._12_4_ = fVar144 * 1.5;
            fVar161 = auVar180._16_4_;
            auVar73._16_4_ = fVar161 * 1.5;
            fVar162 = auVar180._20_4_;
            auVar73._20_4_ = fVar162 * 1.5;
            fVar164 = auVar180._24_4_;
            auVar73._24_4_ = fVar164 * 1.5;
            auVar73._28_4_ = auVar348._28_4_;
            auVar74._4_4_ = fVar299 * fVar299 * fVar299 * auVar298._4_4_ * 0.5;
            auVar74._0_4_ = fVar230 * fVar230 * fVar230 * auVar298._0_4_ * 0.5;
            auVar74._8_4_ = fVar232 * fVar232 * fVar232 * auVar298._8_4_ * 0.5;
            auVar74._12_4_ = fVar144 * fVar144 * fVar144 * auVar298._12_4_ * 0.5;
            auVar74._16_4_ = fVar161 * fVar161 * fVar161 * auVar298._16_4_ * 0.5;
            auVar74._20_4_ = fVar162 * fVar162 * fVar162 * auVar298._20_4_ * 0.5;
            auVar74._24_4_ = fVar164 * fVar164 * fVar164 * auVar298._24_4_ * 0.5;
            auVar74._28_4_ = auVar298._28_4_;
            auVar354 = vsubps_avx(auVar73,auVar74);
            fVar230 = auVar354._0_4_;
            fVar299 = auVar354._4_4_;
            fVar232 = auVar354._8_4_;
            fVar144 = auVar354._12_4_;
            fVar161 = auVar354._16_4_;
            fVar162 = auVar354._20_4_;
            fVar164 = auVar354._24_4_;
            fVar233 = local_780 * fVar209 * fVar233;
            fVar248 = fStack_77c * fVar224 * fVar248;
            auVar75._4_4_ = fVar248;
            auVar75._0_4_ = fVar233;
            fVar253 = fStack_778 * fVar226 * fVar253;
            auVar75._8_4_ = fVar253;
            fVar264 = fStack_774 * fVar228 * fVar264;
            auVar75._12_4_ = fVar264;
            fVar338 = fStack_770 * fVar229 * fVar338;
            auVar75._16_4_ = fVar338;
            fVar339 = fStack_76c * fVar252 * fVar339;
            auVar75._20_4_ = fVar339;
            fVar341 = fStack_768 * fVar231 * fVar341;
            auVar75._24_4_ = fVar341;
            auVar75._28_4_ = auVar180._28_4_;
            local_660._4_4_ = fVar248 + (float)local_6c0._4_4_;
            local_660._0_4_ = fVar233 + (float)local_6c0._0_4_;
            uStack_658._0_4_ = fVar253 + fStack_6b8;
            uStack_658._4_4_ = fVar264 + fStack_6b4;
            auStack_650._0_4_ = fVar338 + register0x00001450;
            auStack_650._4_4_ = fVar339 + register0x00001454;
            fStack_648 = fVar341 + register0x00001458;
            fStack_644 = auVar180._28_4_ + register0x0000145c;
            local_680 = local_780 * fVar209 * -fVar330;
            fStack_67c = fStack_77c * fVar224 * -fVar300;
            auVar76._4_4_ = fStack_67c;
            auVar76._0_4_ = local_680;
            fStack_678 = fStack_778 * fVar226 * -fVar302;
            auVar76._8_4_ = fStack_678;
            fStack_674 = fStack_774 * fVar228 * -fVar304;
            auVar76._12_4_ = fStack_674;
            fStack_670 = fStack_770 * fVar229 * -fVar305;
            auVar76._16_4_ = fStack_670;
            fStack_66c = fStack_76c * fVar252 * -fVar306;
            auVar76._20_4_ = fStack_66c;
            fStack_668 = fStack_768 * fVar231 * -fVar143;
            auVar76._24_4_ = fStack_668;
            auVar76._28_4_ = -fVar165;
            local_680 = (float)local_7a0._0_4_ + local_680;
            fStack_67c = (float)local_7a0._4_4_ + fStack_67c;
            fStack_678 = fStack_798 + fStack_678;
            fStack_674 = fStack_794 + fStack_674;
            fStack_670 = register0x000012d0 + fStack_670;
            fStack_66c = register0x000012d4 + fStack_66c;
            fStack_668 = register0x000012d8 + fStack_668;
            fStack_664 = register0x000012dc + -fVar165;
            fVar233 = fVar209 * 0.0 * local_780;
            fVar248 = fVar224 * 0.0 * fStack_77c;
            auVar77._4_4_ = fVar248;
            auVar77._0_4_ = fVar233;
            fVar253 = fVar226 * 0.0 * fStack_778;
            auVar77._8_4_ = fVar253;
            fVar264 = fVar228 * 0.0 * fStack_774;
            auVar77._12_4_ = fVar264;
            fVar338 = fVar229 * 0.0 * fStack_770;
            auVar77._16_4_ = fVar338;
            fVar339 = fVar252 * 0.0 * fStack_76c;
            auVar77._20_4_ = fVar339;
            fVar341 = fVar231 * 0.0 * fStack_768;
            auVar77._24_4_ = fVar341;
            auVar77._28_4_ = fVar165;
            auVar318 = vsubps_avx(_local_6c0,auVar75);
            auVar375._0_4_ = fVar233 + auVar155._0_4_;
            auVar375._4_4_ = fVar248 + auVar155._4_4_;
            auVar375._8_4_ = fVar253 + auVar155._8_4_;
            auVar375._12_4_ = fVar264 + auVar155._12_4_;
            auVar375._16_4_ = fVar338 + auVar155._16_4_;
            auVar375._20_4_ = fVar339 + auVar155._20_4_;
            auVar375._24_4_ = fVar341 + auVar155._24_4_;
            auVar375._28_4_ = fVar165 + auVar155._28_4_;
            fVar233 = auVar291._0_4_ * fVar230 * fVar245;
            fVar245 = auVar291._4_4_ * fVar299 * fVar250;
            auVar78._4_4_ = fVar245;
            auVar78._0_4_ = fVar233;
            fVar248 = auVar291._8_4_ * fVar232 * fVar262;
            auVar78._8_4_ = fVar248;
            fVar250 = auVar291._12_4_ * fVar144 * fVar266;
            auVar78._12_4_ = fVar250;
            fVar253 = auVar291._16_4_ * fVar161 * fVar337;
            auVar78._16_4_ = fVar253;
            fVar262 = auVar291._20_4_ * fVar162 * fVar269;
            auVar78._20_4_ = fVar262;
            fVar264 = auVar291._24_4_ * fVar164 * fVar340;
            auVar78._24_4_ = fVar264;
            auVar78._28_4_ = fStack_764;
            auVar32 = vsubps_avx(_local_7a0,auVar76);
            auVar356._0_4_ = (float)local_640._0_4_ + fVar233;
            auVar356._4_4_ = (float)local_640._4_4_ + fVar245;
            auVar356._8_4_ = (float)uStack_638 + fVar248;
            auVar356._12_4_ = uStack_638._4_4_ + fVar250;
            auVar356._16_4_ = register0x00001390 + fVar253;
            auVar356._20_4_ = register0x00001394 + fVar262;
            auVar356._24_4_ = register0x00001398 + fVar264;
            auVar356._28_4_ = register0x0000139c + fStack_764;
            fVar233 = fVar230 * -fVar293 * auVar291._0_4_;
            fVar245 = fVar299 * -fVar329 * auVar291._4_4_;
            auVar79._4_4_ = fVar245;
            auVar79._0_4_ = fVar233;
            fVar248 = fVar232 * -fVar301 * auVar291._8_4_;
            auVar79._8_4_ = fVar248;
            fVar250 = fVar144 * -fVar303 * auVar291._12_4_;
            auVar79._12_4_ = fVar250;
            fVar253 = fVar161 * -fVar160 * auVar291._16_4_;
            auVar79._16_4_ = fVar253;
            fVar262 = fVar162 * -fVar188 * auVar291._20_4_;
            auVar79._20_4_ = fVar262;
            fVar264 = fVar164 * -fVar163 * auVar291._24_4_;
            auVar79._24_4_ = fVar264;
            auVar79._28_4_ = register0x0000145c;
            auVar33 = vsubps_avx(auVar155,auVar77);
            auVar243._0_4_ = (float)local_6e0._0_4_ + fVar233;
            auVar243._4_4_ = (float)local_6e0._4_4_ + fVar245;
            auVar243._8_4_ = (float)auStack_6d8._0_4_ + fVar248;
            auVar243._12_4_ = (float)auStack_6d8._4_4_ + fVar250;
            auVar243._16_4_ = register0x00001350 + fVar253;
            auVar243._20_4_ = register0x00001354 + fVar262;
            auVar243._24_4_ = register0x00001358 + fVar264;
            auVar243._28_4_ = register0x0000135c + register0x0000145c;
            fVar233 = fVar230 * 0.0 * auVar291._0_4_;
            fVar245 = fVar299 * 0.0 * auVar291._4_4_;
            auVar80._4_4_ = fVar245;
            auVar80._0_4_ = fVar233;
            fVar248 = fVar232 * 0.0 * auVar291._8_4_;
            auVar80._8_4_ = fVar248;
            fVar250 = fVar144 * 0.0 * auVar291._12_4_;
            auVar80._12_4_ = fVar250;
            fVar253 = fVar161 * 0.0 * auVar291._16_4_;
            auVar80._16_4_ = fVar253;
            fVar262 = fVar162 * 0.0 * auVar291._20_4_;
            auVar80._20_4_ = fVar262;
            fVar264 = fVar164 * 0.0 * auVar291._24_4_;
            auVar80._24_4_ = fVar264;
            auVar80._28_4_ = auVar155._28_4_;
            auVar180 = vsubps_avx(_local_640,auVar78);
            auVar126._4_4_ = fStack_45c;
            auVar126._0_4_ = local_460;
            auVar126._8_4_ = fStack_458;
            auVar126._12_4_ = fStack_454;
            auVar126._16_4_ = fStack_450;
            auVar126._20_4_ = fStack_44c;
            auVar126._24_4_ = fStack_448;
            auVar126._28_4_ = fStack_444;
            auVar311._0_4_ = local_460 + fVar233;
            auVar311._4_4_ = fStack_45c + fVar245;
            auVar311._8_4_ = fStack_458 + fVar248;
            auVar311._12_4_ = fStack_454 + fVar250;
            auVar311._16_4_ = fStack_450 + fVar253;
            auVar311._20_4_ = fStack_44c + fVar262;
            auVar311._24_4_ = fStack_448 + fVar264;
            auVar311._28_4_ = fStack_444 + auVar155._28_4_;
            auVar260 = vsubps_avx(_local_6e0,auVar79);
            auVar38 = vsubps_avx(auVar126,auVar80);
            auVar240 = vsubps_avx(auVar243,auVar32);
            auVar289 = vsubps_avx(auVar311,auVar33);
            auVar81._4_4_ = auVar33._4_4_ * auVar240._4_4_;
            auVar81._0_4_ = auVar33._0_4_ * auVar240._0_4_;
            auVar81._8_4_ = auVar33._8_4_ * auVar240._8_4_;
            auVar81._12_4_ = auVar33._12_4_ * auVar240._12_4_;
            auVar81._16_4_ = auVar33._16_4_ * auVar240._16_4_;
            auVar81._20_4_ = auVar33._20_4_ * auVar240._20_4_;
            auVar81._24_4_ = auVar33._24_4_ * auVar240._24_4_;
            auVar81._28_4_ = auVar348._28_4_;
            auVar82._4_4_ = auVar32._4_4_ * auVar289._4_4_;
            auVar82._0_4_ = auVar32._0_4_ * auVar289._0_4_;
            auVar82._8_4_ = auVar32._8_4_ * auVar289._8_4_;
            auVar82._12_4_ = auVar32._12_4_ * auVar289._12_4_;
            auVar82._16_4_ = auVar32._16_4_ * auVar289._16_4_;
            auVar82._20_4_ = auVar32._20_4_ * auVar289._20_4_;
            auVar82._24_4_ = auVar32._24_4_ * auVar289._24_4_;
            auVar82._28_4_ = fStack_444;
            auVar345 = vsubps_avx(auVar82,auVar81);
            auVar83._4_4_ = auVar318._4_4_ * auVar289._4_4_;
            auVar83._0_4_ = auVar318._0_4_ * auVar289._0_4_;
            auVar83._8_4_ = auVar318._8_4_ * auVar289._8_4_;
            auVar83._12_4_ = auVar318._12_4_ * auVar289._12_4_;
            auVar83._16_4_ = auVar318._16_4_ * auVar289._16_4_;
            auVar83._20_4_ = auVar318._20_4_ * auVar289._20_4_;
            auVar83._24_4_ = auVar318._24_4_ * auVar289._24_4_;
            auVar83._28_4_ = auVar289._28_4_;
            auVar289 = vsubps_avx(auVar356,auVar318);
            auVar84._4_4_ = auVar33._4_4_ * auVar289._4_4_;
            auVar84._0_4_ = auVar33._0_4_ * auVar289._0_4_;
            auVar84._8_4_ = auVar33._8_4_ * auVar289._8_4_;
            auVar84._12_4_ = auVar33._12_4_ * auVar289._12_4_;
            auVar84._16_4_ = auVar33._16_4_ * auVar289._16_4_;
            auVar84._20_4_ = auVar33._20_4_ * auVar289._20_4_;
            auVar84._24_4_ = auVar33._24_4_ * auVar289._24_4_;
            auVar84._28_4_ = auVar354._28_4_;
            auVar34 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar32._4_4_ * auVar289._4_4_;
            auVar85._0_4_ = auVar32._0_4_ * auVar289._0_4_;
            auVar85._8_4_ = auVar32._8_4_ * auVar289._8_4_;
            auVar85._12_4_ = auVar32._12_4_ * auVar289._12_4_;
            auVar85._16_4_ = auVar32._16_4_ * auVar289._16_4_;
            auVar85._20_4_ = auVar32._20_4_ * auVar289._20_4_;
            auVar85._24_4_ = auVar32._24_4_ * auVar289._24_4_;
            auVar85._28_4_ = auVar354._28_4_;
            auVar86._4_4_ = auVar318._4_4_ * auVar240._4_4_;
            auVar86._0_4_ = auVar318._0_4_ * auVar240._0_4_;
            auVar86._8_4_ = auVar318._8_4_ * auVar240._8_4_;
            auVar86._12_4_ = auVar318._12_4_ * auVar240._12_4_;
            auVar86._16_4_ = auVar318._16_4_ * auVar240._16_4_;
            auVar86._20_4_ = auVar318._20_4_ * auVar240._20_4_;
            auVar86._24_4_ = auVar318._24_4_ * auVar240._24_4_;
            auVar86._28_4_ = auVar240._28_4_;
            auVar354 = vsubps_avx(auVar86,auVar85);
            auVar178._0_4_ = auVar345._0_4_ * 0.0 + auVar354._0_4_ + auVar34._0_4_ * 0.0;
            auVar178._4_4_ = auVar345._4_4_ * 0.0 + auVar354._4_4_ + auVar34._4_4_ * 0.0;
            auVar178._8_4_ = auVar345._8_4_ * 0.0 + auVar354._8_4_ + auVar34._8_4_ * 0.0;
            auVar178._12_4_ = auVar345._12_4_ * 0.0 + auVar354._12_4_ + auVar34._12_4_ * 0.0;
            auVar178._16_4_ = auVar345._16_4_ * 0.0 + auVar354._16_4_ + auVar34._16_4_ * 0.0;
            auVar178._20_4_ = auVar345._20_4_ * 0.0 + auVar354._20_4_ + auVar34._20_4_ * 0.0;
            auVar178._24_4_ = auVar345._24_4_ * 0.0 + auVar354._24_4_ + auVar34._24_4_ * 0.0;
            auVar178._28_4_ = auVar345._28_4_ + auVar354._28_4_ + auVar34._28_4_;
            auVar24 = vcmpps_avx(auVar178,ZEXT832(0) << 0x20,2);
            auVar180 = vblendvps_avx(auVar180,_local_660,auVar24);
            auVar222 = ZEXT3264(auVar180);
            auVar123._4_4_ = fStack_67c;
            auVar123._0_4_ = local_680;
            auVar123._8_4_ = fStack_678;
            auVar123._12_4_ = fStack_674;
            auVar123._16_4_ = fStack_670;
            auVar123._20_4_ = fStack_66c;
            auVar123._24_4_ = fStack_668;
            auVar123._28_4_ = fStack_664;
            auVar354 = vblendvps_avx(auVar260,auVar123,auVar24);
            auVar260 = vblendvps_avx(auVar38,auVar375,auVar24);
            auVar38 = vblendvps_avx(auVar318,auVar356,auVar24);
            auVar240 = vblendvps_avx(auVar32,auVar243,auVar24);
            auVar289 = vblendvps_avx(auVar33,auVar311,auVar24);
            auVar318 = vblendvps_avx(auVar356,auVar318,auVar24);
            auVar345 = vblendvps_avx(auVar243,auVar32,auVar24);
            auVar34 = vblendvps_avx(auVar311,auVar33,auVar24);
            _local_7a0 = vandps_avx(local_200,local_260);
            auVar318 = vsubps_avx(auVar318,auVar180);
            auVar35 = vsubps_avx(auVar345,auVar354);
            auVar34 = vsubps_avx(auVar34,auVar260);
            auVar36 = vsubps_avx(auVar354,auVar240);
            fVar233 = auVar35._0_4_;
            fVar190 = auVar260._0_4_;
            fVar266 = auVar35._4_4_;
            fVar191 = auVar260._4_4_;
            auVar87._4_4_ = fVar191 * fVar266;
            auVar87._0_4_ = fVar190 * fVar233;
            fVar293 = auVar35._8_4_;
            fVar202 = auVar260._8_4_;
            auVar87._8_4_ = fVar202 * fVar293;
            fVar144 = auVar35._12_4_;
            fVar203 = auVar260._12_4_;
            auVar87._12_4_ = fVar203 * fVar144;
            fVar209 = auVar35._16_4_;
            fVar204 = auVar260._16_4_;
            auVar87._16_4_ = fVar204 * fVar209;
            fVar330 = auVar35._20_4_;
            fVar205 = auVar260._20_4_;
            auVar87._20_4_ = fVar205 * fVar330;
            fVar165 = auVar35._24_4_;
            fVar207 = auVar260._24_4_;
            auVar87._24_4_ = fVar207 * fVar165;
            auVar87._28_4_ = auVar345._28_4_;
            fVar245 = auVar354._0_4_;
            fVar208 = auVar34._0_4_;
            fVar338 = auVar354._4_4_;
            fVar234 = auVar34._4_4_;
            auVar88._4_4_ = fVar234 * fVar338;
            auVar88._0_4_ = fVar208 * fVar245;
            fVar230 = auVar354._8_4_;
            fVar235 = auVar34._8_4_;
            auVar88._8_4_ = fVar235 * fVar230;
            fVar160 = auVar354._12_4_;
            fVar246 = auVar34._12_4_;
            auVar88._12_4_ = fVar246 * fVar160;
            fVar224 = auVar354._16_4_;
            fVar247 = auVar34._16_4_;
            auVar88._16_4_ = fVar247 * fVar224;
            fVar300 = auVar354._20_4_;
            fVar249 = auVar34._20_4_;
            auVar88._20_4_ = fVar249 * fVar300;
            fVar189 = auVar354._24_4_;
            fVar251 = auVar34._24_4_;
            uVar12 = auVar32._28_4_;
            auVar88._24_4_ = fVar251 * fVar189;
            auVar88._28_4_ = uVar12;
            auVar345 = vsubps_avx(auVar88,auVar87);
            fVar248 = auVar180._0_4_;
            fVar337 = auVar180._4_4_;
            auVar89._4_4_ = fVar234 * fVar337;
            auVar89._0_4_ = fVar208 * fVar248;
            fVar329 = auVar180._8_4_;
            auVar89._8_4_ = fVar235 * fVar329;
            fVar161 = auVar180._12_4_;
            auVar89._12_4_ = fVar246 * fVar161;
            fVar226 = auVar180._16_4_;
            auVar89._16_4_ = fVar247 * fVar226;
            fVar302 = auVar180._20_4_;
            auVar89._20_4_ = fVar249 * fVar302;
            fVar282 = auVar180._24_4_;
            auVar89._24_4_ = fVar251 * fVar282;
            auVar89._28_4_ = uVar12;
            fVar250 = auVar318._0_4_;
            fVar339 = auVar318._4_4_;
            auVar90._4_4_ = fVar191 * fVar339;
            auVar90._0_4_ = fVar190 * fVar250;
            fVar299 = auVar318._8_4_;
            auVar90._8_4_ = fVar202 * fVar299;
            fVar188 = auVar318._12_4_;
            auVar90._12_4_ = fVar203 * fVar188;
            fVar228 = auVar318._16_4_;
            auVar90._16_4_ = fVar204 * fVar228;
            fVar304 = auVar318._20_4_;
            auVar90._20_4_ = fVar205 * fVar304;
            fVar166 = auVar318._24_4_;
            auVar90._24_4_ = fVar207 * fVar166;
            auVar90._28_4_ = auVar356._28_4_;
            auVar32 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = fVar338 * fVar339;
            auVar91._0_4_ = fVar245 * fVar250;
            auVar91._8_4_ = fVar230 * fVar299;
            auVar91._12_4_ = fVar160 * fVar188;
            auVar91._16_4_ = fVar224 * fVar228;
            auVar91._20_4_ = fVar300 * fVar304;
            auVar91._24_4_ = fVar189 * fVar166;
            auVar91._28_4_ = uVar12;
            auVar92._4_4_ = fVar337 * fVar266;
            auVar92._0_4_ = fVar248 * fVar233;
            auVar92._8_4_ = fVar329 * fVar293;
            auVar92._12_4_ = fVar161 * fVar144;
            auVar92._16_4_ = fVar226 * fVar209;
            auVar92._20_4_ = fVar302 * fVar330;
            auVar92._24_4_ = fVar282 * fVar165;
            auVar92._28_4_ = auVar33._28_4_;
            auVar33 = vsubps_avx(auVar92,auVar91);
            auVar37 = vsubps_avx(auVar260,auVar289);
            fVar262 = auVar33._28_4_ + auVar32._28_4_;
            auVar321._0_4_ = auVar33._0_4_ + auVar32._0_4_ * 0.0 + auVar345._0_4_ * 0.0;
            auVar321._4_4_ = auVar33._4_4_ + auVar32._4_4_ * 0.0 + auVar345._4_4_ * 0.0;
            auVar321._8_4_ = auVar33._8_4_ + auVar32._8_4_ * 0.0 + auVar345._8_4_ * 0.0;
            auVar321._12_4_ = auVar33._12_4_ + auVar32._12_4_ * 0.0 + auVar345._12_4_ * 0.0;
            auVar321._16_4_ = auVar33._16_4_ + auVar32._16_4_ * 0.0 + auVar345._16_4_ * 0.0;
            auVar321._20_4_ = auVar33._20_4_ + auVar32._20_4_ * 0.0 + auVar345._20_4_ * 0.0;
            auVar321._24_4_ = auVar33._24_4_ + auVar32._24_4_ * 0.0 + auVar345._24_4_ * 0.0;
            auVar321._28_4_ = fVar262 + auVar345._28_4_;
            fVar253 = auVar36._0_4_;
            fVar269 = auVar36._4_4_;
            auVar93._4_4_ = auVar289._4_4_ * fVar269;
            auVar93._0_4_ = auVar289._0_4_ * fVar253;
            fVar301 = auVar36._8_4_;
            auVar93._8_4_ = auVar289._8_4_ * fVar301;
            fVar162 = auVar36._12_4_;
            auVar93._12_4_ = auVar289._12_4_ * fVar162;
            fVar229 = auVar36._16_4_;
            auVar93._16_4_ = auVar289._16_4_ * fVar229;
            fVar305 = auVar36._20_4_;
            auVar93._20_4_ = auVar289._20_4_ * fVar305;
            fVar185 = auVar36._24_4_;
            auVar93._24_4_ = auVar289._24_4_ * fVar185;
            auVar93._28_4_ = fVar262;
            fVar262 = auVar37._0_4_;
            fVar341 = auVar37._4_4_;
            auVar94._4_4_ = auVar240._4_4_ * fVar341;
            auVar94._0_4_ = auVar240._0_4_ * fVar262;
            fVar232 = auVar37._8_4_;
            auVar94._8_4_ = auVar240._8_4_ * fVar232;
            fVar163 = auVar37._12_4_;
            auVar94._12_4_ = auVar240._12_4_ * fVar163;
            fVar252 = auVar37._16_4_;
            auVar94._16_4_ = auVar240._16_4_ * fVar252;
            fVar306 = auVar37._20_4_;
            auVar94._20_4_ = auVar240._20_4_ * fVar306;
            fVar186 = auVar37._24_4_;
            auVar94._24_4_ = auVar240._24_4_ * fVar186;
            auVar94._28_4_ = auVar33._28_4_;
            auVar32 = vsubps_avx(auVar94,auVar93);
            auVar33 = vsubps_avx(auVar180,auVar38);
            fVar264 = auVar33._0_4_;
            fVar340 = auVar33._4_4_;
            auVar95._4_4_ = auVar289._4_4_ * fVar340;
            auVar95._0_4_ = auVar289._0_4_ * fVar264;
            fVar303 = auVar33._8_4_;
            auVar95._8_4_ = auVar289._8_4_ * fVar303;
            fVar164 = auVar33._12_4_;
            auVar95._12_4_ = auVar289._12_4_ * fVar164;
            fVar231 = auVar33._16_4_;
            auVar95._16_4_ = auVar289._16_4_ * fVar231;
            fVar143 = auVar33._20_4_;
            auVar95._20_4_ = auVar289._20_4_ * fVar143;
            fVar187 = auVar33._24_4_;
            auVar95._24_4_ = auVar289._24_4_ * fVar187;
            auVar95._28_4_ = auVar289._28_4_;
            auVar96._4_4_ = fVar341 * auVar38._4_4_;
            auVar96._0_4_ = fVar262 * auVar38._0_4_;
            auVar96._8_4_ = fVar232 * auVar38._8_4_;
            auVar96._12_4_ = fVar163 * auVar38._12_4_;
            auVar96._16_4_ = fVar252 * auVar38._16_4_;
            auVar96._20_4_ = fVar306 * auVar38._20_4_;
            auVar96._24_4_ = fVar186 * auVar38._24_4_;
            auVar96._28_4_ = auVar345._28_4_;
            auVar289 = vsubps_avx(auVar95,auVar96);
            auVar97._4_4_ = auVar240._4_4_ * fVar340;
            auVar97._0_4_ = auVar240._0_4_ * fVar264;
            auVar97._8_4_ = auVar240._8_4_ * fVar303;
            auVar97._12_4_ = auVar240._12_4_ * fVar164;
            auVar97._16_4_ = auVar240._16_4_ * fVar231;
            auVar97._20_4_ = auVar240._20_4_ * fVar143;
            auVar97._24_4_ = auVar240._24_4_ * fVar187;
            auVar97._28_4_ = auVar240._28_4_;
            auVar98._4_4_ = fVar269 * auVar38._4_4_;
            auVar98._0_4_ = fVar253 * auVar38._0_4_;
            auVar98._8_4_ = fVar301 * auVar38._8_4_;
            auVar98._12_4_ = fVar162 * auVar38._12_4_;
            auVar98._16_4_ = fVar229 * auVar38._16_4_;
            auVar98._20_4_ = fVar305 * auVar38._20_4_;
            auVar98._24_4_ = fVar185 * auVar38._24_4_;
            auVar98._28_4_ = auVar38._28_4_;
            auVar38 = vsubps_avx(auVar98,auVar97);
            auVar156._0_4_ = auVar32._0_4_ * 0.0 + auVar38._0_4_ + auVar289._0_4_ * 0.0;
            auVar156._4_4_ = auVar32._4_4_ * 0.0 + auVar38._4_4_ + auVar289._4_4_ * 0.0;
            auVar156._8_4_ = auVar32._8_4_ * 0.0 + auVar38._8_4_ + auVar289._8_4_ * 0.0;
            auVar156._12_4_ = auVar32._12_4_ * 0.0 + auVar38._12_4_ + auVar289._12_4_ * 0.0;
            auVar156._16_4_ = auVar32._16_4_ * 0.0 + auVar38._16_4_ + auVar289._16_4_ * 0.0;
            auVar156._20_4_ = auVar32._20_4_ * 0.0 + auVar38._20_4_ + auVar289._20_4_ * 0.0;
            auVar156._24_4_ = auVar32._24_4_ * 0.0 + auVar38._24_4_ + auVar289._24_4_ * 0.0;
            auVar156._28_4_ = auVar289._28_4_ + auVar38._28_4_ + auVar289._28_4_;
            auVar159 = ZEXT3264(auVar156);
            auVar38 = vmaxps_avx(auVar321,auVar156);
            auVar38 = vcmpps_avx(auVar38,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar240 = _local_7a0 & auVar38;
            if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar240 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar240 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar240 >> 0x7f,0) == '\0') &&
                  (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar240 >> 0xbf,0) == '\0') &&
                (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar240[0x1f]) {
LAB_0107b9ae:
              auVar184 = ZEXT3264(CONCAT824(uStack_4a8,
                                            CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
              auVar322._4_4_ = fStack_77c;
              auVar322._0_4_ = local_780;
              auVar322._8_4_ = fStack_778;
              auVar322._12_4_ = fStack_774;
              auVar322._16_4_ = fStack_770;
              auVar322._20_4_ = fStack_76c;
              auVar322._24_4_ = fStack_768;
              auVar322._28_4_ = fStack_764;
            }
            else {
              auVar240 = vandps_avx(auVar38,_local_7a0);
              auVar99._4_4_ = fVar341 * fVar266;
              auVar99._0_4_ = fVar262 * fVar233;
              auVar99._8_4_ = fVar232 * fVar293;
              auVar99._12_4_ = fVar163 * fVar144;
              auVar99._16_4_ = fVar252 * fVar209;
              auVar99._20_4_ = fVar306 * fVar330;
              auVar99._24_4_ = fVar186 * fVar165;
              auVar99._28_4_ = local_7a0._28_4_;
              auVar100._4_4_ = fVar269 * fVar234;
              auVar100._0_4_ = fVar253 * fVar208;
              auVar100._8_4_ = fVar301 * fVar235;
              auVar100._12_4_ = fVar162 * fVar246;
              auVar100._16_4_ = fVar229 * fVar247;
              auVar100._20_4_ = fVar305 * fVar249;
              auVar100._24_4_ = fVar185 * fVar251;
              auVar100._28_4_ = auVar38._28_4_;
              auVar289 = vsubps_avx(auVar100,auVar99);
              auVar101._4_4_ = fVar340 * fVar234;
              auVar101._0_4_ = fVar264 * fVar208;
              auVar101._8_4_ = fVar303 * fVar235;
              auVar101._12_4_ = fVar164 * fVar246;
              auVar101._16_4_ = fVar231 * fVar247;
              auVar101._20_4_ = fVar143 * fVar249;
              auVar101._24_4_ = fVar187 * fVar251;
              auVar101._28_4_ = auVar34._28_4_;
              auVar102._4_4_ = fVar341 * fVar339;
              auVar102._0_4_ = fVar262 * fVar250;
              auVar102._8_4_ = fVar232 * fVar299;
              auVar102._12_4_ = fVar163 * fVar188;
              auVar102._16_4_ = fVar252 * fVar228;
              auVar102._20_4_ = fVar306 * fVar304;
              auVar102._24_4_ = fVar186 * fVar166;
              auVar102._28_4_ = auVar37._28_4_;
              auVar345 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar269 * fVar339;
              auVar103._0_4_ = fVar253 * fVar250;
              auVar103._8_4_ = fVar301 * fVar299;
              auVar103._12_4_ = fVar162 * fVar188;
              auVar103._16_4_ = fVar229 * fVar228;
              auVar103._20_4_ = fVar305 * fVar304;
              auVar103._24_4_ = fVar185 * fVar166;
              auVar103._28_4_ = auVar318._28_4_;
              auVar104._4_4_ = fVar340 * fVar266;
              auVar104._0_4_ = fVar264 * fVar233;
              auVar104._8_4_ = fVar303 * fVar293;
              auVar104._12_4_ = fVar164 * fVar144;
              auVar104._16_4_ = fVar231 * fVar209;
              auVar104._20_4_ = fVar143 * fVar330;
              auVar104._24_4_ = fVar187 * fVar165;
              auVar104._28_4_ = auVar35._28_4_;
              auVar34 = vsubps_avx(auVar104,auVar103);
              auVar179._0_4_ = auVar289._0_4_ * 0.0 + auVar34._0_4_ + auVar345._0_4_ * 0.0;
              auVar179._4_4_ = auVar289._4_4_ * 0.0 + auVar34._4_4_ + auVar345._4_4_ * 0.0;
              auVar179._8_4_ = auVar289._8_4_ * 0.0 + auVar34._8_4_ + auVar345._8_4_ * 0.0;
              auVar179._12_4_ = auVar289._12_4_ * 0.0 + auVar34._12_4_ + auVar345._12_4_ * 0.0;
              auVar179._16_4_ = auVar289._16_4_ * 0.0 + auVar34._16_4_ + auVar345._16_4_ * 0.0;
              auVar179._20_4_ = auVar289._20_4_ * 0.0 + auVar34._20_4_ + auVar345._20_4_ * 0.0;
              auVar179._24_4_ = auVar289._24_4_ * 0.0 + auVar34._24_4_ + auVar345._24_4_ * 0.0;
              auVar179._28_4_ = auVar35._28_4_ + auVar34._28_4_ + auVar318._28_4_;
              auVar38 = vrcpps_avx(auVar179);
              fVar250 = auVar38._0_4_;
              fVar253 = auVar38._4_4_;
              auVar105._4_4_ = auVar179._4_4_ * fVar253;
              auVar105._0_4_ = auVar179._0_4_ * fVar250;
              fVar262 = auVar38._8_4_;
              auVar105._8_4_ = auVar179._8_4_ * fVar262;
              fVar264 = auVar38._12_4_;
              auVar105._12_4_ = auVar179._12_4_ * fVar264;
              fVar266 = auVar38._16_4_;
              auVar105._16_4_ = auVar179._16_4_ * fVar266;
              fVar339 = auVar38._20_4_;
              auVar105._20_4_ = auVar179._20_4_ * fVar339;
              fVar269 = auVar38._24_4_;
              auVar105._24_4_ = auVar179._24_4_ * fVar269;
              auVar105._28_4_ = auVar37._28_4_;
              auVar349._8_4_ = 0x3f800000;
              auVar349._0_8_ = &DAT_3f8000003f800000;
              auVar349._12_4_ = 0x3f800000;
              auVar349._16_4_ = 0x3f800000;
              auVar349._20_4_ = 0x3f800000;
              auVar349._24_4_ = 0x3f800000;
              auVar349._28_4_ = 0x3f800000;
              auVar38 = vsubps_avx(auVar349,auVar105);
              fVar250 = auVar38._0_4_ * fVar250 + fVar250;
              fVar253 = auVar38._4_4_ * fVar253 + fVar253;
              fVar262 = auVar38._8_4_ * fVar262 + fVar262;
              fVar264 = auVar38._12_4_ * fVar264 + fVar264;
              fVar266 = auVar38._16_4_ * fVar266 + fVar266;
              fVar339 = auVar38._20_4_ * fVar339 + fVar339;
              fVar269 = auVar38._24_4_ * fVar269 + fVar269;
              auVar106._4_4_ =
                   (fVar337 * auVar289._4_4_ + auVar345._4_4_ * fVar338 + auVar34._4_4_ * fVar191) *
                   fVar253;
              auVar106._0_4_ =
                   (fVar248 * auVar289._0_4_ + auVar345._0_4_ * fVar245 + auVar34._0_4_ * fVar190) *
                   fVar250;
              auVar106._8_4_ =
                   (fVar329 * auVar289._8_4_ + auVar345._8_4_ * fVar230 + auVar34._8_4_ * fVar202) *
                   fVar262;
              auVar106._12_4_ =
                   (fVar161 * auVar289._12_4_ + auVar345._12_4_ * fVar160 + auVar34._12_4_ * fVar203
                   ) * fVar264;
              auVar106._16_4_ =
                   (fVar226 * auVar289._16_4_ + auVar345._16_4_ * fVar224 + auVar34._16_4_ * fVar204
                   ) * fVar266;
              auVar106._20_4_ =
                   (fVar302 * auVar289._20_4_ + auVar345._20_4_ * fVar300 + auVar34._20_4_ * fVar205
                   ) * fVar339;
              auVar106._24_4_ =
                   (fVar282 * auVar289._24_4_ + auVar345._24_4_ * fVar189 + auVar34._24_4_ * fVar207
                   ) * fVar269;
              auVar106._28_4_ = auVar180._28_4_ + auVar354._28_4_ + auVar260._28_4_;
              auVar222 = ZEXT3264(auVar106);
              fVar233 = (ray->super_RayK<1>).tfar;
              auVar244._4_4_ = fVar233;
              auVar244._0_4_ = fVar233;
              auVar244._8_4_ = fVar233;
              auVar244._12_4_ = fVar233;
              auVar244._16_4_ = fVar233;
              auVar244._20_4_ = fVar233;
              auVar244._24_4_ = fVar233;
              auVar244._28_4_ = fVar233;
              auVar180 = vcmpps_avx(local_e0,auVar106,2);
              auVar354 = vcmpps_avx(auVar106,auVar244,2);
              auVar180 = vandps_avx(auVar180,auVar354);
              auVar354 = auVar240 & auVar180;
              if ((((((((auVar354 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar354 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar354 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar354 >> 0x7f,0) == '\0') &&
                    (auVar354 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar354 >> 0xbf,0) == '\0') &&
                  (auVar354 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar354[0x1f]) goto LAB_0107b9ae;
              auVar180 = vandps_avx(auVar240,auVar180);
              auVar354 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar179,4);
              auVar260 = auVar180 & auVar354;
              auVar184 = ZEXT3264(CONCAT824(uStack_4a8,
                                            CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
              auVar322._4_4_ = fStack_77c;
              auVar322._0_4_ = local_780;
              auVar322._8_4_ = fStack_778;
              auVar322._12_4_ = fStack_774;
              auVar322._16_4_ = fStack_770;
              auVar322._20_4_ = fStack_76c;
              auVar322._24_4_ = fStack_768;
              auVar322._28_4_ = fStack_764;
              if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar260 >> 0x7f,0) != '\0') ||
                    (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar260 >> 0xbf,0) != '\0') ||
                  (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar260[0x1f] < '\0') {
                auVar180 = vandps_avx(auVar354,auVar180);
                auVar184 = ZEXT3264(auVar180);
                auVar107._4_4_ = auVar321._4_4_ * fVar253;
                auVar107._0_4_ = auVar321._0_4_ * fVar250;
                auVar107._8_4_ = auVar321._8_4_ * fVar262;
                auVar107._12_4_ = auVar321._12_4_ * fVar264;
                auVar107._16_4_ = auVar321._16_4_ * fVar266;
                auVar107._20_4_ = auVar321._20_4_ * fVar339;
                auVar107._24_4_ = auVar321._24_4_ * fVar269;
                auVar107._28_4_ = local_480._28_4_;
                auVar108._4_4_ = auVar156._4_4_ * fVar253;
                auVar108._0_4_ = auVar156._0_4_ * fVar250;
                auVar108._8_4_ = auVar156._8_4_ * fVar262;
                auVar108._12_4_ = auVar156._12_4_ * fVar264;
                auVar108._16_4_ = auVar156._16_4_ * fVar266;
                auVar108._20_4_ = auVar156._20_4_ * fVar339;
                auVar108._24_4_ = auVar156._24_4_ * fVar269;
                auVar108._28_4_ = auVar156._28_4_;
                auVar159 = ZEXT3264(auVar108);
                auVar277._8_4_ = 0x3f800000;
                auVar277._0_8_ = &DAT_3f8000003f800000;
                auVar277._12_4_ = 0x3f800000;
                auVar277._16_4_ = 0x3f800000;
                auVar277._20_4_ = 0x3f800000;
                auVar277._24_4_ = 0x3f800000;
                auVar277._28_4_ = 0x3f800000;
                auVar180 = vsubps_avx(auVar277,auVar107);
                local_2a0 = vblendvps_avx(auVar180,auVar107,auVar24);
                auVar180 = vsubps_avx(auVar277,auVar108);
                _local_480 = vblendvps_avx(auVar180,auVar108,auVar24);
                local_4a0 = auVar106;
              }
            }
            auVar180 = auVar184._0_32_;
            auVar350 = ZEXT3264(_local_760);
            if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar180 >> 0x7f,0) == '\0') &&
                  (auVar184 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar180 >> 0xbf,0) == '\0') &&
                (auVar184 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar184[0x1f]) {
              auVar292 = ZEXT3264(local_520);
            }
            else {
              auVar354 = vsubps_avx(auVar291,auVar322);
              fVar245 = auVar322._0_4_ + local_2a0._0_4_ * auVar354._0_4_;
              fVar248 = auVar322._4_4_ + local_2a0._4_4_ * auVar354._4_4_;
              fVar250 = auVar322._8_4_ + local_2a0._8_4_ * auVar354._8_4_;
              fVar253 = auVar322._12_4_ + local_2a0._12_4_ * auVar354._12_4_;
              fVar262 = auVar322._16_4_ + local_2a0._16_4_ * auVar354._16_4_;
              fVar264 = auVar322._20_4_ + local_2a0._20_4_ * auVar354._20_4_;
              fVar266 = auVar322._24_4_ + local_2a0._24_4_ * auVar354._24_4_;
              fVar338 = auVar322._28_4_ + auVar354._28_4_;
              fVar233 = local_7d8->depth_scale;
              auVar109._4_4_ = (fVar248 + fVar248) * fVar233;
              auVar109._0_4_ = (fVar245 + fVar245) * fVar233;
              auVar109._8_4_ = (fVar250 + fVar250) * fVar233;
              auVar109._12_4_ = (fVar253 + fVar253) * fVar233;
              auVar109._16_4_ = (fVar262 + fVar262) * fVar233;
              auVar109._20_4_ = (fVar264 + fVar264) * fVar233;
              auVar109._24_4_ = (fVar266 + fVar266) * fVar233;
              auVar109._28_4_ = fVar338 + fVar338;
              auVar222 = ZEXT3264(local_4a0);
              auVar354 = vcmpps_avx(local_4a0,auVar109,6);
              auVar159 = ZEXT3264(auVar354);
              auVar260 = auVar180 & auVar354;
              auVar292 = ZEXT3264(local_520);
              if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar260 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar260 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar260 >> 0x7f,0) == '\0') &&
                    (auVar260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar260 >> 0xbf,0) == '\0') &&
                  (auVar260 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar260[0x1f]) {
              }
              else {
                auVar180 = vandps_avx(auVar354,auVar180);
                auVar159 = ZEXT3264(auVar180);
                local_3c0 = local_480._0_4_ + local_480._0_4_ + -1.0;
                fStack_3bc = local_480._4_4_ + local_480._4_4_ + -1.0;
                fStack_3b8 = local_480._8_4_ + local_480._8_4_ + -1.0;
                fStack_3b4 = local_480._12_4_ + local_480._12_4_ + -1.0;
                fStack_3b0 = local_480._16_4_ + local_480._16_4_ + -1.0;
                fStack_3ac = local_480._20_4_ + local_480._20_4_ + -1.0;
                fStack_3a8 = local_480._24_4_ + local_480._24_4_ + -1.0;
                fStack_3a4 = local_480._28_4_ + local_480._28_4_ + -1.0;
                local_3e0 = local_2a0;
                local_3a0 = local_4a0;
                local_37c = uVar16;
                local_370 = local_7f0;
                uStack_368 = uStack_7e8;
                local_360 = local_5d0;
                uStack_358 = uStack_5c8;
                local_350 = local_5e0;
                uStack_348 = uStack_5d8;
                auVar184 = ZEXT1664(_local_5f0);
                local_340 = _local_5f0;
                local_320 = auVar180;
                auVar141 = (undefined1  [8])(context->scene->geometries).items[local_830].ptr;
                local_480._4_4_ = fStack_3bc;
                local_480._0_4_ = local_3c0;
                fStack_478 = fStack_3b8;
                fStack_474 = fStack_3b4;
                fStack_470 = fStack_3b0;
                fStack_46c = fStack_3ac;
                fStack_468 = fStack_3a8;
                fStack_464 = fStack_3a4;
                if ((((Geometry *)auVar141)->mask & (ray->super_RayK<1>).mask) != 0) {
                  local_500 = auVar180;
                  auVar196._0_4_ = (float)(int)local_380;
                  auVar196._4_8_ = SUB128(ZEXT812(0),4);
                  auVar196._12_4_ = 0;
                  auVar172 = vshufps_avx(auVar196,auVar196,0);
                  local_300[0] = (auVar172._0_4_ + local_2a0._0_4_ + 0.0) * (float)local_100._0_4_;
                  local_300[1] = (auVar172._4_4_ + local_2a0._4_4_ + 1.0) * (float)local_100._4_4_;
                  local_300[2] = (auVar172._8_4_ + local_2a0._8_4_ + 2.0) * fStack_f8;
                  local_300[3] = (auVar172._12_4_ + local_2a0._12_4_ + 3.0) * fStack_f4;
                  fStack_2f0 = (auVar172._0_4_ + local_2a0._16_4_ + 4.0) * fStack_f0;
                  fStack_2ec = (auVar172._4_4_ + local_2a0._20_4_ + 5.0) * fStack_ec;
                  fStack_2e8 = (auVar172._8_4_ + local_2a0._24_4_ + 6.0) * fStack_e8;
                  fStack_2e4 = auVar172._12_4_ + local_2a0._28_4_ + 7.0;
                  local_2e0 = CONCAT44(fStack_3bc,local_3c0);
                  uStack_2d8 = CONCAT44(fStack_3b4,fStack_3b8);
                  uStack_2d0 = CONCAT44(fStack_3ac,fStack_3b0);
                  uStack_2c8 = CONCAT44(fStack_3a4,fStack_3a8);
                  local_2c0 = local_4a0;
                  auVar181._8_4_ = 0x7f800000;
                  auVar181._0_8_ = 0x7f8000007f800000;
                  auVar181._12_4_ = 0x7f800000;
                  auVar181._16_4_ = 0x7f800000;
                  auVar181._20_4_ = 0x7f800000;
                  auVar181._24_4_ = 0x7f800000;
                  auVar181._28_4_ = 0x7f800000;
                  auVar354 = vblendvps_avx(auVar181,local_4a0,auVar180);
                  auVar260 = vshufps_avx(auVar354,auVar354,0xb1);
                  auVar260 = vminps_avx(auVar354,auVar260);
                  auVar38 = vshufpd_avx(auVar260,auVar260,5);
                  auVar260 = vminps_avx(auVar260,auVar38);
                  auVar38 = vperm2f128_avx(auVar260,auVar260,1);
                  auVar260 = vminps_avx(auVar260,auVar38);
                  auVar354 = vcmpps_avx(auVar354,auVar260,0);
                  auVar260 = auVar180 & auVar354;
                  if ((((((((auVar260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar260 >> 0x7f,0) != '\0') ||
                        (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar260 >> 0xbf,0) != '\0') ||
                      (auVar260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar260[0x1f] < '\0') {
                    auVar180 = vandps_avx(auVar354,auVar180);
                  }
                  uVar136 = vmovmskps_avx(auVar180);
                  uVar138 = 0;
                  if (uVar136 != 0) {
                    for (; (uVar136 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                    }
                  }
                  uVar137 = (ulong)uVar138;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)auVar141)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar316 = local_300[uVar137];
                    auVar159 = ZEXT464((uint)fVar316);
                    fVar206 = 1.0 - fVar316;
                    fVar359 = fVar316 * 3.0;
                    auVar172 = ZEXT416((uint)((fVar206 * -2.0 * fVar316 + fVar316 * fVar316) * 0.5))
                    ;
                    auVar172 = vshufps_avx(auVar172,auVar172,0);
                    auVar197 = ZEXT416((uint)(((fVar206 + fVar206) * (fVar359 + 2.0) +
                                              fVar206 * fVar206 * -3.0) * 0.5));
                    auVar197 = vshufps_avx(auVar197,auVar197,0);
                    auVar198 = ZEXT416((uint)(((fVar316 + fVar316) * (fVar359 + -5.0) +
                                              fVar316 * fVar359) * 0.5));
                    auVar198 = vshufps_avx(auVar198,auVar198,0);
                    fVar359 = *(float *)((long)&local_2e0 + uVar137 * 4);
                    auVar215 = ZEXT416((uint)((fVar316 * (fVar206 + fVar206) - fVar206 * fVar206) *
                                             0.5));
                    auVar215 = vshufps_avx(auVar215,auVar215,0);
                    auVar173._0_4_ =
                         auVar215._0_4_ * (float)local_7f0._0_4_ +
                         auVar198._0_4_ * (float)local_5d0._0_4_ +
                         auVar172._0_4_ * (float)local_5f0._0_4_ +
                         auVar197._0_4_ * (float)local_5e0._0_4_;
                    auVar173._4_4_ =
                         auVar215._4_4_ * (float)local_7f0._4_4_ +
                         auVar198._4_4_ * (float)local_5d0._4_4_ +
                         auVar172._4_4_ * (float)local_5f0._4_4_ +
                         auVar197._4_4_ * (float)local_5e0._4_4_;
                    auVar173._8_4_ =
                         auVar215._8_4_ * (float)uStack_7e8 +
                         auVar198._8_4_ * (float)uStack_5c8 +
                         auVar172._8_4_ * (float)uStack_5e8 + auVar197._8_4_ * (float)uStack_5d8;
                    auVar173._12_4_ =
                         auVar215._12_4_ * uStack_7e8._4_4_ +
                         auVar198._12_4_ * uStack_5c8._4_4_ +
                         auVar172._12_4_ * uStack_5e8._4_4_ + auVar197._12_4_ * uStack_5d8._4_4_;
                    auVar184 = ZEXT1664(auVar173);
                    auVar222 = ZEXT464((uint)*(float *)(local_2c0 + uVar137 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar137 * 4);
                    uVar13 = vmovlps_avx(auVar173);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar13;
                    fVar206 = (float)vextractps_avx(auVar173,2);
                    (ray->Ng).field_0.field_0.z = fVar206;
                    ray->u = fVar316;
                    ray->v = fVar359;
                    ray->primID = (uint)local_828;
                    ray->geomID = (uint)local_830;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    _local_7a0 = _local_5d0;
                    _local_6c0 = _local_5e0;
                    _local_640 = _local_5f0;
                    local_6e0 = auVar141;
                    _local_580 = auVar23;
                    _local_420 = auVar198;
                    _local_220 = auVar218;
                    do {
                      local_704 = local_300[uVar137];
                      local_700 = *(undefined4 *)((long)&local_2e0 + uVar137 * 4);
                      local_820._0_4_ = (ray->super_RayK<1>).tfar;
                      local_780 = (float)uVar137;
                      fStack_77c = (float)(uVar137 >> 0x20);
                      (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar137 * 4);
                      fVar359 = 1.0 - local_704;
                      fVar316 = local_704 * 3.0;
                      auVar172 = ZEXT416((uint)((fVar359 * -2.0 * local_704 + local_704 * local_704)
                                               * 0.5));
                      auVar172 = vshufps_avx(auVar172,auVar172,0);
                      auVar197 = ZEXT416((uint)(((fVar359 + fVar359) * (fVar316 + 2.0) +
                                                fVar359 * fVar359 * -3.0) * 0.5));
                      auVar197 = vshufps_avx(auVar197,auVar197,0);
                      auVar198 = ZEXT416((uint)(((local_704 + local_704) * (fVar316 + -5.0) +
                                                local_704 * fVar316) * 0.5));
                      auVar198 = vshufps_avx(auVar198,auVar198,0);
                      auVar215 = ZEXT416((uint)((local_704 * (fVar359 + fVar359) - fVar359 * fVar359
                                                ) * 0.5));
                      auVar215 = vshufps_avx(auVar215,auVar215,0);
                      auVar216._0_4_ = auVar215._0_4_ * (float)local_7f0._0_4_;
                      auVar216._4_4_ = auVar215._4_4_ * (float)local_7f0._4_4_;
                      auVar216._8_4_ = auVar215._8_4_ * (float)uStack_7e8;
                      auVar216._12_4_ = auVar215._12_4_ * uStack_7e8._4_4_;
                      auVar222 = ZEXT1664(auVar216);
                      auVar199._0_4_ =
                           auVar216._0_4_ +
                           auVar198._0_4_ * (float)local_7a0._0_4_ +
                           auVar172._0_4_ * (float)local_640._0_4_ +
                           auVar197._0_4_ * (float)local_6c0._0_4_;
                      auVar199._4_4_ =
                           auVar216._4_4_ +
                           auVar198._4_4_ * (float)local_7a0._4_4_ +
                           auVar172._4_4_ * (float)local_640._4_4_ +
                           auVar197._4_4_ * (float)local_6c0._4_4_;
                      auVar199._8_4_ =
                           auVar216._8_4_ +
                           auVar198._8_4_ * fStack_798 +
                           auVar172._8_4_ * (float)uStack_638 + auVar197._8_4_ * fStack_6b8;
                      auVar199._12_4_ =
                           auVar216._12_4_ +
                           auVar198._12_4_ * fStack_794 +
                           auVar172._12_4_ * uStack_638._4_4_ + auVar197._12_4_ * fStack_6b4;
                      local_7d0.context = context->user;
                      local_710 = vmovlps_avx(auVar199);
                      local_708 = vextractps_avx(auVar199,2);
                      local_6fc = (int)local_828;
                      local_6f8 = (int)local_830;
                      local_6f4 = (local_7d0.context)->instID[0];
                      local_6f0 = (local_7d0.context)->instPrimID[0];
                      local_834 = -1;
                      local_7d0.valid = &local_834;
                      local_7d0.geometryUserPtr = ((Geometry *)auVar141)->userPtr;
                      local_7d0.ray = (RTCRayN *)ray;
                      local_7d0.hit = (RTCHitN *)&local_710;
                      local_7d0.N = 1;
                      if (((Geometry *)auVar141)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0107bbf7:
                        p_Var20 = context->args->filter;
                        if (p_Var20 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((((Geometry *)auVar141)->field_8).field_0x2 & 0x40) != 0)) {
                            auVar222 = ZEXT1664(auVar222._0_16_);
                            (*p_Var20)(&local_7d0);
                            auVar141 = local_6e0;
                          }
                          auVar350 = ZEXT3264(_local_760);
                          if (*local_7d0.valid == 0) goto LAB_0107bca2;
                        }
                        (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_7d0.hit;
                        (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_7d0.hit + 4);
                        (((Vec3f *)((long)local_7d0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_7d0.hit + 8);
                        *(float *)((long)local_7d0.ray + 0x3c) = *(float *)(local_7d0.hit + 0xc);
                        *(float *)((long)local_7d0.ray + 0x40) = *(float *)(local_7d0.hit + 0x10);
                        *(float *)((long)local_7d0.ray + 0x44) = *(float *)(local_7d0.hit + 0x14);
                        *(float *)((long)local_7d0.ray + 0x48) = *(float *)(local_7d0.hit + 0x18);
                        *(float *)((long)local_7d0.ray + 0x4c) = *(float *)(local_7d0.hit + 0x1c);
                        *(float *)((long)local_7d0.ray + 0x50) = *(float *)(local_7d0.hit + 0x20);
                      }
                      else {
                        auVar222 = ZEXT1664(auVar216);
                        (*((Geometry *)auVar141)->intersectionFilterN)(&local_7d0);
                        auVar350 = ZEXT3264(_local_760);
                        auVar141 = local_6e0;
                        if (*local_7d0.valid != 0) goto LAB_0107bbf7;
LAB_0107bca2:
                        (ray->super_RayK<1>).tfar = (float)local_820._0_4_;
                      }
                      auVar180 = local_4a0;
                      uVar137 = CONCAT44(fStack_77c,local_780);
                      *(undefined4 *)(local_500 + uVar137 * 4) = 0;
                      auVar354 = local_500;
                      fVar316 = (ray->super_RayK<1>).tfar;
                      auVar157._4_4_ = fVar316;
                      auVar157._0_4_ = fVar316;
                      auVar157._8_4_ = fVar316;
                      auVar157._12_4_ = fVar316;
                      auVar157._16_4_ = fVar316;
                      auVar157._20_4_ = fVar316;
                      auVar157._24_4_ = fVar316;
                      auVar157._28_4_ = fVar316;
                      auVar180 = vcmpps_avx(auVar180,auVar157,2);
                      local_500 = vandps_avx(auVar180,local_500);
                      auVar159 = ZEXT3264(local_500);
                      auVar354 = auVar354 & auVar180;
                      bVar116 = (auVar354 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar117 = (auVar354 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar115 = (auVar354 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar114 = SUB321(auVar354 >> 0x7f,0) != '\0';
                      bVar113 = (auVar354 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar112 = SUB321(auVar354 >> 0xbf,0) != '\0';
                      bVar111 = (auVar354 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar110 = auVar354[0x1f] < '\0';
                      auVar292 = ZEXT3264(local_520);
                      if (((((((bVar116 || bVar117) || bVar115) || bVar114) || bVar113) || bVar112)
                          || bVar111) || bVar110) {
                        auVar182._8_4_ = 0x7f800000;
                        auVar182._0_8_ = 0x7f8000007f800000;
                        auVar182._12_4_ = 0x7f800000;
                        auVar182._16_4_ = 0x7f800000;
                        auVar182._20_4_ = 0x7f800000;
                        auVar182._24_4_ = 0x7f800000;
                        auVar182._28_4_ = 0x7f800000;
                        auVar180 = vblendvps_avx(auVar182,local_4a0,local_500);
                        auVar354 = vshufps_avx(auVar180,auVar180,0xb1);
                        auVar354 = vminps_avx(auVar180,auVar354);
                        auVar260 = vshufpd_avx(auVar354,auVar354,5);
                        auVar354 = vminps_avx(auVar354,auVar260);
                        auVar260 = vperm2f128_avx(auVar354,auVar354,1);
                        auVar222 = ZEXT3264(auVar260);
                        auVar354 = vminps_avx(auVar354,auVar260);
                        auVar180 = vcmpps_avx(auVar180,auVar354,0);
                        auVar354 = local_500 & auVar180;
                        if ((((((((auVar354 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar354 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar354 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar354 >> 0x7f,0) != '\0')
                              || (auVar354 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar354 >> 0xbf,0) != '\0') ||
                            (auVar354 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar354[0x1f] < '\0') {
                          auVar354 = vandps_avx(auVar180,local_500);
                          auVar159 = ZEXT3264(auVar354);
                        }
                        uVar136 = vmovmskps_avx(auVar159._0_32_);
                        uVar138 = 0;
                        if (uVar136 != 0) {
                          for (; (uVar136 >> uVar138 & 1) == 0; uVar138 = uVar138 + 1) {
                          }
                        }
                        uVar137 = (ulong)uVar138;
                      }
                      auVar184 = ZEXT3264(auVar180);
                    } while (((((((bVar116 || bVar117) || bVar115) || bVar114) || bVar113) ||
                              bVar112) || bVar111) || bVar110);
                  }
                }
                fVar316 = (float)local_620._0_4_;
                fVar359 = (float)local_620._4_4_;
                fVar206 = fStack_618;
                fVar268 = fStack_614;
                fVar210 = fStack_610;
                fVar223 = fStack_60c;
                fVar225 = fStack_608;
                fVar227 = fStack_604;
              }
            }
          }
          lVar139 = lVar139 + 8;
        } while ((int)lVar139 < (int)uVar16);
      }
      fVar316 = (ray->super_RayK<1>).tfar;
      auVar148._4_4_ = fVar316;
      auVar148._0_4_ = fVar316;
      auVar148._8_4_ = fVar316;
      auVar148._12_4_ = fVar316;
      auVar172 = vcmpps_avx(local_190,auVar148,2);
      uVar138 = vmovmskps_avx(auVar172);
      uVar134 = uVar134 & uVar134 + 0xf & uVar138;
    } while (uVar134 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }